

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [60];
  undefined1 auVar60 [60];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  byte bVar83;
  byte bVar84;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  ulong uVar88;
  byte bVar89;
  ulong uVar90;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined8 in_R10;
  long lVar91;
  bool bVar92;
  ulong uVar93;
  uint uVar94;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  uint uVar158;
  uint uVar162;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  uint uVar156;
  uint uVar157;
  uint uVar159;
  uint uVar160;
  uint uVar161;
  undefined1 in_ZmmResult [64];
  undefined1 auVar152 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  float pp;
  float fVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar181;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar182 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar198;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar214;
  float fVar215;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar236;
  float fVar237;
  undefined1 auVar232 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar245 [16];
  undefined1 auVar247 [32];
  undefined1 auVar246 [16];
  undefined1 auVar248 [32];
  float fVar252;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar251 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  float fVar260;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar268;
  undefined1 auVar263 [32];
  float fVar266;
  float fVar267;
  undefined1 auVar264 [64];
  float fVar269;
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  float s;
  undefined1 auVar278 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  float fVar277;
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_d24;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  undefined1 local_a80 [32];
  undefined1 (*local_a58) [32];
  Primitive *local_a50;
  ulong local_a48;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_730 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar265 [64];
  
  uVar93 = (ulong)(byte)prim[1];
  fVar277 = *(float *)(prim + uVar93 * 0x19 + 0x12);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar100 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar101 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + uVar93 * 0x19 + 6));
  fVar214 = fVar277 * auVar101._0_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar93 * 4 + 6);
  auVar108 = vpmovsxbd_avx2(auVar20);
  fVar163 = fVar277 * auVar100._0_4_;
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar93 * 5 + 6);
  auVar106 = vpmovsxbd_avx2(auVar21);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar93 * 6 + 6);
  auVar109 = vpmovsxbd_avx2(auVar95);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar93 * 0xb + 6);
  auVar110 = vpmovsxbd_avx2(auVar97);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar93 * 0xc + 6);
  auVar111 = vpmovsxbd_avx2(auVar1);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar93 * 0xd + 6);
  auVar107 = vpmovsxbd_avx2(auVar96);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar93 * 0x12 + 6);
  auVar112 = vpmovsxbd_avx2(auVar165);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar93 * 0x13 + 6);
  auVar113 = vpmovsxbd_avx2(auVar98);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar93 * 0x14 + 6);
  auVar115 = vpmovsxbd_avx2(auVar99);
  auVar114 = vcvtdq2ps_avx(auVar115);
  auVar127._8_4_ = 1;
  auVar127._0_8_ = 0x100000001;
  auVar127._12_4_ = 1;
  auVar127._16_4_ = 1;
  auVar127._20_4_ = 1;
  auVar127._24_4_ = 1;
  auVar127._28_4_ = 1;
  auVar125._4_4_ = fVar163;
  auVar125._0_4_ = fVar163;
  auVar125._8_4_ = fVar163;
  auVar125._12_4_ = fVar163;
  auVar125._16_4_ = fVar163;
  auVar125._20_4_ = fVar163;
  auVar125._24_4_ = fVar163;
  auVar125._28_4_ = fVar163;
  auVar105 = ZEXT1632(CONCAT412(fVar277 * auVar100._12_4_,
                                CONCAT48(fVar277 * auVar100._8_4_,
                                         CONCAT44(fVar277 * auVar100._4_4_,fVar163))));
  auVar116 = vpermps_avx2(auVar127,auVar105);
  auVar152._32_32_ = in_ZmmResult._32_32_;
  auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar104 = vpermps_avx512vl(auVar103,auVar105);
  fVar163 = auVar104._0_4_;
  auVar180._0_4_ = fVar163 * auVar109._0_4_;
  fVar215 = auVar104._4_4_;
  auVar180._4_4_ = fVar215 * auVar109._4_4_;
  fVar233 = auVar104._8_4_;
  auVar180._8_4_ = fVar233 * auVar109._8_4_;
  fVar234 = auVar104._12_4_;
  auVar180._12_4_ = fVar234 * auVar109._12_4_;
  fVar235 = auVar104._16_4_;
  auVar180._16_4_ = fVar235 * auVar109._16_4_;
  fVar236 = auVar104._20_4_;
  auVar180._20_4_ = fVar236 * auVar109._20_4_;
  fVar237 = auVar104._24_4_;
  auVar180._28_36_ = in_ZMM4._28_36_;
  auVar180._24_4_ = fVar237 * auVar109._24_4_;
  auVar105._4_4_ = auVar107._4_4_ * fVar215;
  auVar105._0_4_ = auVar107._0_4_ * fVar163;
  auVar105._8_4_ = auVar107._8_4_ * fVar233;
  auVar105._12_4_ = auVar107._12_4_ * fVar234;
  auVar105._16_4_ = auVar107._16_4_ * fVar235;
  auVar105._20_4_ = auVar107._20_4_ * fVar236;
  auVar105._24_4_ = auVar107._24_4_ * fVar237;
  auVar105._28_4_ = auVar115._28_4_;
  auVar115._4_4_ = fVar215 * auVar114._4_4_;
  auVar115._0_4_ = fVar163 * auVar114._0_4_;
  auVar115._8_4_ = fVar233 * auVar114._8_4_;
  auVar115._12_4_ = fVar234 * auVar114._12_4_;
  auVar115._16_4_ = fVar235 * auVar114._16_4_;
  auVar115._20_4_ = fVar236 * auVar114._20_4_;
  auVar115._24_4_ = fVar237 * auVar114._24_4_;
  auVar115._28_4_ = auVar104._28_4_;
  auVar20 = vfmadd231ps_fma(auVar180._0_32_,auVar116,auVar106);
  auVar21 = vfmadd231ps_fma(auVar105,auVar116,auVar111);
  auVar95 = vfmadd231ps_fma(auVar115,auVar113,auVar116);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar125,auVar108);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar125,auVar110);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar112,auVar125);
  auVar126._4_4_ = fVar214;
  auVar126._0_4_ = fVar214;
  auVar126._8_4_ = fVar214;
  auVar126._12_4_ = fVar214;
  auVar126._16_4_ = fVar214;
  auVar126._20_4_ = fVar214;
  auVar126._24_4_ = fVar214;
  auVar126._28_4_ = fVar214;
  auVar116 = ZEXT1632(CONCAT412(fVar277 * auVar101._12_4_,
                                CONCAT48(fVar277 * auVar101._8_4_,
                                         CONCAT44(fVar277 * auVar101._4_4_,fVar214))));
  auVar115 = vpermps_avx2(auVar127,auVar116);
  auVar105 = vpermps_avx512vl(auVar103,auVar116);
  fVar277 = auVar105._0_4_;
  fVar163 = auVar105._4_4_;
  auVar116._4_4_ = fVar163 * auVar109._4_4_;
  auVar116._0_4_ = fVar277 * auVar109._0_4_;
  fVar215 = auVar105._8_4_;
  auVar116._8_4_ = fVar215 * auVar109._8_4_;
  fVar233 = auVar105._12_4_;
  auVar116._12_4_ = fVar233 * auVar109._12_4_;
  fVar234 = auVar105._16_4_;
  auVar116._16_4_ = fVar234 * auVar109._16_4_;
  fVar235 = auVar105._20_4_;
  auVar116._20_4_ = fVar235 * auVar109._20_4_;
  fVar236 = auVar105._24_4_;
  auVar116._24_4_ = fVar236 * auVar109._24_4_;
  auVar116._28_4_ = auVar109._28_4_;
  auVar119._0_4_ = fVar277 * auVar107._0_4_;
  auVar119._4_4_ = fVar163 * auVar107._4_4_;
  auVar119._8_4_ = fVar215 * auVar107._8_4_;
  auVar119._12_4_ = fVar233 * auVar107._12_4_;
  auVar119._16_4_ = fVar234 * auVar107._16_4_;
  auVar119._20_4_ = fVar235 * auVar107._20_4_;
  auVar119._24_4_ = fVar236 * auVar107._24_4_;
  auVar119._28_4_ = 0;
  auVar107._4_4_ = fVar163 * auVar114._4_4_;
  auVar107._0_4_ = fVar277 * auVar114._0_4_;
  auVar107._8_4_ = fVar215 * auVar114._8_4_;
  auVar107._12_4_ = fVar233 * auVar114._12_4_;
  auVar107._16_4_ = fVar234 * auVar114._16_4_;
  auVar107._20_4_ = fVar235 * auVar114._20_4_;
  auVar107._24_4_ = fVar236 * auVar114._24_4_;
  auVar107._28_4_ = auVar114._28_4_;
  auVar97 = vfmadd231ps_fma(auVar116,auVar115,auVar106);
  auVar1 = vfmadd231ps_fma(auVar119,auVar115,auVar111);
  auVar96 = vfmadd231ps_fma(auVar107,auVar115,auVar113);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar126,auVar108);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar126,auVar110);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar126,auVar112);
  auVar121._8_4_ = 0x7fffffff;
  auVar121._0_8_ = 0x7fffffff7fffffff;
  auVar121._12_4_ = 0x7fffffff;
  auVar121._16_4_ = 0x7fffffff;
  auVar121._20_4_ = 0x7fffffff;
  auVar121._24_4_ = 0x7fffffff;
  auVar121._28_4_ = 0x7fffffff;
  auVar123._8_4_ = 0x219392ef;
  auVar123._0_8_ = 0x219392ef219392ef;
  auVar123._12_4_ = 0x219392ef;
  auVar123._16_4_ = 0x219392ef;
  auVar123._20_4_ = 0x219392ef;
  auVar123._24_4_ = 0x219392ef;
  auVar123._28_4_ = 0x219392ef;
  auVar108 = vandps_avx(ZEXT1632(auVar20),auVar121);
  uVar88 = vcmpps_avx512vl(auVar108,auVar123,1);
  bVar92 = (bool)((byte)uVar88 & 1);
  auVar103._0_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar20._0_4_;
  bVar92 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar20._4_4_;
  bVar92 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar20._8_4_;
  bVar92 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar20._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar108 = vandps_avx(ZEXT1632(auVar21),auVar121);
  uVar88 = vcmpps_avx512vl(auVar108,auVar123,1);
  bVar92 = (bool)((byte)uVar88 & 1);
  auVar104._0_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar21._0_4_;
  bVar92 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar21._4_4_;
  bVar92 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar21._8_4_;
  bVar92 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar21._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar108 = vandps_avx(ZEXT1632(auVar95),auVar121);
  uVar88 = vcmpps_avx512vl(auVar108,auVar123,1);
  bVar92 = (bool)((byte)uVar88 & 1);
  auVar108._0_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar95._0_4_;
  bVar92 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar95._4_4_;
  bVar92 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar95._8_4_;
  bVar92 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar95._12_4_;
  auVar108._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar108._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar108._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar108._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar106 = vrcp14ps_avx512vl(auVar103);
  auVar122._8_4_ = 0x3f800000;
  auVar122._0_8_ = 0x3f8000003f800000;
  auVar122._12_4_ = 0x3f800000;
  auVar122._16_4_ = 0x3f800000;
  auVar122._20_4_ = 0x3f800000;
  auVar122._24_4_ = 0x3f800000;
  auVar122._28_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar103,auVar106,auVar122);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar106,auVar106);
  auVar106 = vrcp14ps_avx512vl(auVar104);
  auVar21 = vfnmadd213ps_fma(auVar104,auVar106,auVar122);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar106,auVar106);
  auVar106 = vrcp14ps_avx512vl(auVar108);
  auVar95 = vfnmadd213ps_fma(auVar108,auVar106,auVar122);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar106,auVar106);
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 7 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar97));
  auVar112._4_4_ = auVar20._4_4_ * auVar108._4_4_;
  auVar112._0_4_ = auVar20._0_4_ * auVar108._0_4_;
  auVar112._8_4_ = auVar20._8_4_ * auVar108._8_4_;
  auVar112._12_4_ = auVar20._12_4_ * auVar108._12_4_;
  auVar112._16_4_ = auVar108._16_4_ * 0.0;
  auVar112._20_4_ = auVar108._20_4_ * 0.0;
  auVar112._24_4_ = auVar108._24_4_ * 0.0;
  auVar112._28_4_ = auVar108._28_4_;
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 9 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar97));
  auVar120._0_4_ = auVar20._0_4_ * auVar108._0_4_;
  auVar120._4_4_ = auVar20._4_4_ * auVar108._4_4_;
  auVar120._8_4_ = auVar20._8_4_ * auVar108._8_4_;
  auVar120._12_4_ = auVar20._12_4_ * auVar108._12_4_;
  auVar120._16_4_ = auVar108._16_4_ * 0.0;
  auVar120._20_4_ = auVar108._20_4_ * 0.0;
  auVar120._24_4_ = auVar108._24_4_ * 0.0;
  auVar120._28_4_ = 0;
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0xe + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar1));
  auVar113._4_4_ = auVar21._4_4_ * auVar108._4_4_;
  auVar113._0_4_ = auVar21._0_4_ * auVar108._0_4_;
  auVar113._8_4_ = auVar21._8_4_ * auVar108._8_4_;
  auVar113._12_4_ = auVar21._12_4_ * auVar108._12_4_;
  auVar113._16_4_ = auVar108._16_4_ * 0.0;
  auVar113._20_4_ = auVar108._20_4_ * 0.0;
  auVar113._24_4_ = auVar108._24_4_ * 0.0;
  auVar113._28_4_ = auVar108._28_4_;
  auVar107 = vpbroadcastd_avx512vl();
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar1));
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x15 + 6));
  auVar118._0_4_ = auVar21._0_4_ * auVar108._0_4_;
  auVar118._4_4_ = auVar21._4_4_ * auVar108._4_4_;
  auVar118._8_4_ = auVar21._8_4_ * auVar108._8_4_;
  auVar118._12_4_ = auVar21._12_4_ * auVar108._12_4_;
  auVar118._16_4_ = auVar108._16_4_ * 0.0;
  auVar118._20_4_ = auVar108._20_4_ * 0.0;
  auVar118._24_4_ = auVar108._24_4_ * 0.0;
  auVar118._28_4_ = 0;
  auVar108 = vcvtdq2ps_avx(auVar106);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar96));
  auVar114._4_4_ = auVar108._4_4_ * auVar95._4_4_;
  auVar114._0_4_ = auVar108._0_4_ * auVar95._0_4_;
  auVar114._8_4_ = auVar108._8_4_ * auVar95._8_4_;
  auVar114._12_4_ = auVar108._12_4_ * auVar95._12_4_;
  auVar114._16_4_ = auVar108._16_4_ * 0.0;
  auVar114._20_4_ = auVar108._20_4_ * 0.0;
  auVar114._24_4_ = auVar108._24_4_ * 0.0;
  auVar114._28_4_ = auVar108._28_4_;
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x17 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar96));
  auVar117._0_4_ = auVar95._0_4_ * auVar108._0_4_;
  auVar117._4_4_ = auVar95._4_4_ * auVar108._4_4_;
  auVar117._8_4_ = auVar95._8_4_ * auVar108._8_4_;
  auVar117._12_4_ = auVar95._12_4_ * auVar108._12_4_;
  auVar117._16_4_ = auVar108._16_4_ * 0.0;
  auVar117._20_4_ = auVar108._20_4_ * 0.0;
  auVar117._24_4_ = auVar108._24_4_ * 0.0;
  auVar117._28_4_ = 0;
  auVar108 = vpminsd_avx2(auVar112,auVar120);
  auVar106 = vpminsd_avx2(auVar113,auVar118);
  auVar108 = vmaxps_avx(auVar108,auVar106);
  auVar106 = vpminsd_avx2(auVar114,auVar117);
  uVar181 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar109._4_4_ = uVar181;
  auVar109._0_4_ = uVar181;
  auVar109._8_4_ = uVar181;
  auVar109._12_4_ = uVar181;
  auVar109._16_4_ = uVar181;
  auVar109._20_4_ = uVar181;
  auVar109._24_4_ = uVar181;
  auVar109._28_4_ = uVar181;
  auVar106 = vmaxps_avx512vl(auVar106,auVar109);
  auVar108 = vmaxps_avx(auVar108,auVar106);
  auVar106._8_4_ = 0x3f7ffffa;
  auVar106._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar106._12_4_ = 0x3f7ffffa;
  auVar106._16_4_ = 0x3f7ffffa;
  auVar106._20_4_ = 0x3f7ffffa;
  auVar106._24_4_ = 0x3f7ffffa;
  auVar106._28_4_ = 0x3f7ffffa;
  local_680 = vmulps_avx512vl(auVar108,auVar106);
  auVar108 = vpmaxsd_avx2(auVar112,auVar120);
  auVar106 = vpmaxsd_avx2(auVar113,auVar118);
  auVar108 = vminps_avx(auVar108,auVar106);
  auVar106 = vpmaxsd_avx2(auVar114,auVar117);
  uVar181 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar110._4_4_ = uVar181;
  auVar110._0_4_ = uVar181;
  auVar110._8_4_ = uVar181;
  auVar110._12_4_ = uVar181;
  auVar110._16_4_ = uVar181;
  auVar110._20_4_ = uVar181;
  auVar110._24_4_ = uVar181;
  auVar110._28_4_ = uVar181;
  auVar106 = vminps_avx512vl(auVar106,auVar110);
  auVar108 = vminps_avx(auVar108,auVar106);
  auVar111._8_4_ = 0x3f800003;
  auVar111._0_8_ = 0x3f8000033f800003;
  auVar111._12_4_ = 0x3f800003;
  auVar111._16_4_ = 0x3f800003;
  auVar111._20_4_ = 0x3f800003;
  auVar111._24_4_ = 0x3f800003;
  auVar111._28_4_ = 0x3f800003;
  auVar108 = vmulps_avx512vl(auVar108,auVar111);
  uVar22 = vcmpps_avx512vl(local_680,auVar108,2);
  uVar24 = vpcmpgtd_avx512vl(auVar107,_DAT_01fb4ba0);
  local_a48 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar22 & (byte)uVar24));
  local_a58 = (undefined1 (*) [32])local_240;
  auVar180 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar180);
  local_a50 = prim;
LAB_01a4868a:
  if (local_a48 == 0) {
    return;
  }
  lVar91 = 0;
  for (uVar88 = local_a48; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
    lVar91 = lVar91 + 1;
  }
  uVar2 = *(uint *)(prim + 2);
  uVar3 = *(uint *)(prim + lVar91 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar2].ptr;
  uVar88 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar3);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar91 = *(long *)&pGVar4[1].time_range.upper;
  auVar20 = *(undefined1 (*) [16])(lVar91 + (long)p_Var5 * uVar88);
  auVar21 = *(undefined1 (*) [16])(lVar91 + (uVar88 + 1) * (long)p_Var5);
  local_a48 = local_a48 - 1 & local_a48;
  if (local_a48 != 0) {
    uVar90 = local_a48 - 1 & local_a48;
    for (uVar93 = local_a48; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
    }
    if (uVar90 != 0) {
      for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar97 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar181 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar102._4_4_ = uVar181;
  auVar102._0_4_ = uVar181;
  auVar102._8_4_ = uVar181;
  auVar102._12_4_ = uVar181;
  local_860._16_4_ = uVar181;
  local_860._0_16_ = auVar102;
  local_860._20_4_ = uVar181;
  local_860._24_4_ = uVar181;
  local_860._28_4_ = uVar181;
  uVar181 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar275._4_4_ = uVar181;
  auVar275._0_4_ = uVar181;
  auVar275._8_4_ = uVar181;
  auVar275._12_4_ = uVar181;
  local_700._16_4_ = uVar181;
  local_700._0_16_ = auVar275;
  local_700._20_4_ = uVar181;
  local_700._24_4_ = uVar181;
  local_700._28_4_ = uVar181;
  auVar95 = vunpcklps_avx(auVar102,auVar275);
  auVar108 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar279 = ZEXT3264(auVar108);
  auVar165 = auVar108._0_16_;
  local_9f0 = vinsertps_avx512f(auVar95,auVar165,0x28);
  auVar101._0_4_ = auVar20._0_4_ + auVar21._0_4_;
  auVar101._4_4_ = auVar20._4_4_ + auVar21._4_4_;
  auVar101._8_4_ = auVar20._8_4_ + auVar21._8_4_;
  auVar101._12_4_ = auVar20._12_4_ + auVar21._12_4_;
  auVar100._8_4_ = 0x3f000000;
  auVar100._0_8_ = 0x3f0000003f000000;
  auVar100._12_4_ = 0x3f000000;
  auVar95 = vmulps_avx512vl(auVar101,auVar100);
  auVar95 = vsubps_avx(auVar95,auVar97);
  auVar95 = vdpps_avx(auVar95,local_9f0,0x7f);
  local_a00 = vdpps_avx(local_9f0,local_9f0,0x7f);
  auVar270 = ZEXT1664(local_a00);
  fVar277 = *(float *)(ray + k * 4 + 0xc0);
  auVar271 = ZEXT464((uint)fVar277);
  auVar249._4_12_ = ZEXT812(0) << 0x20;
  auVar249._0_4_ = local_a00._0_4_;
  auVar96 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar249);
  auVar1 = vfnmadd213ss_fma(auVar96,local_a00,ZEXT416(0x40000000));
  local_660 = auVar95._0_4_ * auVar96._0_4_ * auVar1._0_4_;
  auVar250._4_4_ = local_660;
  auVar250._0_4_ = local_660;
  auVar250._8_4_ = local_660;
  auVar250._12_4_ = local_660;
  fStack_810 = local_660;
  _local_820 = auVar250;
  fStack_80c = local_660;
  fStack_808 = local_660;
  fStack_804 = local_660;
  auVar95 = vfmadd231ps_fma(auVar97,local_9f0,auVar250);
  auVar95 = vblendps_avx(auVar95,ZEXT816(0) << 0x40,8);
  auVar20 = vsubps_avx(auVar20,auVar95);
  auVar97 = vsubps_avx(*(undefined1 (*) [16])(lVar91 + (uVar88 + 2) * (long)p_Var5),auVar95);
  auVar259 = ZEXT1664(auVar97);
  auVar21 = vsubps_avx(auVar21,auVar95);
  auVar264 = ZEXT1664(auVar21);
  auVar95 = vsubps_avx(*(undefined1 (*) [16])(lVar91 + (uVar88 + 3) * (long)p_Var5),auVar95);
  auVar108 = vbroadcastss_avx512vl(auVar20);
  auVar129._8_4_ = 1;
  auVar129._0_8_ = 0x100000001;
  auVar129._12_4_ = 1;
  auVar129._16_4_ = 1;
  auVar129._20_4_ = 1;
  auVar129._24_4_ = 1;
  auVar129._28_4_ = 1;
  local_980 = ZEXT1632(auVar20);
  auVar106 = vpermps_avx512vl(auVar129,local_980);
  auVar130._8_4_ = 2;
  auVar130._0_8_ = 0x200000002;
  auVar130._12_4_ = 2;
  auVar130._16_4_ = 2;
  auVar130._20_4_ = 2;
  auVar130._24_4_ = 2;
  auVar130._28_4_ = 2;
  auVar109 = vpermps_avx512vl(auVar130,local_980);
  auVar132._8_4_ = 3;
  auVar132._0_8_ = 0x300000003;
  auVar132._12_4_ = 3;
  auVar132._16_4_ = 3;
  auVar132._20_4_ = 3;
  auVar132._24_4_ = 3;
  auVar132._28_4_ = 3;
  auVar110 = vpermps_avx512vl(auVar132,local_980);
  auVar111 = vbroadcastss_avx512vl(auVar21);
  local_9c0 = ZEXT1632(auVar21);
  auVar107 = vpermps_avx512vl(auVar129,local_9c0);
  auVar112 = vpermps_avx512vl(auVar130,local_9c0);
  auVar113 = vpermps_avx512vl(auVar132,local_9c0);
  auVar114 = vbroadcastss_avx512vl(auVar97);
  local_9a0 = ZEXT1632(auVar97);
  auVar115 = vpermps_avx512vl(auVar129,local_9a0);
  local_5e0 = vpermps_avx512vl(auVar130,local_9a0);
  local_560 = vpermps_avx2(auVar132,local_9a0);
  local_600 = auVar95._0_4_;
  _local_9e0 = ZEXT1632(auVar95);
  local_580 = vpermps_avx2(auVar129,_local_9e0);
  auVar155._0_32_ = vpermps_avx512vl(auVar130,_local_9e0);
  auVar155._32_32_ = auVar152._32_32_;
  local_640 = vpermps_avx2(auVar132,_local_9e0);
  auVar280._16_48_ = auVar155._16_48_;
  auVar280._0_16_ = vmulss_avx512f(auVar165,auVar165);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar280._0_16_),local_700,local_700);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_860,local_860);
  local_5a0._0_4_ = auVar20._0_4_;
  local_5a0._4_4_ = local_5a0._0_4_;
  local_5a0._8_4_ = local_5a0._0_4_;
  local_5a0._12_4_ = local_5a0._0_4_;
  local_5a0._16_4_ = local_5a0._0_4_;
  local_5a0._20_4_ = local_5a0._0_4_;
  local_5a0._24_4_ = local_5a0._0_4_;
  local_5a0._28_4_ = local_5a0._0_4_;
  auVar128._8_4_ = 0x7fffffff;
  auVar128._0_8_ = 0x7fffffff7fffffff;
  auVar128._12_4_ = 0x7fffffff;
  auVar128._16_4_ = 0x7fffffff;
  auVar128._20_4_ = 0x7fffffff;
  auVar128._24_4_ = 0x7fffffff;
  auVar128._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_5a0,auVar128);
  local_5c0 = auVar280._0_32_;
  local_950 = ZEXT416((uint)local_660);
  local_660 = fVar277 - local_660;
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  auVar152 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar152);
  uVar88 = 0;
  local_d24 = 1;
  auVar152 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar152);
  auVar20 = vsqrtss_avx(local_a00,local_a00);
  auVar21 = vsqrtss_avx(local_a00,local_a00);
  local_730 = ZEXT816(0x3f80000000000000);
  auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar280 = ZEXT3264(auVar116);
  auVar180 = ZEXT3264(_DAT_01f7b040);
  fStack_5fc = local_600;
  fStack_5f8 = local_600;
  fStack_5f4 = local_600;
  fStack_5f0 = local_600;
  fStack_5ec = local_600;
  fStack_5e8 = local_600;
  fStack_5e4 = local_600;
  local_620 = auVar155._0_32_;
  do {
    auVar95 = vmovshdup_avx(local_730);
    auVar95 = vsubps_avx(auVar95,local_730);
    auVar171._0_4_ = auVar95._0_4_;
    fVar163 = auVar171._0_4_ * 0.04761905;
    uVar181 = local_730._0_4_;
    auVar242._4_4_ = uVar181;
    auVar242._0_4_ = uVar181;
    auVar242._8_4_ = uVar181;
    auVar242._12_4_ = uVar181;
    auVar242._16_4_ = uVar181;
    auVar242._20_4_ = uVar181;
    auVar242._24_4_ = uVar181;
    auVar242._28_4_ = uVar181;
    auVar171._4_4_ = auVar171._0_4_;
    auVar171._8_4_ = auVar171._0_4_;
    auVar171._12_4_ = auVar171._0_4_;
    auVar171._16_4_ = auVar171._0_4_;
    auVar171._20_4_ = auVar171._0_4_;
    auVar171._24_4_ = auVar171._0_4_;
    auVar171._28_4_ = auVar171._0_4_;
    auVar95 = vfmadd231ps_fma(auVar242,auVar171,auVar180._0_32_);
    auVar116 = vsubps_avx512vl(auVar280._0_32_,ZEXT1632(auVar95));
    fVar215 = auVar95._0_4_;
    fVar233 = auVar95._4_4_;
    fVar234 = auVar95._8_4_;
    fVar235 = auVar95._12_4_;
    fVar237 = auVar116._0_4_;
    fVar214 = auVar116._4_4_;
    fVar252 = auVar116._8_4_;
    fVar253 = auVar116._12_4_;
    fVar254 = auVar116._16_4_;
    fVar198 = auVar116._20_4_;
    fVar255 = auVar116._24_4_;
    auVar124._4_4_ = fVar214 * fVar214 * -fVar233;
    auVar124._0_4_ = fVar237 * fVar237 * -fVar215;
    auVar124._8_4_ = fVar252 * fVar252 * -fVar234;
    auVar124._12_4_ = fVar253 * fVar253 * -fVar235;
    auVar124._16_4_ = fVar254 * fVar254 * -0.0;
    auVar124._20_4_ = fVar198 * fVar198 * -0.0;
    auVar124._24_4_ = fVar255 * fVar255 * -0.0;
    auVar124._28_4_ = 0x80000000;
    auVar259._0_28_ =
         ZEXT1628(CONCAT412(fVar235 * fVar235,
                            CONCAT48(fVar234 * fVar234,CONCAT44(fVar233 * fVar233,fVar215 * fVar215)
                                    )));
    fVar260 = fVar215 * 3.0;
    fVar266 = fVar233 * 3.0;
    fVar267 = fVar234 * 3.0;
    fVar268 = fVar235 * 3.0;
    auVar265._28_36_ = auVar264._28_36_;
    auVar265._0_28_ = ZEXT1628(CONCAT412(fVar268,CONCAT48(fVar267,CONCAT44(fVar266,fVar260))));
    fVar269 = auVar264._28_4_ + -5.0;
    auVar193._0_4_ = (fVar260 + -5.0) * fVar215 * fVar215 + 2.0;
    auVar193._4_4_ = (fVar266 + -5.0) * fVar233 * fVar233 + 2.0;
    auVar193._8_4_ = (fVar267 + -5.0) * fVar234 * fVar234 + 2.0;
    auVar193._12_4_ = (fVar268 + -5.0) * fVar235 * fVar235 + 2.0;
    auVar193._16_4_ = 0x40000000;
    auVar193._20_4_ = 0x40000000;
    auVar193._24_4_ = 0x40000000;
    auVar193._28_4_ = 0x40000000;
    auVar264._0_4_ = fVar237 * fVar237;
    auVar264._4_4_ = fVar214 * fVar214;
    auVar264._8_4_ = fVar252 * fVar252;
    auVar264._12_4_ = fVar253 * fVar253;
    auVar264._16_4_ = fVar254 * fVar254;
    auVar264._20_4_ = fVar198 * fVar198;
    auVar264._28_36_ = auVar270._28_36_;
    auVar264._24_4_ = fVar255 * fVar255;
    auVar211._0_4_ = auVar264._0_4_ * (fVar237 * 3.0 + -5.0) + 2.0;
    auVar211._4_4_ = auVar264._4_4_ * (fVar214 * 3.0 + -5.0) + 2.0;
    auVar211._8_4_ = auVar264._8_4_ * (fVar252 * 3.0 + -5.0) + 2.0;
    auVar211._12_4_ = auVar264._12_4_ * (fVar253 * 3.0 + -5.0) + 2.0;
    auVar211._16_4_ = auVar264._16_4_ * (fVar254 * 3.0 + -5.0) + 2.0;
    auVar211._20_4_ = auVar264._20_4_ * (fVar198 * 3.0 + -5.0) + 2.0;
    auVar211._24_4_ = auVar264._24_4_ * (fVar255 * 3.0 + -5.0) + 2.0;
    auVar211._28_4_ = auVar271._28_4_ + -5.0 + 2.0;
    fVar236 = auVar116._28_4_;
    auVar131._4_4_ = fVar233 * fVar233 * -fVar214;
    auVar131._0_4_ = fVar215 * fVar215 * -fVar237;
    auVar131._8_4_ = fVar234 * fVar234 * -fVar252;
    auVar131._12_4_ = fVar235 * fVar235 * -fVar253;
    auVar131._16_4_ = -fVar254 * 0.0 * 0.0;
    auVar131._20_4_ = -fVar198 * 0.0 * 0.0;
    auVar131._24_4_ = -fVar255 * 0.0 * 0.0;
    auVar131._28_4_ = -fVar236;
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar116 = vmulps_avx512vl(auVar124,auVar104);
    auVar117 = vmulps_avx512vl(auVar193,auVar104);
    auVar105 = vmulps_avx512vl(auVar211,auVar104);
    auVar103 = vmulps_avx512vl(auVar131,auVar104);
    auVar278._4_4_ = fStack_5fc * auVar103._4_4_;
    auVar278._0_4_ = local_600 * auVar103._0_4_;
    auVar278._8_4_ = fStack_5f8 * auVar103._8_4_;
    auVar278._12_4_ = fStack_5f4 * auVar103._12_4_;
    auVar278._16_4_ = fStack_5f0 * auVar103._16_4_;
    auVar278._20_4_ = fStack_5ec * auVar103._20_4_;
    auVar278._24_4_ = fStack_5e8 * auVar103._24_4_;
    auVar278._28_4_ = auVar211._28_4_;
    auVar118 = vmulps_avx512vl(local_580,auVar103);
    auVar119 = vmulps_avx512vl(local_620,auVar103);
    auVar141._4_4_ = local_640._4_4_ * auVar103._4_4_;
    auVar141._0_4_ = local_640._0_4_ * auVar103._0_4_;
    auVar141._8_4_ = local_640._8_4_ * auVar103._8_4_;
    auVar141._12_4_ = local_640._12_4_ * auVar103._12_4_;
    auVar141._16_4_ = local_640._16_4_ * auVar103._16_4_;
    auVar141._20_4_ = local_640._20_4_ * auVar103._20_4_;
    auVar141._24_4_ = local_640._24_4_ * auVar103._24_4_;
    auVar141._28_4_ = auVar103._28_4_;
    auVar103 = vfmadd231ps_avx512vl(auVar278,auVar105,auVar114);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar105,auVar115);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar105,local_5e0);
    auVar105 = vfmadd231ps_avx512vl(auVar141,local_560,auVar105);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar117,auVar111);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar107);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar117,auVar112);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar117);
    auVar120 = vfmadd231ps_avx512vl(auVar103,auVar116,auVar108);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,auVar106);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,auVar109);
    auVar121 = vfmadd231ps_avx512vl(auVar105,auVar110,auVar116);
    auVar142._4_4_ = (fVar214 + fVar214) * fVar233;
    auVar142._0_4_ = (fVar237 + fVar237) * fVar215;
    auVar142._8_4_ = (fVar252 + fVar252) * fVar234;
    auVar142._12_4_ = (fVar253 + fVar253) * fVar235;
    auVar142._16_4_ = (fVar254 + fVar254) * 0.0;
    auVar142._20_4_ = (fVar198 + fVar198) * 0.0;
    auVar142._24_4_ = (fVar255 + fVar255) * 0.0;
    auVar142._28_4_ = auVar117._28_4_;
    auVar116 = vsubps_avx(auVar142,auVar264._0_32_);
    auVar243._0_28_ =
         ZEXT1628(CONCAT412((fVar235 + fVar235) * (fVar268 + -5.0) + fVar268 * fVar235,
                            CONCAT48((fVar234 + fVar234) * (fVar267 + -5.0) + fVar267 * fVar234,
                                     CONCAT44((fVar233 + fVar233) * (fVar266 + -5.0) +
                                              fVar266 * fVar233,
                                              (fVar215 + fVar215) * (fVar260 + -5.0) +
                                              fVar260 * fVar215))));
    auVar243._28_4_ = fVar269 + 0.0;
    auVar133._8_4_ = 0x40000000;
    auVar133._0_8_ = 0x4000000040000000;
    auVar133._12_4_ = 0x40000000;
    auVar133._16_4_ = 0x40000000;
    auVar133._20_4_ = 0x40000000;
    auVar133._24_4_ = 0x40000000;
    auVar133._28_4_ = 0x40000000;
    auVar105 = vaddps_avx512vl(auVar265._0_32_,auVar133);
    auVar41._4_4_ = (fVar214 + fVar214) * auVar105._4_4_;
    auVar41._0_4_ = (fVar237 + fVar237) * auVar105._0_4_;
    auVar41._8_4_ = (fVar252 + fVar252) * auVar105._8_4_;
    auVar41._12_4_ = (fVar253 + fVar253) * auVar105._12_4_;
    auVar41._16_4_ = (fVar254 + fVar254) * auVar105._16_4_;
    auVar41._20_4_ = (fVar198 + fVar198) * auVar105._20_4_;
    auVar41._24_4_ = (fVar255 + fVar255) * auVar105._24_4_;
    auVar41._28_4_ = auVar105._28_4_;
    auVar42._4_4_ = fVar214 * 3.0 * fVar214;
    auVar42._0_4_ = fVar237 * 3.0 * fVar237;
    auVar42._8_4_ = fVar252 * 3.0 * fVar252;
    auVar42._12_4_ = fVar253 * 3.0 * fVar253;
    auVar42._16_4_ = fVar254 * 3.0 * fVar254;
    auVar42._20_4_ = fVar198 * 3.0 * fVar198;
    auVar42._24_4_ = fVar255 * 3.0 * fVar255;
    auVar42._28_4_ = fVar236;
    auVar105 = vsubps_avx(auVar41,auVar42);
    auVar103 = vsubps_avx(auVar259._0_32_,auVar142);
    auVar116 = vmulps_avx512vl(auVar116,auVar104);
    auVar122 = vmulps_avx512vl(auVar243,auVar104);
    auVar105 = vmulps_avx512vl(auVar105,auVar104);
    auVar103 = vmulps_avx512vl(auVar103,auVar104);
    auVar43._4_4_ = fStack_5fc * auVar103._4_4_;
    auVar43._0_4_ = local_600 * auVar103._0_4_;
    auVar43._8_4_ = fStack_5f8 * auVar103._8_4_;
    auVar43._12_4_ = fStack_5f4 * auVar103._12_4_;
    auVar43._16_4_ = fStack_5f0 * auVar103._16_4_;
    auVar43._20_4_ = fStack_5ec * auVar103._20_4_;
    auVar43._24_4_ = fStack_5e8 * auVar103._24_4_;
    auVar43._28_4_ = fVar269;
    auVar104 = vmulps_avx512vl(local_580,auVar103);
    auVar123 = vmulps_avx512vl(local_620,auVar103);
    auVar44._4_4_ = local_640._4_4_ * auVar103._4_4_;
    auVar44._0_4_ = local_640._0_4_ * auVar103._0_4_;
    auVar44._8_4_ = local_640._8_4_ * auVar103._8_4_;
    auVar44._12_4_ = local_640._12_4_ * auVar103._12_4_;
    auVar44._16_4_ = local_640._16_4_ * auVar103._16_4_;
    auVar44._20_4_ = local_640._20_4_ * auVar103._20_4_;
    auVar44._24_4_ = local_640._24_4_ * auVar103._24_4_;
    auVar44._28_4_ = auVar103._28_4_;
    auVar103 = vfmadd231ps_avx512vl(auVar43,auVar105,auVar114);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar105,auVar115);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar105,local_5e0);
    auVar105 = vfmadd231ps_avx512vl(auVar44,local_560,auVar105);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar122,auVar111);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar122,auVar107);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar112);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar122);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar116,auVar108);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar116,auVar106);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar116,auVar109);
    auVar116 = vfmadd231ps_avx512vl(auVar105,auVar110,auVar116);
    auVar45._4_4_ = auVar103._4_4_ * fVar163;
    auVar45._0_4_ = auVar103._0_4_ * fVar163;
    auVar45._8_4_ = auVar103._8_4_ * fVar163;
    auVar45._12_4_ = auVar103._12_4_ * fVar163;
    auVar45._16_4_ = auVar103._16_4_ * fVar163;
    auVar45._20_4_ = auVar103._20_4_ * fVar163;
    auVar45._24_4_ = auVar103._24_4_ * fVar163;
    auVar45._28_4_ = fVar236 + fVar236;
    auVar46._4_4_ = auVar104._4_4_ * fVar163;
    auVar46._0_4_ = auVar104._0_4_ * fVar163;
    auVar46._8_4_ = auVar104._8_4_ * fVar163;
    auVar46._12_4_ = auVar104._12_4_ * fVar163;
    auVar46._16_4_ = auVar104._16_4_ * fVar163;
    auVar46._20_4_ = auVar104._20_4_ * fVar163;
    auVar46._24_4_ = auVar104._24_4_ * fVar163;
    auVar46._28_4_ = auVar117._28_4_;
    auVar47._4_4_ = auVar122._4_4_ * fVar163;
    auVar47._0_4_ = auVar122._0_4_ * fVar163;
    auVar47._8_4_ = auVar122._8_4_ * fVar163;
    auVar47._12_4_ = auVar122._12_4_ * fVar163;
    auVar47._16_4_ = auVar122._16_4_ * fVar163;
    auVar47._20_4_ = auVar122._20_4_ * fVar163;
    auVar47._24_4_ = auVar122._24_4_ * fVar163;
    auVar47._28_4_ = 0;
    fVar215 = fVar163 * auVar116._0_4_;
    fVar233 = fVar163 * auVar116._4_4_;
    auVar48._4_4_ = fVar233;
    auVar48._0_4_ = fVar215;
    fVar234 = fVar163 * auVar116._8_4_;
    auVar48._8_4_ = fVar234;
    fVar235 = fVar163 * auVar116._12_4_;
    auVar48._12_4_ = fVar235;
    fVar236 = fVar163 * auVar116._16_4_;
    auVar48._16_4_ = fVar236;
    fVar237 = fVar163 * auVar116._20_4_;
    auVar48._20_4_ = fVar237;
    fVar214 = fVar163 * auVar116._24_4_;
    auVar48._24_4_ = fVar214;
    auVar48._28_4_ = fVar163;
    auVar95 = vxorps_avx512vl(local_5e0._0_16_,local_5e0._0_16_);
    auVar122 = vpermt2ps_avx512vl(auVar120,_DAT_01fb9fc0,ZEXT1632(auVar95));
    local_840 = vpermt2ps_avx512vl(auVar118,_DAT_01fb9fc0,ZEXT1632(auVar95));
    auVar103 = ZEXT1632(auVar95);
    auVar124 = vpermt2ps_avx512vl(auVar119,_DAT_01fb9fc0,auVar103);
    auVar244._0_4_ = auVar121._0_4_ + fVar215;
    auVar244._4_4_ = auVar121._4_4_ + fVar233;
    auVar244._8_4_ = auVar121._8_4_ + fVar234;
    auVar244._12_4_ = auVar121._12_4_ + fVar235;
    auVar244._16_4_ = auVar121._16_4_ + fVar236;
    auVar244._20_4_ = auVar121._20_4_ + fVar237;
    auVar244._24_4_ = auVar121._24_4_ + fVar214;
    auVar244._28_4_ = auVar121._28_4_ + fVar163;
    auVar116 = vmaxps_avx(auVar121,auVar244);
    auVar105 = vminps_avx(auVar121,auVar244);
    auVar121 = vpermt2ps_avx512vl(auVar121,_DAT_01fb9fc0,auVar103);
    auVar123 = vpermt2ps_avx512vl(auVar45,_DAT_01fb9fc0,auVar103);
    auVar125 = vpermt2ps_avx512vl(auVar46,_DAT_01fb9fc0,auVar103);
    auVar141 = ZEXT1632(auVar95);
    auVar126 = vpermt2ps_avx512vl(auVar47,_DAT_01fb9fc0,auVar141);
    auVar103 = vpermt2ps_avx512vl(auVar48,_DAT_01fb9fc0,auVar141);
    auVar127 = vsubps_avx512vl(auVar121,auVar103);
    auVar103 = vsubps_avx(auVar122,auVar120);
    auVar264 = ZEXT3264(auVar103);
    auVar104 = vsubps_avx(local_840,auVar118);
    auVar259 = ZEXT3264(auVar104);
    auVar117 = vsubps_avx(auVar124,auVar119);
    auVar128 = vmulps_avx512vl(auVar104,auVar47);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar46,auVar117);
    auVar129 = vmulps_avx512vl(auVar117,auVar45);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar47,auVar103);
    auVar130 = vmulps_avx512vl(auVar103,auVar46);
    auVar130 = vfmsub231ps_avx512vl(auVar130,auVar45,auVar104);
    auVar130 = vmulps_avx512vl(auVar130,auVar130);
    auVar129 = vfmadd231ps_avx512vl(auVar130,auVar129,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar128);
    auVar129 = vmulps_avx512vl(auVar117,auVar117);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar104,auVar104);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar103,auVar103);
    auVar130 = vrcp14ps_avx512vl(auVar129);
    auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar132 = vfnmadd213ps_avx512vl(auVar130,auVar129,auVar131);
    auVar130 = vfmadd132ps_avx512vl(auVar132,auVar130,auVar130);
    auVar128 = vmulps_avx512vl(auVar128,auVar130);
    auVar132 = vmulps_avx512vl(auVar104,auVar126);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar125,auVar117);
    auVar133 = vmulps_avx512vl(auVar117,auVar123);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar126,auVar103);
    auVar134 = vmulps_avx512vl(auVar103,auVar125);
    auVar134 = vfmsub231ps_avx512vl(auVar134,auVar123,auVar104);
    auVar134 = vmulps_avx512vl(auVar134,auVar134);
    auVar133 = vfmadd231ps_avx512vl(auVar134,auVar133,auVar133);
    auVar132 = vfmadd231ps_avx512vl(auVar133,auVar132,auVar132);
    auVar130 = vmulps_avx512vl(auVar132,auVar130);
    auVar128 = vmaxps_avx512vl(auVar128,auVar130);
    auVar128 = vsqrtps_avx512vl(auVar128);
    auVar130 = vmaxps_avx512vl(auVar127,auVar121);
    auVar116 = vmaxps_avx512vl(auVar116,auVar130);
    auVar130 = vaddps_avx512vl(auVar128,auVar116);
    auVar116 = vminps_avx512vl(auVar127,auVar121);
    auVar116 = vminps_avx(auVar105,auVar116);
    auVar116 = vsubps_avx512vl(auVar116,auVar128);
    auVar134._8_4_ = 0x3f800002;
    auVar134._0_8_ = 0x3f8000023f800002;
    auVar134._12_4_ = 0x3f800002;
    auVar134._16_4_ = 0x3f800002;
    auVar134._20_4_ = 0x3f800002;
    auVar134._24_4_ = 0x3f800002;
    auVar134._28_4_ = 0x3f800002;
    auVar105 = vmulps_avx512vl(auVar130,auVar134);
    auVar135._8_4_ = 0x3f7ffffc;
    auVar135._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar135._12_4_ = 0x3f7ffffc;
    auVar135._16_4_ = 0x3f7ffffc;
    auVar135._20_4_ = 0x3f7ffffc;
    auVar135._24_4_ = 0x3f7ffffc;
    auVar135._28_4_ = 0x3f7ffffc;
    auVar116 = vmulps_avx512vl(auVar116,auVar135);
    local_800._0_32_ = auVar116;
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar121 = vrsqrt14ps_avx512vl(auVar129);
    auVar136._8_4_ = 0xbf000000;
    auVar136._0_8_ = 0xbf000000bf000000;
    auVar136._12_4_ = 0xbf000000;
    auVar136._16_4_ = 0xbf000000;
    auVar136._20_4_ = 0xbf000000;
    auVar136._24_4_ = 0xbf000000;
    auVar136._28_4_ = 0xbf000000;
    auVar127 = vmulps_avx512vl(auVar129,auVar136);
    fVar163 = auVar121._0_4_;
    fVar215 = auVar121._4_4_;
    fVar233 = auVar121._8_4_;
    fVar234 = auVar121._12_4_;
    fVar235 = auVar121._16_4_;
    fVar236 = auVar121._20_4_;
    fVar237 = auVar121._24_4_;
    auVar49._4_4_ = fVar215 * fVar215 * fVar215 * auVar127._4_4_;
    auVar49._0_4_ = fVar163 * fVar163 * fVar163 * auVar127._0_4_;
    auVar49._8_4_ = fVar233 * fVar233 * fVar233 * auVar127._8_4_;
    auVar49._12_4_ = fVar234 * fVar234 * fVar234 * auVar127._12_4_;
    auVar49._16_4_ = fVar235 * fVar235 * fVar235 * auVar127._16_4_;
    auVar49._20_4_ = fVar236 * fVar236 * fVar236 * auVar127._20_4_;
    auVar49._24_4_ = fVar237 * fVar237 * fVar237 * auVar127._24_4_;
    auVar49._28_4_ = auVar130._28_4_;
    auVar137._8_4_ = 0x3fc00000;
    auVar137._0_8_ = 0x3fc000003fc00000;
    auVar137._12_4_ = 0x3fc00000;
    auVar137._16_4_ = 0x3fc00000;
    auVar137._20_4_ = 0x3fc00000;
    auVar137._24_4_ = 0x3fc00000;
    auVar137._28_4_ = 0x3fc00000;
    auVar121 = vfmadd231ps_avx512vl(auVar49,auVar121,auVar137);
    auVar127 = vmulps_avx512vl(auVar103,auVar121);
    auVar128 = vmulps_avx512vl(auVar104,auVar121);
    auVar129 = vmulps_avx512vl(auVar117,auVar121);
    auVar130 = vsubps_avx512vl(auVar141,auVar120);
    auVar132 = vsubps_avx512vl(auVar141,auVar118);
    auVar133 = vsubps_avx512vl(auVar141,auVar119);
    auVar278 = auVar279._0_32_;
    auVar134 = vmulps_avx512vl(auVar278,auVar133);
    auVar134 = vfmadd231ps_avx512vl(auVar134,local_700,auVar132);
    auVar134 = vfmadd231ps_avx512vl(auVar134,local_860,auVar130);
    auVar135 = vmulps_avx512vl(auVar133,auVar133);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar132,auVar132);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar130,auVar130);
    auVar136 = vmulps_avx512vl(auVar278,auVar129);
    auVar136 = vfmadd231ps_avx512vl(auVar136,auVar128,local_700);
    auVar136 = vfmadd231ps_avx512vl(auVar136,auVar127,local_860);
    auVar129 = vmulps_avx512vl(auVar133,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar132,auVar128);
    auVar127 = vfmadd231ps_avx512vl(auVar128,auVar130,auVar127);
    auVar128 = vmulps_avx512vl(auVar136,auVar136);
    auVar129 = vsubps_avx512vl(local_5a0,auVar128);
    auVar137 = vmulps_avx512vl(auVar136,auVar127);
    auVar134 = vsubps_avx512vl(auVar134,auVar137);
    auVar134 = vaddps_avx512vl(auVar134,auVar134);
    auVar137 = vmulps_avx512vl(auVar127,auVar127);
    local_a80 = vsubps_avx512vl(auVar135,auVar137);
    auVar105 = vsubps_avx512vl(local_a80,auVar105);
    local_880 = vmulps_avx512vl(auVar134,auVar134);
    auVar138._8_4_ = 0x40800000;
    auVar138._0_8_ = 0x4080000040800000;
    auVar138._12_4_ = 0x40800000;
    auVar138._16_4_ = 0x40800000;
    auVar138._20_4_ = 0x40800000;
    auVar138._24_4_ = 0x40800000;
    auVar138._28_4_ = 0x40800000;
    _local_aa0 = vmulps_avx512vl(auVar129,auVar138);
    auVar135 = vmulps_avx512vl(_local_aa0,auVar105);
    auVar135 = vsubps_avx512vl(local_880,auVar135);
    uVar93 = vcmpps_avx512vl(auVar135,auVar141,5);
    bVar83 = (byte)uVar93;
    if (bVar83 == 0) {
LAB_01a493cb:
      auVar180 = ZEXT3264(_DAT_01f7b040);
      auVar280 = ZEXT3264(auVar131);
      auVar271 = ZEXT3264(auVar124);
      auVar270 = ZEXT3264(local_840);
    }
    else {
      auVar135 = vsqrtps_avx512vl(auVar135);
      auVar137 = vaddps_avx512vl(auVar129,auVar129);
      local_8e0 = vrcp14ps_avx512vl(auVar137);
      auVar138 = vfnmadd213ps_avx512vl(local_8e0,auVar137,auVar131);
      auVar138 = vfmadd132ps_avx512vl(auVar138,local_8e0,local_8e0);
      auVar34._8_4_ = 0x80000000;
      auVar34._0_8_ = 0x8000000080000000;
      auVar34._12_4_ = 0x80000000;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      local_a20 = vxorps_avx512vl(auVar134,auVar34);
      auVar131 = vsubps_avx512vl(local_a20,auVar135);
      local_8c0 = vmulps_avx512vl(auVar131,auVar138);
      auVar135 = vsubps_avx512vl(auVar135,auVar134);
      local_8a0 = vmulps_avx512vl(auVar135,auVar138);
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar138 = vblendmps_avx512vl(auVar135,local_8c0);
      auVar139._0_4_ =
           (uint)(bVar83 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar135._0_4_;
      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar139._4_4_ = (uint)bVar92 * auVar138._4_4_ | (uint)!bVar92 * auVar135._4_4_;
      bVar92 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar139._8_4_ = (uint)bVar92 * auVar138._8_4_ | (uint)!bVar92 * auVar135._8_4_;
      bVar92 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar139._12_4_ = (uint)bVar92 * auVar138._12_4_ | (uint)!bVar92 * auVar135._12_4_;
      bVar92 = (bool)((byte)(uVar93 >> 4) & 1);
      auVar139._16_4_ = (uint)bVar92 * auVar138._16_4_ | (uint)!bVar92 * auVar135._16_4_;
      bVar92 = (bool)((byte)(uVar93 >> 5) & 1);
      auVar139._20_4_ = (uint)bVar92 * auVar138._20_4_ | (uint)!bVar92 * auVar135._20_4_;
      bVar92 = (bool)((byte)(uVar93 >> 6) & 1);
      auVar139._24_4_ = (uint)bVar92 * auVar138._24_4_ | (uint)!bVar92 * auVar135._24_4_;
      bVar92 = SUB81(uVar93 >> 7,0);
      auVar139._28_4_ = (uint)bVar92 * auVar138._28_4_ | (uint)!bVar92 * auVar135._28_4_;
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar138 = vblendmps_avx512vl(auVar135,local_8a0);
      auVar140._0_4_ =
           (uint)(bVar83 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar135._0_4_;
      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar140._4_4_ = (uint)bVar92 * auVar138._4_4_ | (uint)!bVar92 * auVar135._4_4_;
      bVar92 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar140._8_4_ = (uint)bVar92 * auVar138._8_4_ | (uint)!bVar92 * auVar135._8_4_;
      bVar92 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar140._12_4_ = (uint)bVar92 * auVar138._12_4_ | (uint)!bVar92 * auVar135._12_4_;
      bVar92 = (bool)((byte)(uVar93 >> 4) & 1);
      auVar140._16_4_ = (uint)bVar92 * auVar138._16_4_ | (uint)!bVar92 * auVar135._16_4_;
      bVar92 = (bool)((byte)(uVar93 >> 5) & 1);
      auVar140._20_4_ = (uint)bVar92 * auVar138._20_4_ | (uint)!bVar92 * auVar135._20_4_;
      bVar92 = (bool)((byte)(uVar93 >> 6) & 1);
      auVar140._24_4_ = (uint)bVar92 * auVar138._24_4_ | (uint)!bVar92 * auVar135._24_4_;
      bVar92 = SUB81(uVar93 >> 7,0);
      auVar140._28_4_ = (uint)bVar92 * auVar138._28_4_ | (uint)!bVar92 * auVar135._28_4_;
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar128,auVar135);
      local_a40 = vmaxps_avx512vl(local_5c0,auVar135);
      auVar35._8_4_ = 0x36000000;
      auVar35._0_8_ = 0x3600000036000000;
      auVar35._12_4_ = 0x36000000;
      auVar35._16_4_ = 0x36000000;
      auVar35._20_4_ = 0x36000000;
      auVar35._24_4_ = 0x36000000;
      auVar35._28_4_ = 0x36000000;
      local_900 = vmulps_avx512vl(local_a40,auVar35);
      vandps_avx512vl(auVar129,auVar135);
      uVar90 = vcmpps_avx512vl(local_900,local_900,1);
      uVar93 = uVar93 & uVar90;
      bVar89 = (byte)uVar93;
      if (bVar89 != 0) {
        uVar90 = vcmpps_avx512vl(auVar105,_DAT_01f7b000,2);
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar128 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar129 = vblendmps_avx512vl(auVar105,auVar128);
        bVar87 = (byte)uVar90;
        uVar94 = (uint)(bVar87 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar87 & 1) * local_900._0_4_;
        bVar92 = (bool)((byte)(uVar90 >> 1) & 1);
        uVar156 = (uint)bVar92 * auVar129._4_4_ | (uint)!bVar92 * local_900._4_4_;
        bVar92 = (bool)((byte)(uVar90 >> 2) & 1);
        uVar157 = (uint)bVar92 * auVar129._8_4_ | (uint)!bVar92 * local_900._8_4_;
        bVar92 = (bool)((byte)(uVar90 >> 3) & 1);
        uVar158 = (uint)bVar92 * auVar129._12_4_ | (uint)!bVar92 * local_900._12_4_;
        bVar92 = (bool)((byte)(uVar90 >> 4) & 1);
        uVar159 = (uint)bVar92 * auVar129._16_4_ | (uint)!bVar92 * local_900._16_4_;
        bVar92 = (bool)((byte)(uVar90 >> 5) & 1);
        uVar160 = (uint)bVar92 * auVar129._20_4_ | (uint)!bVar92 * local_900._20_4_;
        bVar92 = (bool)((byte)(uVar90 >> 6) & 1);
        uVar161 = (uint)bVar92 * auVar129._24_4_ | (uint)!bVar92 * local_900._24_4_;
        bVar92 = SUB81(uVar90 >> 7,0);
        uVar162 = (uint)bVar92 * auVar129._28_4_ | (uint)!bVar92 * local_900._28_4_;
        auVar139._0_4_ = (bVar89 & 1) * uVar94 | !(bool)(bVar89 & 1) * auVar139._0_4_;
        bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar139._4_4_ = bVar92 * uVar156 | !bVar92 * auVar139._4_4_;
        bVar92 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar139._8_4_ = bVar92 * uVar157 | !bVar92 * auVar139._8_4_;
        bVar92 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar139._12_4_ = bVar92 * uVar158 | !bVar92 * auVar139._12_4_;
        bVar92 = (bool)((byte)(uVar93 >> 4) & 1);
        auVar139._16_4_ = bVar92 * uVar159 | !bVar92 * auVar139._16_4_;
        bVar92 = (bool)((byte)(uVar93 >> 5) & 1);
        auVar139._20_4_ = bVar92 * uVar160 | !bVar92 * auVar139._20_4_;
        bVar92 = (bool)((byte)(uVar93 >> 6) & 1);
        auVar139._24_4_ = bVar92 * uVar161 | !bVar92 * auVar139._24_4_;
        bVar92 = SUB81(uVar93 >> 7,0);
        auVar139._28_4_ = bVar92 * uVar162 | !bVar92 * auVar139._28_4_;
        auVar105 = vblendmps_avx512vl(auVar128,auVar105);
        bVar92 = (bool)((byte)(uVar90 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar90 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar90 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar90 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar90 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar90 >> 6) & 1);
        bVar13 = SUB81(uVar90 >> 7,0);
        auVar140._0_4_ =
             (uint)(bVar89 & 1) *
             ((uint)(bVar87 & 1) * auVar105._0_4_ | !(bool)(bVar87 & 1) * uVar94) |
             !(bool)(bVar89 & 1) * auVar140._0_4_;
        bVar7 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar140._4_4_ =
             (uint)bVar7 * ((uint)bVar92 * auVar105._4_4_ | !bVar92 * uVar156) |
             !bVar7 * auVar140._4_4_;
        bVar92 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar140._8_4_ =
             (uint)bVar92 * ((uint)bVar8 * auVar105._8_4_ | !bVar8 * uVar157) |
             !bVar92 * auVar140._8_4_;
        bVar92 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar140._12_4_ =
             (uint)bVar92 * ((uint)bVar9 * auVar105._12_4_ | !bVar9 * uVar158) |
             !bVar92 * auVar140._12_4_;
        bVar92 = (bool)((byte)(uVar93 >> 4) & 1);
        auVar140._16_4_ =
             (uint)bVar92 * ((uint)bVar10 * auVar105._16_4_ | !bVar10 * uVar159) |
             !bVar92 * auVar140._16_4_;
        bVar92 = (bool)((byte)(uVar93 >> 5) & 1);
        auVar140._20_4_ =
             (uint)bVar92 * ((uint)bVar11 * auVar105._20_4_ | !bVar11 * uVar160) |
             !bVar92 * auVar140._20_4_;
        bVar92 = (bool)((byte)(uVar93 >> 6) & 1);
        auVar140._24_4_ =
             (uint)bVar92 * ((uint)bVar12 * auVar105._24_4_ | !bVar12 * uVar161) |
             !bVar92 * auVar140._24_4_;
        bVar92 = SUB81(uVar93 >> 7,0);
        auVar140._28_4_ =
             (uint)bVar92 * ((uint)bVar13 * auVar105._28_4_ | !bVar13 * uVar162) |
             !bVar92 * auVar140._28_4_;
        bVar83 = (~bVar89 | bVar87) & bVar83;
      }
      if ((bVar83 & 0x7f) == 0) {
        auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        goto LAB_01a493cb;
      }
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar126 = vxorps_avx512vl(auVar126,auVar105);
      auVar123 = vxorps_avx512vl(auVar123,auVar105);
      auVar180 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
      auVar125 = vxorps_avx512vl(auVar125,auVar105);
      auVar95 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                               ZEXT416((uint)local_950._0_4_));
      auVar128 = vbroadcastss_avx512vl(auVar95);
      auVar128 = vminps_avx512vl(auVar128,auVar140);
      auVar82._4_4_ = fStack_65c;
      auVar82._0_4_ = local_660;
      auVar82._8_4_ = fStack_658;
      auVar82._12_4_ = fStack_654;
      auVar82._16_4_ = fStack_650;
      auVar82._20_4_ = fStack_64c;
      auVar82._24_4_ = fStack_648;
      auVar82._28_4_ = fStack_644;
      auVar129 = vmaxps_avx512vl(auVar82,auVar139);
      auVar133 = vmulps_avx512vl(auVar133,auVar47);
      auVar132 = vfmadd213ps_avx512vl(auVar132,auVar46,auVar133);
      auVar95 = vfmadd213ps_fma(auVar130,auVar45,auVar132);
      auVar130 = vmulps_avx512vl(auVar278,auVar47);
      auVar130 = vfmadd231ps_avx512vl(auVar130,local_700,auVar46);
      auVar130 = vfmadd231ps_avx512vl(auVar130,local_860,auVar45);
      auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar130,auVar132);
      auVar133 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar22 = vcmpps_avx512vl(auVar132,auVar133,1);
      auVar135 = vxorps_avx512vl(ZEXT1632(auVar95),auVar105);
      auVar138 = vrcp14ps_avx512vl(auVar130);
      auVar141 = vxorps_avx512vl(auVar130,auVar105);
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar142 = vfnmadd213ps_avx512vl(auVar138,auVar130,auVar131);
      auVar95 = vfmadd132ps_fma(auVar142,auVar138,auVar138);
      fVar163 = auVar95._0_4_ * auVar135._0_4_;
      fVar215 = auVar95._4_4_ * auVar135._4_4_;
      auVar50._4_4_ = fVar215;
      auVar50._0_4_ = fVar163;
      fVar233 = auVar95._8_4_ * auVar135._8_4_;
      auVar50._8_4_ = fVar233;
      fVar234 = auVar95._12_4_ * auVar135._12_4_;
      auVar50._12_4_ = fVar234;
      fVar235 = auVar135._16_4_ * 0.0;
      auVar50._16_4_ = fVar235;
      fVar236 = auVar135._20_4_ * 0.0;
      auVar50._20_4_ = fVar236;
      fVar237 = auVar135._24_4_ * 0.0;
      auVar50._24_4_ = fVar237;
      auVar50._28_4_ = auVar135._28_4_;
      uVar24 = vcmpps_avx512vl(auVar130,auVar141,1);
      bVar89 = (byte)uVar22 | (byte)uVar24;
      auVar276._8_4_ = 0xff800000;
      auVar276._0_8_ = 0xff800000ff800000;
      auVar276._12_4_ = 0xff800000;
      auVar276._16_4_ = 0xff800000;
      auVar276._20_4_ = 0xff800000;
      auVar276._24_4_ = 0xff800000;
      auVar276._28_4_ = 0xff800000;
      auVar142 = vblendmps_avx512vl(auVar50,auVar276);
      auVar143._0_4_ =
           (uint)(bVar89 & 1) * auVar142._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar138._0_4_;
      bVar92 = (bool)(bVar89 >> 1 & 1);
      auVar143._4_4_ = (uint)bVar92 * auVar142._4_4_ | (uint)!bVar92 * auVar138._4_4_;
      bVar92 = (bool)(bVar89 >> 2 & 1);
      auVar143._8_4_ = (uint)bVar92 * auVar142._8_4_ | (uint)!bVar92 * auVar138._8_4_;
      bVar92 = (bool)(bVar89 >> 3 & 1);
      auVar143._12_4_ = (uint)bVar92 * auVar142._12_4_ | (uint)!bVar92 * auVar138._12_4_;
      bVar92 = (bool)(bVar89 >> 4 & 1);
      auVar143._16_4_ = (uint)bVar92 * auVar142._16_4_ | (uint)!bVar92 * auVar138._16_4_;
      bVar92 = (bool)(bVar89 >> 5 & 1);
      auVar143._20_4_ = (uint)bVar92 * auVar142._20_4_ | (uint)!bVar92 * auVar138._20_4_;
      bVar92 = (bool)(bVar89 >> 6 & 1);
      auVar143._24_4_ = (uint)bVar92 * auVar142._24_4_ | (uint)!bVar92 * auVar138._24_4_;
      auVar143._28_4_ =
           (uint)(bVar89 >> 7) * auVar142._28_4_ | (uint)!(bool)(bVar89 >> 7) * auVar138._28_4_;
      auVar129 = vmaxps_avx512vl(auVar129,auVar143);
      uVar24 = vcmpps_avx512vl(auVar130,auVar141,6);
      bVar89 = (byte)uVar22 | (byte)uVar24;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar144._0_4_ =
           (uint)(bVar89 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar89 & 1) * (int)fVar163;
      bVar92 = (bool)(bVar89 >> 1 & 1);
      auVar144._4_4_ = (uint)bVar92 * auVar130._4_4_ | (uint)!bVar92 * (int)fVar215;
      bVar92 = (bool)(bVar89 >> 2 & 1);
      auVar144._8_4_ = (uint)bVar92 * auVar130._8_4_ | (uint)!bVar92 * (int)fVar233;
      bVar92 = (bool)(bVar89 >> 3 & 1);
      auVar144._12_4_ = (uint)bVar92 * auVar130._12_4_ | (uint)!bVar92 * (int)fVar234;
      bVar92 = (bool)(bVar89 >> 4 & 1);
      auVar144._16_4_ = (uint)bVar92 * auVar130._16_4_ | (uint)!bVar92 * (int)fVar235;
      bVar92 = (bool)(bVar89 >> 5 & 1);
      auVar144._20_4_ = (uint)bVar92 * auVar130._20_4_ | (uint)!bVar92 * (int)fVar236;
      bVar92 = (bool)(bVar89 >> 6 & 1);
      auVar144._24_4_ = (uint)bVar92 * auVar130._24_4_ | (uint)!bVar92 * (int)fVar237;
      auVar144._28_4_ =
           (uint)(bVar89 >> 7) * auVar130._28_4_ | (uint)!(bool)(bVar89 >> 7) * auVar135._28_4_;
      auVar135 = vminps_avx512vl(auVar128,auVar144);
      auVar95 = vxorps_avx512vl(auVar128._0_16_,auVar128._0_16_);
      auVar122 = vsubps_avx512vl(ZEXT1632(auVar95),auVar122);
      auVar128 = vsubps_avx512vl(ZEXT1632(auVar95),local_840);
      auVar141 = ZEXT1632(auVar95);
      auVar138 = vsubps_avx512vl(auVar141,auVar124);
      auVar138 = vmulps_avx512vl(auVar138,auVar126);
      auVar128 = vfmadd231ps_avx512vl(auVar138,auVar125,auVar128);
      auVar122 = vfmadd231ps_avx512vl(auVar128,auVar123,auVar122);
      auVar126 = vmulps_avx512vl(auVar278,auVar126);
      auVar125 = vfmadd231ps_avx512vl(auVar126,local_700,auVar125);
      auVar123 = vfmadd231ps_avx512vl(auVar125,local_860,auVar123);
      vandps_avx512vl(auVar123,auVar132);
      uVar22 = vcmpps_avx512vl(auVar123,auVar133,1);
      auVar122 = vxorps_avx512vl(auVar122,auVar105);
      auVar125 = vrcp14ps_avx512vl(auVar123);
      auVar124 = vxorps_avx512vl(auVar123,auVar105);
      auVar105 = vfnmadd213ps_avx512vl(auVar125,auVar123,auVar131);
      auVar95 = vfmadd132ps_fma(auVar105,auVar125,auVar125);
      fVar163 = auVar95._0_4_ * auVar122._0_4_;
      fVar215 = auVar95._4_4_ * auVar122._4_4_;
      auVar51._4_4_ = fVar215;
      auVar51._0_4_ = fVar163;
      fVar233 = auVar95._8_4_ * auVar122._8_4_;
      auVar51._8_4_ = fVar233;
      fVar234 = auVar95._12_4_ * auVar122._12_4_;
      auVar51._12_4_ = fVar234;
      fVar235 = auVar122._16_4_ * 0.0;
      auVar51._16_4_ = fVar235;
      fVar236 = auVar122._20_4_ * 0.0;
      auVar51._20_4_ = fVar236;
      fVar237 = auVar122._24_4_ * 0.0;
      auVar51._24_4_ = fVar237;
      auVar51._28_4_ = auVar122._28_4_;
      uVar24 = vcmpps_avx512vl(auVar123,auVar124,1);
      bVar89 = (byte)uVar22 | (byte)uVar24;
      auVar105 = vblendmps_avx512vl(auVar51,auVar276);
      auVar145._0_4_ =
           (uint)(bVar89 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar125._0_4_;
      bVar92 = (bool)(bVar89 >> 1 & 1);
      auVar145._4_4_ = (uint)bVar92 * auVar105._4_4_ | (uint)!bVar92 * auVar125._4_4_;
      bVar92 = (bool)(bVar89 >> 2 & 1);
      auVar145._8_4_ = (uint)bVar92 * auVar105._8_4_ | (uint)!bVar92 * auVar125._8_4_;
      bVar92 = (bool)(bVar89 >> 3 & 1);
      auVar145._12_4_ = (uint)bVar92 * auVar105._12_4_ | (uint)!bVar92 * auVar125._12_4_;
      bVar92 = (bool)(bVar89 >> 4 & 1);
      auVar145._16_4_ = (uint)bVar92 * auVar105._16_4_ | (uint)!bVar92 * auVar125._16_4_;
      bVar92 = (bool)(bVar89 >> 5 & 1);
      auVar145._20_4_ = (uint)bVar92 * auVar105._20_4_ | (uint)!bVar92 * auVar125._20_4_;
      bVar92 = (bool)(bVar89 >> 6 & 1);
      auVar145._24_4_ = (uint)bVar92 * auVar105._24_4_ | (uint)!bVar92 * auVar125._24_4_;
      auVar145._28_4_ =
           (uint)(bVar89 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar89 >> 7) * auVar125._28_4_;
      local_840 = vmaxps_avx(auVar129,auVar145);
      uVar24 = vcmpps_avx512vl(auVar123,auVar124,6);
      bVar89 = (byte)uVar22 | (byte)uVar24;
      auVar146._0_4_ =
           (uint)(bVar89 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar89 & 1) * (int)fVar163;
      bVar92 = (bool)(bVar89 >> 1 & 1);
      auVar146._4_4_ = (uint)bVar92 * auVar130._4_4_ | (uint)!bVar92 * (int)fVar215;
      bVar92 = (bool)(bVar89 >> 2 & 1);
      auVar146._8_4_ = (uint)bVar92 * auVar130._8_4_ | (uint)!bVar92 * (int)fVar233;
      bVar92 = (bool)(bVar89 >> 3 & 1);
      auVar146._12_4_ = (uint)bVar92 * auVar130._12_4_ | (uint)!bVar92 * (int)fVar234;
      bVar92 = (bool)(bVar89 >> 4 & 1);
      auVar146._16_4_ = (uint)bVar92 * auVar130._16_4_ | (uint)!bVar92 * (int)fVar235;
      bVar92 = (bool)(bVar89 >> 5 & 1);
      auVar146._20_4_ = (uint)bVar92 * auVar130._20_4_ | (uint)!bVar92 * (int)fVar236;
      bVar92 = (bool)(bVar89 >> 6 & 1);
      auVar146._24_4_ = (uint)bVar92 * auVar130._24_4_ | (uint)!bVar92 * (int)fVar237;
      auVar146._28_4_ =
           (uint)(bVar89 >> 7) * auVar130._28_4_ | (uint)!(bool)(bVar89 >> 7) * auVar122._28_4_;
      local_6c0 = vminps_avx(auVar135,auVar146);
      uVar22 = vcmpps_avx512vl(local_840,local_6c0,2);
      bVar83 = bVar83 & 0x7f & (byte)uVar22;
      if (bVar83 == 0) {
        auVar279 = ZEXT3264(auVar278);
        goto LAB_01a493cb;
      }
      auVar105 = vmaxps_avx512vl(auVar141,auVar116);
      auVar116 = vfmadd213ps_avx512vl(local_8c0,auVar136,auVar127);
      fVar163 = auVar121._0_4_;
      fVar215 = auVar121._4_4_;
      auVar52._4_4_ = fVar215 * auVar116._4_4_;
      auVar52._0_4_ = fVar163 * auVar116._0_4_;
      fVar233 = auVar121._8_4_;
      auVar52._8_4_ = fVar233 * auVar116._8_4_;
      fVar234 = auVar121._12_4_;
      auVar52._12_4_ = fVar234 * auVar116._12_4_;
      fVar235 = auVar121._16_4_;
      auVar52._16_4_ = fVar235 * auVar116._16_4_;
      fVar236 = auVar121._20_4_;
      auVar52._20_4_ = fVar236 * auVar116._20_4_;
      fVar237 = auVar121._24_4_;
      auVar52._24_4_ = fVar237 * auVar116._24_4_;
      auVar52._28_4_ = auVar116._28_4_;
      auVar116 = vfmadd213ps_avx512vl(local_8a0,auVar136,auVar127);
      auVar53._4_4_ = fVar215 * auVar116._4_4_;
      auVar53._0_4_ = fVar163 * auVar116._0_4_;
      auVar53._8_4_ = fVar233 * auVar116._8_4_;
      auVar53._12_4_ = fVar234 * auVar116._12_4_;
      auVar53._16_4_ = fVar235 * auVar116._16_4_;
      auVar53._20_4_ = fVar236 * auVar116._20_4_;
      auVar53._24_4_ = fVar237 * auVar116._24_4_;
      auVar53._28_4_ = auVar116._28_4_;
      auVar116 = vminps_avx512vl(auVar52,auVar131);
      auVar122 = ZEXT832(0) << 0x20;
      auVar116 = vmaxps_avx(auVar116,ZEXT832(0) << 0x20);
      auVar123 = vminps_avx512vl(auVar53,auVar131);
      auVar54._4_4_ = (auVar116._4_4_ + 1.0) * 0.125;
      auVar54._0_4_ = (auVar116._0_4_ + 0.0) * 0.125;
      auVar54._8_4_ = (auVar116._8_4_ + 2.0) * 0.125;
      auVar54._12_4_ = (auVar116._12_4_ + 3.0) * 0.125;
      auVar54._16_4_ = (auVar116._16_4_ + 4.0) * 0.125;
      auVar54._20_4_ = (auVar116._20_4_ + 5.0) * 0.125;
      auVar54._24_4_ = (auVar116._24_4_ + 6.0) * 0.125;
      auVar54._28_4_ = auVar116._28_4_ + 7.0;
      local_4e0 = vfmadd213ps_avx512vl(auVar54,auVar171,auVar242);
      auVar116 = vmaxps_avx(auVar123,ZEXT832(0) << 0x20);
      auVar55._4_4_ = (auVar116._4_4_ + 1.0) * 0.125;
      auVar55._0_4_ = (auVar116._0_4_ + 0.0) * 0.125;
      auVar55._8_4_ = (auVar116._8_4_ + 2.0) * 0.125;
      auVar55._12_4_ = (auVar116._12_4_ + 3.0) * 0.125;
      auVar55._16_4_ = (auVar116._16_4_ + 4.0) * 0.125;
      auVar55._20_4_ = (auVar116._20_4_ + 5.0) * 0.125;
      auVar55._24_4_ = (auVar116._24_4_ + 6.0) * 0.125;
      auVar55._28_4_ = auVar116._28_4_ + 7.0;
      local_500 = vfmadd213ps_avx512vl(auVar55,auVar171,auVar242);
      auVar56._4_4_ = auVar105._4_4_ * auVar105._4_4_;
      auVar56._0_4_ = auVar105._0_4_ * auVar105._0_4_;
      auVar56._8_4_ = auVar105._8_4_ * auVar105._8_4_;
      auVar56._12_4_ = auVar105._12_4_ * auVar105._12_4_;
      auVar56._16_4_ = auVar105._16_4_ * auVar105._16_4_;
      auVar56._20_4_ = auVar105._20_4_ * auVar105._20_4_;
      auVar56._24_4_ = auVar105._24_4_ * auVar105._24_4_;
      auVar56._28_4_ = auVar105._28_4_;
      auVar116 = vsubps_avx(local_a80,auVar56);
      auVar57._4_4_ = auVar116._4_4_ * (float)local_aa0._4_4_;
      auVar57._0_4_ = auVar116._0_4_ * (float)local_aa0._0_4_;
      auVar57._8_4_ = auVar116._8_4_ * fStack_a98;
      auVar57._12_4_ = auVar116._12_4_ * fStack_a94;
      auVar57._16_4_ = auVar116._16_4_ * fStack_a90;
      auVar57._20_4_ = auVar116._20_4_ * fStack_a8c;
      auVar57._24_4_ = auVar116._24_4_ * fStack_a88;
      auVar57._28_4_ = auVar105._28_4_;
      auVar105 = vsubps_avx(local_880,auVar57);
      uVar22 = vcmpps_avx512vl(auVar105,ZEXT832(0) << 0x20,5);
      bVar89 = (byte)uVar22;
      if (bVar89 == 0) {
        bVar89 = 0;
        auVar103 = ZEXT832(0) << 0x20;
        auVar104 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar105 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar270 = ZEXT864(0) << 0x20;
        auVar147._8_4_ = 0x7f800000;
        auVar147._0_8_ = 0x7f8000007f800000;
        auVar147._12_4_ = 0x7f800000;
        auVar147._16_4_ = 0x7f800000;
        auVar147._20_4_ = 0x7f800000;
        auVar147._24_4_ = 0x7f800000;
        auVar147._28_4_ = 0x7f800000;
        auVar148._8_4_ = 0xff800000;
        auVar148._0_8_ = 0xff800000ff800000;
        auVar148._12_4_ = 0xff800000;
        auVar148._16_4_ = 0xff800000;
        auVar148._20_4_ = 0xff800000;
        auVar148._24_4_ = 0xff800000;
        auVar148._28_4_ = 0xff800000;
      }
      else {
        auVar97 = vxorps_avx512vl(auVar132._0_16_,auVar132._0_16_);
        uVar93 = vcmpps_avx512vl(auVar105,auVar141,5);
        auVar105 = vsqrtps_avx(auVar105);
        auVar122 = vfnmadd213ps_avx512vl(auVar137,local_8e0,auVar131);
        auVar125 = vfmadd132ps_avx512vl(auVar122,local_8e0,local_8e0);
        auVar122 = vsubps_avx(local_a20,auVar105);
        auVar126 = vmulps_avx512vl(auVar122,auVar125);
        auVar105 = vsubps_avx512vl(auVar105,auVar134);
        auVar125 = vmulps_avx512vl(auVar105,auVar125);
        auVar105 = vfmadd213ps_avx512vl(auVar136,auVar126,auVar127);
        auVar58._4_4_ = fVar215 * auVar105._4_4_;
        auVar58._0_4_ = fVar163 * auVar105._0_4_;
        auVar58._8_4_ = fVar233 * auVar105._8_4_;
        auVar58._12_4_ = fVar234 * auVar105._12_4_;
        auVar58._16_4_ = fVar235 * auVar105._16_4_;
        auVar58._20_4_ = fVar236 * auVar105._20_4_;
        auVar58._24_4_ = fVar237 * auVar105._24_4_;
        auVar58._28_4_ = auVar123._28_4_;
        auVar105 = vmulps_avx512vl(local_860,auVar126);
        auVar122 = vmulps_avx512vl(local_700,auVar126);
        auVar128 = vmulps_avx512vl(auVar278,auVar126);
        auVar123 = vfmadd213ps_avx512vl(auVar103,auVar58,auVar120);
        auVar105 = vsubps_avx512vl(auVar105,auVar123);
        auVar123 = vfmadd213ps_avx512vl(auVar104,auVar58,auVar118);
        auVar123 = vsubps_avx512vl(auVar122,auVar123);
        auVar95 = vfmadd213ps_fma(auVar58,auVar117,auVar119);
        auVar122 = vsubps_avx(auVar128,ZEXT1632(auVar95));
        auVar270 = ZEXT3264(auVar122);
        auVar122 = vfmadd213ps_avx512vl(auVar136,auVar125,auVar127);
        auVar121 = vmulps_avx512vl(auVar121,auVar122);
        auVar122 = vmulps_avx512vl(local_860,auVar125);
        auVar127 = vmulps_avx512vl(local_700,auVar125);
        auVar128 = vmulps_avx512vl(auVar278,auVar125);
        auVar95 = vfmadd213ps_fma(auVar103,auVar121,auVar120);
        auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar95));
        auVar95 = vfmadd213ps_fma(auVar104,auVar121,auVar118);
        auVar103 = vsubps_avx512vl(auVar127,ZEXT1632(auVar95));
        auVar95 = vfmadd213ps_fma(auVar117,auVar121,auVar119);
        auVar104 = vsubps_avx512vl(auVar128,ZEXT1632(auVar95));
        auVar172._8_4_ = 0x7f800000;
        auVar172._0_8_ = 0x7f8000007f800000;
        auVar172._12_4_ = 0x7f800000;
        auVar172._16_4_ = 0x7f800000;
        auVar172._20_4_ = 0x7f800000;
        auVar172._24_4_ = 0x7f800000;
        auVar172._28_4_ = 0x7f800000;
        auVar117 = vblendmps_avx512vl(auVar172,auVar126);
        bVar92 = (bool)((byte)uVar93 & 1);
        auVar147._0_4_ = (uint)bVar92 * auVar117._0_4_ | (uint)!bVar92 * auVar120._0_4_;
        bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar147._4_4_ = (uint)bVar92 * auVar117._4_4_ | (uint)!bVar92 * auVar120._4_4_;
        bVar92 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar147._8_4_ = (uint)bVar92 * auVar117._8_4_ | (uint)!bVar92 * auVar120._8_4_;
        bVar92 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar147._12_4_ = (uint)bVar92 * auVar117._12_4_ | (uint)!bVar92 * auVar120._12_4_;
        bVar92 = (bool)((byte)(uVar93 >> 4) & 1);
        auVar147._16_4_ = (uint)bVar92 * auVar117._16_4_ | (uint)!bVar92 * auVar120._16_4_;
        bVar92 = (bool)((byte)(uVar93 >> 5) & 1);
        auVar147._20_4_ = (uint)bVar92 * auVar117._20_4_ | (uint)!bVar92 * auVar120._20_4_;
        bVar92 = (bool)((byte)(uVar93 >> 6) & 1);
        auVar147._24_4_ = (uint)bVar92 * auVar117._24_4_ | (uint)!bVar92 * auVar120._24_4_;
        bVar92 = SUB81(uVar93 >> 7,0);
        auVar147._28_4_ = (uint)bVar92 * auVar117._28_4_ | (uint)!bVar92 * auVar120._28_4_;
        auVar173._8_4_ = 0xff800000;
        auVar173._0_8_ = 0xff800000ff800000;
        auVar173._12_4_ = 0xff800000;
        auVar173._16_4_ = 0xff800000;
        auVar173._20_4_ = 0xff800000;
        auVar173._24_4_ = 0xff800000;
        auVar173._28_4_ = 0xff800000;
        auVar117 = vblendmps_avx512vl(auVar173,auVar125);
        bVar92 = (bool)((byte)uVar93 & 1);
        auVar148._0_4_ = (uint)bVar92 * auVar117._0_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar148._4_4_ = (uint)bVar92 * auVar117._4_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar148._8_4_ = (uint)bVar92 * auVar117._8_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar148._12_4_ = (uint)bVar92 * auVar117._12_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar93 >> 4) & 1);
        auVar148._16_4_ = (uint)bVar92 * auVar117._16_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar93 >> 5) & 1);
        auVar148._20_4_ = (uint)bVar92 * auVar117._20_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar93 >> 6) & 1);
        auVar148._24_4_ = (uint)bVar92 * auVar117._24_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = SUB81(uVar93 >> 7,0);
        auVar148._28_4_ = (uint)bVar92 * auVar117._28_4_ | (uint)!bVar92 * -0x800000;
        auVar36._8_4_ = 0x36000000;
        auVar36._0_8_ = 0x3600000036000000;
        auVar36._12_4_ = 0x36000000;
        auVar36._16_4_ = 0x36000000;
        auVar36._20_4_ = 0x36000000;
        auVar36._24_4_ = 0x36000000;
        auVar36._28_4_ = 0x36000000;
        auVar117 = vmulps_avx512vl(local_a40,auVar36);
        uVar90 = vcmpps_avx512vl(auVar117,local_900,0xe);
        uVar93 = uVar93 & uVar90;
        bVar87 = (byte)uVar93;
        if (bVar87 != 0) {
          uVar90 = vcmpps_avx512vl(auVar116,ZEXT1632(auVar97),2);
          auVar263._8_4_ = 0x7f800000;
          auVar263._0_8_ = 0x7f8000007f800000;
          auVar263._12_4_ = 0x7f800000;
          auVar263._16_4_ = 0x7f800000;
          auVar263._20_4_ = 0x7f800000;
          auVar263._24_4_ = 0x7f800000;
          auVar263._28_4_ = 0x7f800000;
          auVar274._8_4_ = 0xff800000;
          auVar274._0_8_ = 0xff800000ff800000;
          auVar274._12_4_ = 0xff800000;
          auVar274._16_4_ = 0xff800000;
          auVar274._20_4_ = 0xff800000;
          auVar274._24_4_ = 0xff800000;
          auVar274._28_4_ = 0xff800000;
          auVar116 = vblendmps_avx512vl(auVar263,auVar274);
          bVar84 = (byte)uVar90;
          uVar94 = (uint)(bVar84 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar117._0_4_;
          bVar92 = (bool)((byte)(uVar90 >> 1) & 1);
          uVar156 = (uint)bVar92 * auVar116._4_4_ | (uint)!bVar92 * auVar117._4_4_;
          bVar92 = (bool)((byte)(uVar90 >> 2) & 1);
          uVar157 = (uint)bVar92 * auVar116._8_4_ | (uint)!bVar92 * auVar117._8_4_;
          bVar92 = (bool)((byte)(uVar90 >> 3) & 1);
          uVar158 = (uint)bVar92 * auVar116._12_4_ | (uint)!bVar92 * auVar117._12_4_;
          bVar92 = (bool)((byte)(uVar90 >> 4) & 1);
          uVar159 = (uint)bVar92 * auVar116._16_4_ | (uint)!bVar92 * auVar117._16_4_;
          bVar92 = (bool)((byte)(uVar90 >> 5) & 1);
          uVar160 = (uint)bVar92 * auVar116._20_4_ | (uint)!bVar92 * auVar117._20_4_;
          bVar92 = (bool)((byte)(uVar90 >> 6) & 1);
          uVar161 = (uint)bVar92 * auVar116._24_4_ | (uint)!bVar92 * auVar117._24_4_;
          bVar92 = SUB81(uVar90 >> 7,0);
          uVar162 = (uint)bVar92 * auVar116._28_4_ | (uint)!bVar92 * auVar117._28_4_;
          auVar147._0_4_ = (bVar87 & 1) * uVar94 | !(bool)(bVar87 & 1) * auVar147._0_4_;
          bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar147._4_4_ = bVar92 * uVar156 | !bVar92 * auVar147._4_4_;
          bVar92 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar147._8_4_ = bVar92 * uVar157 | !bVar92 * auVar147._8_4_;
          bVar92 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar147._12_4_ = bVar92 * uVar158 | !bVar92 * auVar147._12_4_;
          bVar92 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar147._16_4_ = bVar92 * uVar159 | !bVar92 * auVar147._16_4_;
          bVar92 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar147._20_4_ = bVar92 * uVar160 | !bVar92 * auVar147._20_4_;
          bVar92 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar147._24_4_ = bVar92 * uVar161 | !bVar92 * auVar147._24_4_;
          bVar92 = SUB81(uVar93 >> 7,0);
          auVar147._28_4_ = bVar92 * uVar162 | !bVar92 * auVar147._28_4_;
          auVar116 = vblendmps_avx512vl(auVar274,auVar263);
          bVar92 = (bool)((byte)(uVar90 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar90 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar90 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar90 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar90 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar90 >> 6) & 1);
          bVar13 = SUB81(uVar90 >> 7,0);
          auVar148._0_4_ =
               (uint)(bVar87 & 1) *
               ((uint)(bVar84 & 1) * auVar116._0_4_ | !(bool)(bVar84 & 1) * uVar94) |
               !(bool)(bVar87 & 1) * auVar148._0_4_;
          bVar7 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar148._4_4_ =
               (uint)bVar7 * ((uint)bVar92 * auVar116._4_4_ | !bVar92 * uVar156) |
               !bVar7 * auVar148._4_4_;
          bVar92 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar148._8_4_ =
               (uint)bVar92 * ((uint)bVar8 * auVar116._8_4_ | !bVar8 * uVar157) |
               !bVar92 * auVar148._8_4_;
          bVar92 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar148._12_4_ =
               (uint)bVar92 * ((uint)bVar9 * auVar116._12_4_ | !bVar9 * uVar158) |
               !bVar92 * auVar148._12_4_;
          bVar92 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar148._16_4_ =
               (uint)bVar92 * ((uint)bVar10 * auVar116._16_4_ | !bVar10 * uVar159) |
               !bVar92 * auVar148._16_4_;
          bVar92 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar148._20_4_ =
               (uint)bVar92 * ((uint)bVar11 * auVar116._20_4_ | !bVar11 * uVar160) |
               !bVar92 * auVar148._20_4_;
          bVar92 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar148._24_4_ =
               (uint)bVar92 * ((uint)bVar12 * auVar116._24_4_ | !bVar12 * uVar161) |
               !bVar92 * auVar148._24_4_;
          bVar92 = SUB81(uVar93 >> 7,0);
          auVar148._28_4_ =
               (uint)bVar92 * ((uint)bVar13 * auVar116._28_4_ | !bVar13 * uVar162) |
               !bVar92 * auVar148._28_4_;
          bVar89 = (~bVar87 | bVar84) & bVar89;
        }
      }
      auVar279 = ZEXT3264(auVar278);
      auVar116 = vmulps_avx512vl(auVar278,auVar104);
      auVar116 = vfmadd231ps_avx512vl(auVar116,local_700,auVar103);
      auVar264 = ZEXT3264(local_700);
      auVar116 = vfmadd231ps_avx512vl(auVar116,local_860,auVar122);
      auVar271 = ZEXT3264(local_840);
      _local_540 = local_840;
      local_520 = vminps_avx(local_6c0,auVar147);
      auVar258._8_4_ = 0x7fffffff;
      auVar258._0_8_ = 0x7fffffff7fffffff;
      auVar258._12_4_ = 0x7fffffff;
      auVar258._16_4_ = 0x7fffffff;
      auVar258._20_4_ = 0x7fffffff;
      auVar258._24_4_ = 0x7fffffff;
      auVar258._28_4_ = 0x7fffffff;
      auVar259 = ZEXT3264(auVar258);
      auVar116 = vandps_avx(auVar116,auVar258);
      _local_780 = vmaxps_avx(local_840,auVar148);
      auVar251._8_4_ = 0x3e99999a;
      auVar251._0_8_ = 0x3e99999a3e99999a;
      auVar251._12_4_ = 0x3e99999a;
      auVar251._16_4_ = 0x3e99999a;
      auVar251._20_4_ = 0x3e99999a;
      auVar251._24_4_ = 0x3e99999a;
      auVar251._28_4_ = 0x3e99999a;
      uVar22 = vcmpps_avx512vl(auVar116,auVar251,1);
      uVar24 = vcmpps_avx512vl(local_840,local_520,2);
      bVar87 = (byte)uVar24 & bVar83;
      uVar23 = vcmpps_avx512vl(_local_780,local_6c0,2);
      if ((bVar83 & ((byte)uVar23 | (byte)uVar24)) == 0) {
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar280 = ZEXT3264(auVar116);
        auVar180 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        bVar84 = (byte)uVar22 | ~bVar89;
        auVar116 = vmulps_avx512vl(auVar278,auVar270._0_32_);
        auVar95 = vfmadd213ps_fma(auVar123,local_700,auVar116);
        auVar116 = vfmadd213ps_avx512vl(auVar105,local_860,ZEXT1632(auVar95));
        auVar116 = vandps_avx(auVar116,auVar258);
        uVar22 = vcmpps_avx512vl(auVar116,auVar251,1);
        bVar89 = (byte)uVar22 | ~bVar89;
        auVar175._8_4_ = 2;
        auVar175._0_8_ = 0x200000002;
        auVar175._12_4_ = 2;
        auVar175._16_4_ = 2;
        auVar175._20_4_ = 2;
        auVar175._24_4_ = 2;
        auVar175._28_4_ = 2;
        auVar37._8_4_ = 3;
        auVar37._0_8_ = 0x300000003;
        auVar37._12_4_ = 3;
        auVar37._16_4_ = 3;
        auVar37._20_4_ = 3;
        auVar37._24_4_ = 3;
        auVar37._28_4_ = 3;
        auVar116 = vpblendmd_avx512vl(auVar175,auVar37);
        local_6a0._0_4_ = (uint)(bVar89 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar89 & 1) * 2;
        bVar92 = (bool)(bVar89 >> 1 & 1);
        local_6a0._4_4_ = (uint)bVar92 * auVar116._4_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar89 >> 2 & 1);
        local_6a0._8_4_ = (uint)bVar92 * auVar116._8_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar89 >> 3 & 1);
        local_6a0._12_4_ = (uint)bVar92 * auVar116._12_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar89 >> 4 & 1);
        local_6a0._16_4_ = (uint)bVar92 * auVar116._16_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar89 >> 5 & 1);
        local_6a0._20_4_ = (uint)bVar92 * auVar116._20_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar89 >> 6 & 1);
        local_6a0._24_4_ = (uint)bVar92 * auVar116._24_4_ | (uint)!bVar92 * 2;
        local_6a0._28_4_ = (uint)(bVar89 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar89 >> 7) * 2;
        auVar279._0_32_ = vpbroadcastd_avx512vl();
        auVar279._32_32_ = auVar152._32_32_;
        uVar22 = vpcmpd_avx512vl(auVar279._0_32_,local_6a0,5);
        local_760 = local_840._0_4_ + (float)local_820._0_4_;
        fStack_75c = local_840._4_4_ + (float)local_820._4_4_;
        fStack_758 = local_840._8_4_ + fStack_818;
        fStack_754 = local_840._12_4_ + fStack_814;
        fStack_750 = local_840._16_4_ + fStack_810;
        fStack_74c = local_840._20_4_ + fStack_80c;
        fStack_748 = local_840._24_4_ + fStack_808;
        fStack_744 = local_840._28_4_ + fStack_804;
        local_720 = auVar279._0_32_;
        _local_6e0 = _local_780;
        for (bVar89 = (byte)uVar22 & bVar87; bVar89 != 0;
            bVar89 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar89 & (byte)uVar22) {
          auVar176._8_4_ = 0x7f800000;
          auVar176._0_8_ = 0x7f8000007f800000;
          auVar176._12_4_ = 0x7f800000;
          auVar176._16_4_ = 0x7f800000;
          auVar176._20_4_ = 0x7f800000;
          auVar176._24_4_ = 0x7f800000;
          auVar176._28_4_ = 0x7f800000;
          auVar116 = vblendmps_avx512vl(auVar176,local_840);
          auVar150._0_4_ =
               (uint)(bVar89 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar89 & 1) * 0x7f800000;
          bVar92 = (bool)(bVar89 >> 1 & 1);
          auVar150._4_4_ = (uint)bVar92 * auVar116._4_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar89 >> 2 & 1);
          auVar150._8_4_ = (uint)bVar92 * auVar116._8_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar89 >> 3 & 1);
          auVar150._12_4_ = (uint)bVar92 * auVar116._12_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar89 >> 4 & 1);
          auVar150._16_4_ = (uint)bVar92 * auVar116._16_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar89 >> 5 & 1);
          auVar150._20_4_ = (uint)bVar92 * auVar116._20_4_ | (uint)!bVar92 * 0x7f800000;
          auVar150._24_4_ =
               (uint)(bVar89 >> 6) * auVar116._24_4_ | (uint)!(bool)(bVar89 >> 6) * 0x7f800000;
          auVar150._28_4_ = 0x7f800000;
          auVar279._0_32_ = auVar150;
          auVar116 = vshufps_avx(auVar150,auVar150,0xb1);
          auVar116 = vminps_avx(auVar150,auVar116);
          auVar105 = vshufpd_avx(auVar116,auVar116,5);
          auVar116 = vminps_avx(auVar116,auVar105);
          auVar105 = vpermpd_avx2(auVar116,0x4e);
          auVar116 = vminps_avx(auVar116,auVar105);
          uVar22 = vcmpps_avx512vl(auVar150,auVar116,0);
          bVar85 = (byte)uVar22 & bVar89;
          bVar86 = bVar89;
          if (bVar85 != 0) {
            bVar86 = bVar85;
          }
          iVar25 = 0;
          for (uVar94 = (uint)bVar86; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
            iVar25 = iVar25 + 1;
          }
          uVar94 = *(uint *)(local_4e0 + (uint)(iVar25 << 2));
          uVar156 = *(uint *)(local_540 + (uint)(iVar25 << 2));
          fVar163 = auVar21._0_4_;
          if ((float)local_a00._0_4_ < 0.0) {
            auVar264 = ZEXT1664(auVar264._0_16_);
            auVar270 = ZEXT1664(auVar270._0_16_);
            auVar271 = ZEXT1664(auVar271._0_16_);
            fVar163 = sqrtf((float)local_a00._0_4_);
            auVar279._0_32_ = auVar278;
          }
          auVar259 = ZEXT464(uVar156);
          auVar97 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar95 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar1 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar96 = vminps_avx(auVar97,auVar1);
          auVar97 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar1 = vmaxps_avx(auVar95,auVar97);
          auVar216._8_4_ = 0x7fffffff;
          auVar216._0_8_ = 0x7fffffff7fffffff;
          auVar216._12_4_ = 0x7fffffff;
          auVar95 = vandps_avx(auVar96,auVar216);
          auVar97 = vandps_avx(auVar1,auVar216);
          auVar95 = vmaxps_avx(auVar95,auVar97);
          auVar97 = vmovshdup_avx(auVar95);
          auVar97 = vmaxss_avx(auVar97,auVar95);
          auVar95 = vshufpd_avx(auVar95,auVar95,1);
          auVar95 = vmaxss_avx(auVar95,auVar97);
          fVar215 = auVar95._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar1,auVar1,0xff);
          auVar95 = vinsertps_avx(ZEXT416(uVar156),ZEXT416(uVar94),0x10);
          auVar152 = ZEXT1664(auVar95);
          lVar91 = 5;
          do {
            do {
              bVar92 = lVar91 == 0;
              lVar91 = lVar91 + -1;
              if (bVar92) goto LAB_01a4a0b7;
              uVar181 = auVar152._0_4_;
              auVar164._4_4_ = uVar181;
              auVar164._0_4_ = uVar181;
              auVar164._8_4_ = uVar181;
              auVar164._12_4_ = uVar181;
              auVar95 = vfmadd132ps_fma(auVar164,ZEXT816(0) << 0x40,local_9f0);
              auVar97 = vmovshdup_avx(auVar152._0_16_);
              fVar252 = auVar97._0_4_;
              fVar214 = 1.0 - fVar252;
              fVar233 = fVar252 * fVar252;
              auVar99 = SUB6416(ZEXT464(0x40400000),0);
              auVar98 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar96 = vfmadd213ss_fma(auVar99,auVar97,auVar98);
              auVar1 = vfmadd213ss_fma(auVar96,ZEXT416((uint)fVar233),SUB6416(ZEXT464(0x40000000),0)
                                      );
              auVar165 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar214),auVar98);
              auVar165 = vfmadd213ss_fma(auVar165,ZEXT416((uint)(fVar214 * fVar214)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar234 = fVar214 * fVar214 * -fVar252 * 0.5;
              fVar235 = auVar1._0_4_ * 0.5;
              fVar236 = auVar165._0_4_ * 0.5;
              fVar237 = fVar252 * fVar252 * -fVar214 * 0.5;
              auVar217._0_4_ = fVar237 * (float)local_9e0._0_4_;
              auVar217._4_4_ = fVar237 * (float)local_9e0._4_4_;
              auVar217._8_4_ = fVar237 * fStack_9d8;
              auVar217._12_4_ = fVar237 * fStack_9d4;
              auVar238._4_4_ = fVar236;
              auVar238._0_4_ = fVar236;
              auVar238._8_4_ = fVar236;
              auVar238._12_4_ = fVar236;
              auVar1 = vfmadd132ps_fma(auVar238,auVar217,local_9a0._0_16_);
              auVar199._4_4_ = fVar235;
              auVar199._0_4_ = fVar235;
              auVar199._8_4_ = fVar235;
              auVar199._12_4_ = fVar235;
              auVar1 = vfmadd132ps_fma(auVar199,auVar1,local_9c0._0_16_);
              auVar218._4_4_ = fVar234;
              auVar218._0_4_ = fVar234;
              auVar218._8_4_ = fVar234;
              auVar218._12_4_ = fVar234;
              auVar1 = vfmadd132ps_fma(auVar218,auVar1,local_980._0_16_);
              auVar165 = vfmadd231ss_fma(auVar98,auVar97,ZEXT416(0x41100000));
              local_8a0._0_16_ = auVar165;
              auVar165 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar97,ZEXT416(0x40800000))
              ;
              local_8c0._0_16_ = auVar165;
              auVar165 = vfmadd213ss_fma(auVar99,auVar97,ZEXT416(0xbf800000));
              local_8e0._0_16_ = auVar165;
              local_880._0_16_ = auVar1;
              auVar1 = vsubps_avx(auVar95,auVar1);
              auVar95 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar234 = auVar95._0_4_;
              local_800 = auVar152;
              if (fVar234 < 0.0) {
                local_a80._0_4_ = auVar96._0_4_;
                _local_aa0 = ZEXT416((uint)fVar214);
                local_a20._0_4_ = fVar233;
                local_a40._0_4_ = fVar214 * -2.0;
                auVar271._0_4_ = sqrtf(fVar234);
                auVar271._4_60_ = extraout_var;
                auVar96 = ZEXT416((uint)local_a80._0_4_);
                auVar165 = auVar271._0_16_;
                auVar98 = _local_aa0;
              }
              else {
                auVar165 = vsqrtss_avx(auVar95,auVar95);
                local_a40._0_4_ = fVar214 * -2.0;
                local_a20._0_4_ = fVar233;
                auVar98 = ZEXT416((uint)fVar214);
              }
              fVar233 = auVar98._0_4_;
              auVar100 = vfnmadd231ss_fma(ZEXT416((uint)(fVar252 * (fVar233 + fVar233))),auVar98,
                                          auVar98);
              auVar96 = vfmadd213ss_fma(auVar96,ZEXT416((uint)(fVar252 + fVar252)),
                                        ZEXT416((uint)(fVar252 * fVar252 * 3.0)));
              auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar97,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar233 * fVar233 * -3.0)),
                                        ZEXT416((uint)(fVar233 + fVar233)),auVar98);
              auVar98 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar97,
                                        ZEXT416((uint)local_a20._0_4_));
              fVar233 = auVar100._0_4_ * 0.5;
              fVar235 = auVar96._0_4_ * 0.5;
              fVar236 = auVar99._0_4_ * 0.5;
              fVar237 = auVar98._0_4_ * 0.5;
              auVar219._0_4_ = fVar237 * (float)local_9e0._0_4_;
              auVar219._4_4_ = fVar237 * (float)local_9e0._4_4_;
              auVar219._8_4_ = fVar237 * fStack_9d8;
              auVar219._12_4_ = fVar237 * fStack_9d4;
              auVar200._4_4_ = fVar236;
              auVar200._0_4_ = fVar236;
              auVar200._8_4_ = fVar236;
              auVar200._12_4_ = fVar236;
              auVar96 = vfmadd132ps_fma(auVar200,auVar219,local_9a0._0_16_);
              auVar183._4_4_ = fVar235;
              auVar183._0_4_ = fVar235;
              auVar183._8_4_ = fVar235;
              auVar183._12_4_ = fVar235;
              auVar96 = vfmadd132ps_fma(auVar183,auVar96,local_9c0._0_16_);
              auVar272._4_4_ = fVar233;
              auVar272._0_4_ = fVar233;
              auVar272._8_4_ = fVar233;
              auVar272._12_4_ = fVar233;
              local_a80._0_16_ = vfmadd132ps_fma(auVar272,auVar96,local_980._0_16_);
              local_a20._0_16_ = vdpps_avx(local_a80._0_16_,local_a80._0_16_,0x7f);
              auVar61._12_4_ = 0;
              auVar61._0_12_ = ZEXT812(0);
              fVar233 = local_a20._0_4_;
              auVar96 = vrsqrt14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar233));
              fVar235 = auVar96._0_4_;
              local_a40._0_16_ = vrcp14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar233));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar98 = vxorps_avx512vl(local_a20._0_16_,auVar26);
              auVar96 = vfnmadd213ss_fma(local_a40._0_16_,local_a20._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_900._0_4_ = auVar96._0_4_;
              local_aa0._0_4_ = auVar165._0_4_;
              if (fVar233 < auVar98._0_4_) {
                fVar236 = sqrtf(fVar233);
                auVar165 = ZEXT416((uint)local_aa0._0_4_);
                auVar96 = local_a80._0_16_;
              }
              else {
                auVar96 = vsqrtss_avx(local_a20._0_16_,local_a20._0_16_);
                fVar236 = auVar96._0_4_;
                auVar96 = local_a80._0_16_;
              }
              fVar233 = fVar235 * 1.5 + fVar233 * -0.5 * fVar235 * fVar235 * fVar235;
              auVar239._0_4_ = auVar96._0_4_ * fVar233;
              auVar239._4_4_ = auVar96._4_4_ * fVar233;
              auVar239._8_4_ = auVar96._8_4_ * fVar233;
              auVar239._12_4_ = auVar96._12_4_ * fVar233;
              auVar98 = vdpps_avx(auVar1,auVar239,0x7f);
              fVar214 = auVar165._0_4_;
              fVar235 = auVar98._0_4_;
              auVar166._0_4_ = fVar235 * fVar235;
              auVar166._4_4_ = auVar98._4_4_ * auVar98._4_4_;
              auVar166._8_4_ = auVar98._8_4_ * auVar98._8_4_;
              auVar166._12_4_ = auVar98._12_4_ * auVar98._12_4_;
              auVar99 = vsubps_avx512vl(auVar95,auVar166);
              fVar237 = auVar99._0_4_;
              auVar184._4_12_ = ZEXT812(0) << 0x20;
              auVar184._0_4_ = fVar237;
              auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar184);
              auVar101 = vmulss_avx512f(auVar99,ZEXT416(0xbf000000));
              if (fVar237 < 0.0) {
                local_930 = fVar233;
                fStack_92c = fVar233;
                fStack_928 = fVar233;
                fStack_924 = fVar233;
                local_920 = auVar239;
                local_910 = auVar100;
                fVar237 = sqrtf(fVar237);
                auVar101 = ZEXT416(auVar101._0_4_);
                auVar165 = ZEXT416((uint)local_aa0._0_4_);
                auVar239 = local_920;
                auVar99 = local_910;
                auVar96 = local_a80._0_16_;
                fVar233 = local_930;
                fVar252 = fStack_92c;
                fVar253 = fStack_928;
                fVar254 = fStack_924;
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
                fVar237 = auVar99._0_4_;
                auVar99 = auVar100;
                fVar252 = fVar233;
                fVar253 = fVar233;
                fVar254 = fVar233;
              }
              auVar270 = ZEXT1664(auVar1);
              auVar185._0_4_ = (float)local_8e0._0_4_ * (float)local_9e0._0_4_;
              auVar185._4_4_ = (float)local_8e0._0_4_ * (float)local_9e0._4_4_;
              auVar185._8_4_ = (float)local_8e0._0_4_ * fStack_9d8;
              auVar185._12_4_ = (float)local_8e0._0_4_ * fStack_9d4;
              auVar201._4_4_ = local_8c0._0_4_;
              auVar201._0_4_ = local_8c0._0_4_;
              auVar201._8_4_ = local_8c0._0_4_;
              auVar201._12_4_ = local_8c0._0_4_;
              auVar249 = vfmadd132ps_fma(auVar201,auVar185,local_9a0._0_16_);
              auVar186._4_4_ = local_8a0._0_4_;
              auVar186._0_4_ = local_8a0._0_4_;
              auVar186._8_4_ = local_8a0._0_4_;
              auVar186._12_4_ = local_8a0._0_4_;
              auVar249 = vfmadd132ps_fma(auVar186,auVar249,local_9c0._0_16_);
              auVar97 = vfmadd213ss_fma(auVar97,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar181 = auVar97._0_4_;
              auVar202._4_4_ = uVar181;
              auVar202._0_4_ = uVar181;
              auVar202._8_4_ = uVar181;
              auVar202._12_4_ = uVar181;
              auVar97 = vfmadd132ps_fma(auVar202,auVar249,local_980._0_16_);
              auVar187._0_4_ = auVar97._0_4_ * (float)local_a20._0_4_;
              auVar187._4_4_ = auVar97._4_4_ * (float)local_a20._0_4_;
              auVar187._8_4_ = auVar97._8_4_ * (float)local_a20._0_4_;
              auVar187._12_4_ = auVar97._12_4_ * (float)local_a20._0_4_;
              auVar97 = vdpps_avx(auVar96,auVar97,0x7f);
              fVar198 = auVar97._0_4_;
              auVar203._0_4_ = auVar96._0_4_ * fVar198;
              auVar203._4_4_ = auVar96._4_4_ * fVar198;
              auVar203._8_4_ = auVar96._8_4_ * fVar198;
              auVar203._12_4_ = auVar96._12_4_ * fVar198;
              auVar97 = vsubps_avx(auVar187,auVar203);
              fVar198 = (float)local_900._0_4_ * (float)local_a40._0_4_;
              auVar249 = vmaxss_avx(ZEXT416((uint)fVar215),
                                    ZEXT416((uint)(local_800._0_4_ * fVar163 * 1.9073486e-06)));
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar279._16_48_ = local_800._16_48_;
              auVar102 = vxorps_avx512vl(auVar96,auVar27);
              auVar204._0_4_ = fVar233 * auVar97._0_4_ * fVar198;
              auVar204._4_4_ = fVar252 * auVar97._4_4_ * fVar198;
              auVar204._8_4_ = fVar253 * auVar97._8_4_ * fVar198;
              auVar204._12_4_ = fVar254 * auVar97._12_4_ * fVar198;
              auVar97 = vdpps_avx(auVar102,auVar239,0x7f);
              auVar250 = vfmadd213ss_fma(auVar165,ZEXT416((uint)fVar215),auVar249);
              auVar165 = vdpps_avx(auVar1,auVar204,0x7f);
              auVar250 = vfmadd213ss_fma(ZEXT416((uint)(fVar214 + 1.0)),
                                         ZEXT416((uint)(fVar215 / fVar236)),auVar250);
              fVar233 = auVar97._0_4_ + auVar165._0_4_;
              auVar271 = ZEXT464((uint)fVar233);
              auVar97 = vdpps_avx(local_9f0,auVar239,0x7f);
              auVar165 = vdpps_avx(auVar1,auVar102,0x7f);
              auVar101 = vmulss_avx512f(auVar101,auVar99);
              fVar236 = auVar100._0_4_ * 1.5 + auVar101._0_4_ * auVar99._0_4_ * auVar99._0_4_;
              auVar99 = vdpps_avx(auVar1,local_9f0,0x7f);
              auVar101 = vfnmadd231ss_fma(auVar165,auVar98,ZEXT416((uint)fVar233));
              auVar99 = vfnmadd231ss_fma(auVar99,auVar98,auVar97);
              auVar165 = vpermilps_avx(local_880._0_16_,0xff);
              fVar237 = fVar237 - auVar165._0_4_;
              auVar100 = vshufps_avx(auVar96,auVar96,0xff);
              auVar165 = vfmsub213ss_fma(auVar101,ZEXT416((uint)fVar236),auVar100);
              auVar261._8_4_ = 0x80000000;
              auVar261._0_8_ = 0x8000000080000000;
              auVar261._12_4_ = 0x80000000;
              auVar264 = ZEXT1664(auVar261);
              auVar256._0_8_ = auVar165._0_8_ ^ 0x8000000080000000;
              auVar256._8_4_ = auVar165._8_4_ ^ 0x80000000;
              auVar256._12_4_ = auVar165._12_4_ ^ 0x80000000;
              auVar259 = ZEXT1664(auVar256);
              auVar99 = ZEXT416((uint)(auVar99._0_4_ * fVar236));
              auVar101 = vfmsub231ss_fma(ZEXT416((uint)(auVar97._0_4_ * auVar165._0_4_)),
                                         ZEXT416((uint)fVar233),auVar99);
              auVar165 = vinsertps_avx(auVar256,auVar99,0x1c);
              auVar245._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
              auVar245._8_4_ = auVar97._8_4_ ^ 0x80000000;
              auVar245._12_4_ = auVar97._12_4_ ^ 0x80000000;
              auVar99 = vinsertps_avx(ZEXT416((uint)fVar233),auVar245,0x10);
              auVar220._0_4_ = auVar101._0_4_;
              auVar220._4_4_ = auVar220._0_4_;
              auVar220._8_4_ = auVar220._0_4_;
              auVar220._12_4_ = auVar220._0_4_;
              auVar97 = vdivps_avx(auVar165,auVar220);
              auVar165 = vdivps_avx(auVar99,auVar220);
              auVar221._0_4_ = fVar235 * auVar97._0_4_ + fVar237 * auVar165._0_4_;
              auVar221._4_4_ = fVar235 * auVar97._4_4_ + fVar237 * auVar165._4_4_;
              auVar221._8_4_ = fVar235 * auVar97._8_4_ + fVar237 * auVar165._8_4_;
              auVar221._12_4_ = fVar235 * auVar97._12_4_ + fVar237 * auVar165._12_4_;
              auVar97 = vsubps_avx(local_800._0_16_,auVar221);
              auVar152 = ZEXT1664(auVar97);
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar279._0_16_ = vandps_avx512vl(auVar98,auVar28);
            } while (auVar250._0_4_ <= auVar279._0_4_);
            auVar165 = vfmadd231ss_fma(ZEXT416((uint)(auVar250._0_4_ + auVar249._0_4_)),local_940,
                                       ZEXT416(0x36000000));
            auVar29._8_4_ = 0x7fffffff;
            auVar29._0_8_ = 0x7fffffff7fffffff;
            auVar29._12_4_ = 0x7fffffff;
            auVar279._0_16_ = vandps_avx512vl(ZEXT416((uint)fVar237),auVar29);
          } while (auVar165._0_4_ <= auVar279._0_4_);
          fVar163 = auVar97._0_4_ + (float)local_950._0_4_;
          if ((fVar277 <= fVar163) &&
             (fVar215 = *(float *)(ray + k * 4 + 0x200), fVar163 <= fVar215)) {
            auVar97 = vmovshdup_avx(auVar97);
            fVar235 = auVar97._0_4_;
            if ((0.0 <= fVar235) && (fVar235 <= 1.0)) {
              auVar62._12_4_ = 0;
              auVar62._0_12_ = ZEXT412(0);
              auVar153._16_48_ = auVar279._16_48_;
              auVar153._4_12_ = ZEXT412(0);
              auVar153._0_4_ = fVar234;
              auVar97 = vrsqrt14ss_avx512f(auVar62 << 0x20,auVar153._0_16_);
              fVar234 = auVar97._0_4_;
              auVar279._0_16_ = vmulss_avx512f(auVar95,ZEXT416(0xbf000000));
              pGVar4 = (context->scene->geometries).items[uVar2].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar234 = fVar234 * 1.5 + auVar279._0_4_ * fVar234 * fVar234 * fVar234;
                auVar222._0_4_ = auVar1._0_4_ * fVar234;
                auVar222._4_4_ = auVar1._4_4_ * fVar234;
                auVar222._8_4_ = auVar1._8_4_ * fVar234;
                auVar222._12_4_ = auVar1._12_4_ * fVar234;
                auVar165 = vfmadd213ps_fma(auVar100,auVar222,auVar96);
                auVar95 = vshufps_avx(auVar222,auVar222,0xc9);
                auVar97 = vshufps_avx(auVar96,auVar96,0xc9);
                auVar223._0_4_ = auVar222._0_4_ * auVar97._0_4_;
                auVar223._4_4_ = auVar222._4_4_ * auVar97._4_4_;
                auVar223._8_4_ = auVar222._8_4_ * auVar97._8_4_;
                auVar223._12_4_ = auVar222._12_4_ * auVar97._12_4_;
                auVar96 = vfmsub231ps_fma(auVar223,auVar96,auVar95);
                auVar95 = vshufps_avx(auVar96,auVar96,0xc9);
                auVar97 = vshufps_avx(auVar165,auVar165,0xc9);
                auVar96 = vshufps_avx(auVar96,auVar96,0xd2);
                auVar167._0_4_ = auVar165._0_4_ * auVar96._0_4_;
                auVar167._4_4_ = auVar165._4_4_ * auVar96._4_4_;
                auVar167._8_4_ = auVar165._8_4_ * auVar96._8_4_;
                auVar167._12_4_ = auVar165._12_4_ * auVar96._12_4_;
                auVar95 = vfmsub231ps_fma(auVar167,auVar95,auVar97);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x200) = fVar163;
                  uVar181 = vextractps_avx(auVar95,1);
                  *(undefined4 *)(ray + k * 4 + 0x300) = uVar181;
                  uVar181 = vextractps_avx(auVar95,2);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar181;
                  *(int *)(ray + k * 4 + 0x380) = auVar95._0_4_;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar235;
                  *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                  *(uint *)(ray + k * 4 + 0x440) = uVar3;
                  *(uint *)(ray + k * 4 + 0x480) = uVar2;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
                else {
                  pRVar6 = context->user;
                  auVar180 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar180,auVar152);
                  auVar152 = vpermps_avx512f(auVar180,ZEXT1664(auVar95));
                  auVar180 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar180,ZEXT1664(auVar95));
                  local_380 = vbroadcastss_avx512f(auVar95);
                  local_400[0] = (RTCHitN)auVar152[0];
                  local_400[1] = (RTCHitN)auVar152[1];
                  local_400[2] = (RTCHitN)auVar152[2];
                  local_400[3] = (RTCHitN)auVar152[3];
                  local_400[4] = (RTCHitN)auVar152[4];
                  local_400[5] = (RTCHitN)auVar152[5];
                  local_400[6] = (RTCHitN)auVar152[6];
                  local_400[7] = (RTCHitN)auVar152[7];
                  local_400[8] = (RTCHitN)auVar152[8];
                  local_400[9] = (RTCHitN)auVar152[9];
                  local_400[10] = (RTCHitN)auVar152[10];
                  local_400[0xb] = (RTCHitN)auVar152[0xb];
                  local_400[0xc] = (RTCHitN)auVar152[0xc];
                  local_400[0xd] = (RTCHitN)auVar152[0xd];
                  local_400[0xe] = (RTCHitN)auVar152[0xe];
                  local_400[0xf] = (RTCHitN)auVar152[0xf];
                  local_400[0x10] = (RTCHitN)auVar152[0x10];
                  local_400[0x11] = (RTCHitN)auVar152[0x11];
                  local_400[0x12] = (RTCHitN)auVar152[0x12];
                  local_400[0x13] = (RTCHitN)auVar152[0x13];
                  local_400[0x14] = (RTCHitN)auVar152[0x14];
                  local_400[0x15] = (RTCHitN)auVar152[0x15];
                  local_400[0x16] = (RTCHitN)auVar152[0x16];
                  local_400[0x17] = (RTCHitN)auVar152[0x17];
                  local_400[0x18] = (RTCHitN)auVar152[0x18];
                  local_400[0x19] = (RTCHitN)auVar152[0x19];
                  local_400[0x1a] = (RTCHitN)auVar152[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar152[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar152[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar152[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar152[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar152[0x1f];
                  local_400[0x20] = (RTCHitN)auVar152[0x20];
                  local_400[0x21] = (RTCHitN)auVar152[0x21];
                  local_400[0x22] = (RTCHitN)auVar152[0x22];
                  local_400[0x23] = (RTCHitN)auVar152[0x23];
                  local_400[0x24] = (RTCHitN)auVar152[0x24];
                  local_400[0x25] = (RTCHitN)auVar152[0x25];
                  local_400[0x26] = (RTCHitN)auVar152[0x26];
                  local_400[0x27] = (RTCHitN)auVar152[0x27];
                  local_400[0x28] = (RTCHitN)auVar152[0x28];
                  local_400[0x29] = (RTCHitN)auVar152[0x29];
                  local_400[0x2a] = (RTCHitN)auVar152[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar152[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar152[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar152[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar152[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar152[0x2f];
                  local_400[0x30] = (RTCHitN)auVar152[0x30];
                  local_400[0x31] = (RTCHitN)auVar152[0x31];
                  local_400[0x32] = (RTCHitN)auVar152[0x32];
                  local_400[0x33] = (RTCHitN)auVar152[0x33];
                  local_400[0x34] = (RTCHitN)auVar152[0x34];
                  local_400[0x35] = (RTCHitN)auVar152[0x35];
                  local_400[0x36] = (RTCHitN)auVar152[0x36];
                  local_400[0x37] = (RTCHitN)auVar152[0x37];
                  local_400[0x38] = (RTCHitN)auVar152[0x38];
                  local_400[0x39] = (RTCHitN)auVar152[0x39];
                  local_400[0x3a] = (RTCHitN)auVar152[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar152[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar152[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar152[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar152[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar152[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar152 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar152);
                  auVar116 = vpcmpeqd_avx2(auVar152._0_32_,auVar152._0_32_);
                  local_a58[3] = auVar116;
                  local_a58[2] = auVar116;
                  local_a58[1] = auVar116;
                  *local_a58 = auVar116;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar6->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar6->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar163;
                  auVar279 = vmovdqa64_avx512f(local_4c0);
                  local_7c0 = vmovdqa64_avx512f(auVar279);
                  local_ad0.valid = (int *)local_7c0;
                  local_ad0.geometryUserPtr = pGVar4->userPtr;
                  local_ad0.context = context->user;
                  local_ad0.hit = local_400;
                  local_ad0.N = 0x10;
                  local_ad0.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar259 = ZEXT1664(auVar256);
                    auVar264 = ZEXT1664(auVar261);
                    auVar270 = ZEXT1664(auVar1);
                    auVar271 = ZEXT1664(ZEXT416((uint)fVar233));
                    (*pGVar4->intersectionFilterN)(&local_ad0);
                    auVar279 = vmovdqa64_avx512f(local_7c0);
                  }
                  uVar22 = vptestmd_avx512f(auVar279,auVar279);
                  if ((short)uVar22 != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar259 = ZEXT1664(auVar259._0_16_);
                      auVar264 = ZEXT1664(auVar264._0_16_);
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      auVar271 = ZEXT1664(auVar271._0_16_);
                      (*p_Var5)(&local_ad0);
                      auVar279 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar93 = vptestmd_avx512f(auVar279,auVar279);
                    if ((short)uVar93 != 0) {
                      iVar65 = *(int *)(local_ad0.hit + 4);
                      iVar66 = *(int *)(local_ad0.hit + 8);
                      iVar67 = *(int *)(local_ad0.hit + 0xc);
                      iVar68 = *(int *)(local_ad0.hit + 0x10);
                      iVar69 = *(int *)(local_ad0.hit + 0x14);
                      iVar70 = *(int *)(local_ad0.hit + 0x18);
                      iVar71 = *(int *)(local_ad0.hit + 0x1c);
                      iVar72 = *(int *)(local_ad0.hit + 0x20);
                      iVar73 = *(int *)(local_ad0.hit + 0x24);
                      iVar74 = *(int *)(local_ad0.hit + 0x28);
                      iVar75 = *(int *)(local_ad0.hit + 0x2c);
                      iVar76 = *(int *)(local_ad0.hit + 0x30);
                      iVar77 = *(int *)(local_ad0.hit + 0x34);
                      iVar78 = *(int *)(local_ad0.hit + 0x38);
                      iVar79 = *(int *)(local_ad0.hit + 0x3c);
                      bVar86 = (byte)uVar93;
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar93 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar93 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar93 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar93 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar93 >> 7) & 1);
                      bVar85 = (byte)(uVar93 >> 8);
                      bVar13 = (bool)((byte)(uVar93 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar93 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      bVar19 = SUB81(uVar93 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x300) =
                           (uint)(bVar86 & 1) * *(int *)local_ad0.hit |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_ad0.ray + 0x300);
                      *(uint *)(local_ad0.ray + 0x304) =
                           (uint)bVar92 * iVar65 | (uint)!bVar92 * *(int *)(local_ad0.ray + 0x304);
                      *(uint *)(local_ad0.ray + 0x308) =
                           (uint)bVar7 * iVar66 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x308);
                      *(uint *)(local_ad0.ray + 0x30c) =
                           (uint)bVar8 * iVar67 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x30c);
                      *(uint *)(local_ad0.ray + 0x310) =
                           (uint)bVar9 * iVar68 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x310);
                      *(uint *)(local_ad0.ray + 0x314) =
                           (uint)bVar10 * iVar69 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x314);
                      *(uint *)(local_ad0.ray + 0x318) =
                           (uint)bVar11 * iVar70 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x318);
                      *(uint *)(local_ad0.ray + 0x31c) =
                           (uint)bVar12 * iVar71 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x31c);
                      *(uint *)(local_ad0.ray + 800) =
                           (uint)(bVar85 & 1) * iVar72 |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_ad0.ray + 800);
                      *(uint *)(local_ad0.ray + 0x324) =
                           (uint)bVar13 * iVar73 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x324);
                      *(uint *)(local_ad0.ray + 0x328) =
                           (uint)bVar14 * iVar74 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x328);
                      *(uint *)(local_ad0.ray + 0x32c) =
                           (uint)bVar15 * iVar75 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x32c);
                      *(uint *)(local_ad0.ray + 0x330) =
                           (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x330);
                      *(uint *)(local_ad0.ray + 0x334) =
                           (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x334);
                      *(uint *)(local_ad0.ray + 0x338) =
                           (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x338);
                      *(uint *)(local_ad0.ray + 0x33c) =
                           (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x33c);
                      iVar65 = *(int *)(local_ad0.hit + 0x44);
                      iVar66 = *(int *)(local_ad0.hit + 0x48);
                      iVar67 = *(int *)(local_ad0.hit + 0x4c);
                      iVar68 = *(int *)(local_ad0.hit + 0x50);
                      iVar69 = *(int *)(local_ad0.hit + 0x54);
                      iVar70 = *(int *)(local_ad0.hit + 0x58);
                      iVar71 = *(int *)(local_ad0.hit + 0x5c);
                      iVar72 = *(int *)(local_ad0.hit + 0x60);
                      iVar73 = *(int *)(local_ad0.hit + 100);
                      iVar74 = *(int *)(local_ad0.hit + 0x68);
                      iVar75 = *(int *)(local_ad0.hit + 0x6c);
                      iVar76 = *(int *)(local_ad0.hit + 0x70);
                      iVar77 = *(int *)(local_ad0.hit + 0x74);
                      iVar78 = *(int *)(local_ad0.hit + 0x78);
                      iVar79 = *(int *)(local_ad0.hit + 0x7c);
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar93 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar93 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar93 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar93 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar93 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar93 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar93 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      bVar19 = SUB81(uVar93 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x340) =
                           (uint)(bVar86 & 1) * *(int *)(local_ad0.hit + 0x40) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_ad0.ray + 0x340);
                      *(uint *)(local_ad0.ray + 0x344) =
                           (uint)bVar92 * iVar65 | (uint)!bVar92 * *(int *)(local_ad0.ray + 0x344);
                      *(uint *)(local_ad0.ray + 0x348) =
                           (uint)bVar7 * iVar66 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x348);
                      *(uint *)(local_ad0.ray + 0x34c) =
                           (uint)bVar8 * iVar67 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x34c);
                      *(uint *)(local_ad0.ray + 0x350) =
                           (uint)bVar9 * iVar68 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x350);
                      *(uint *)(local_ad0.ray + 0x354) =
                           (uint)bVar10 * iVar69 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x354);
                      *(uint *)(local_ad0.ray + 0x358) =
                           (uint)bVar11 * iVar70 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x358);
                      *(uint *)(local_ad0.ray + 0x35c) =
                           (uint)bVar12 * iVar71 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x35c);
                      *(uint *)(local_ad0.ray + 0x360) =
                           (uint)(bVar85 & 1) * iVar72 |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_ad0.ray + 0x360);
                      *(uint *)(local_ad0.ray + 0x364) =
                           (uint)bVar13 * iVar73 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x364);
                      *(uint *)(local_ad0.ray + 0x368) =
                           (uint)bVar14 * iVar74 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x368);
                      *(uint *)(local_ad0.ray + 0x36c) =
                           (uint)bVar15 * iVar75 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x36c);
                      *(uint *)(local_ad0.ray + 0x370) =
                           (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x370);
                      *(uint *)(local_ad0.ray + 0x374) =
                           (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x374);
                      *(uint *)(local_ad0.ray + 0x378) =
                           (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x378);
                      *(uint *)(local_ad0.ray + 0x37c) =
                           (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x37c);
                      iVar65 = *(int *)(local_ad0.hit + 0x84);
                      iVar66 = *(int *)(local_ad0.hit + 0x88);
                      iVar67 = *(int *)(local_ad0.hit + 0x8c);
                      iVar68 = *(int *)(local_ad0.hit + 0x90);
                      iVar69 = *(int *)(local_ad0.hit + 0x94);
                      iVar70 = *(int *)(local_ad0.hit + 0x98);
                      iVar71 = *(int *)(local_ad0.hit + 0x9c);
                      iVar72 = *(int *)(local_ad0.hit + 0xa0);
                      iVar73 = *(int *)(local_ad0.hit + 0xa4);
                      iVar74 = *(int *)(local_ad0.hit + 0xa8);
                      iVar75 = *(int *)(local_ad0.hit + 0xac);
                      iVar76 = *(int *)(local_ad0.hit + 0xb0);
                      iVar77 = *(int *)(local_ad0.hit + 0xb4);
                      iVar78 = *(int *)(local_ad0.hit + 0xb8);
                      iVar79 = *(int *)(local_ad0.hit + 0xbc);
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar93 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar93 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar93 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar93 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar93 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar93 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar93 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      bVar19 = SUB81(uVar93 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x380) =
                           (uint)(bVar86 & 1) * *(int *)(local_ad0.hit + 0x80) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_ad0.ray + 0x380);
                      *(uint *)(local_ad0.ray + 900) =
                           (uint)bVar92 * iVar65 | (uint)!bVar92 * *(int *)(local_ad0.ray + 900);
                      *(uint *)(local_ad0.ray + 0x388) =
                           (uint)bVar7 * iVar66 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x388);
                      *(uint *)(local_ad0.ray + 0x38c) =
                           (uint)bVar8 * iVar67 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x38c);
                      *(uint *)(local_ad0.ray + 0x390) =
                           (uint)bVar9 * iVar68 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x390);
                      *(uint *)(local_ad0.ray + 0x394) =
                           (uint)bVar10 * iVar69 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x394);
                      *(uint *)(local_ad0.ray + 0x398) =
                           (uint)bVar11 * iVar70 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x398);
                      *(uint *)(local_ad0.ray + 0x39c) =
                           (uint)bVar12 * iVar71 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x39c);
                      *(uint *)(local_ad0.ray + 0x3a0) =
                           (uint)(bVar85 & 1) * iVar72 |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_ad0.ray + 0x3a0);
                      *(uint *)(local_ad0.ray + 0x3a4) =
                           (uint)bVar13 * iVar73 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x3a4);
                      *(uint *)(local_ad0.ray + 0x3a8) =
                           (uint)bVar14 * iVar74 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3a8);
                      *(uint *)(local_ad0.ray + 0x3ac) =
                           (uint)bVar15 * iVar75 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3ac);
                      *(uint *)(local_ad0.ray + 0x3b0) =
                           (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3b0);
                      *(uint *)(local_ad0.ray + 0x3b4) =
                           (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3b4);
                      *(uint *)(local_ad0.ray + 0x3b8) =
                           (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3b8);
                      *(uint *)(local_ad0.ray + 0x3bc) =
                           (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x3bc);
                      iVar65 = *(int *)(local_ad0.hit + 0xc4);
                      iVar66 = *(int *)(local_ad0.hit + 200);
                      iVar67 = *(int *)(local_ad0.hit + 0xcc);
                      iVar68 = *(int *)(local_ad0.hit + 0xd0);
                      iVar69 = *(int *)(local_ad0.hit + 0xd4);
                      iVar70 = *(int *)(local_ad0.hit + 0xd8);
                      iVar71 = *(int *)(local_ad0.hit + 0xdc);
                      iVar72 = *(int *)(local_ad0.hit + 0xe0);
                      iVar73 = *(int *)(local_ad0.hit + 0xe4);
                      iVar74 = *(int *)(local_ad0.hit + 0xe8);
                      iVar75 = *(int *)(local_ad0.hit + 0xec);
                      iVar76 = *(int *)(local_ad0.hit + 0xf0);
                      iVar77 = *(int *)(local_ad0.hit + 0xf4);
                      iVar78 = *(int *)(local_ad0.hit + 0xf8);
                      iVar79 = *(int *)(local_ad0.hit + 0xfc);
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar93 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar93 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar93 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar93 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar93 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar93 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar93 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      bVar19 = SUB81(uVar93 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x3c0) =
                           (uint)(bVar86 & 1) * *(int *)(local_ad0.hit + 0xc0) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_ad0.ray + 0x3c0);
                      *(uint *)(local_ad0.ray + 0x3c4) =
                           (uint)bVar92 * iVar65 | (uint)!bVar92 * *(int *)(local_ad0.ray + 0x3c4);
                      *(uint *)(local_ad0.ray + 0x3c8) =
                           (uint)bVar7 * iVar66 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x3c8);
                      *(uint *)(local_ad0.ray + 0x3cc) =
                           (uint)bVar8 * iVar67 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x3cc);
                      *(uint *)(local_ad0.ray + 0x3d0) =
                           (uint)bVar9 * iVar68 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x3d0);
                      *(uint *)(local_ad0.ray + 0x3d4) =
                           (uint)bVar10 * iVar69 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x3d4);
                      *(uint *)(local_ad0.ray + 0x3d8) =
                           (uint)bVar11 * iVar70 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x3d8);
                      *(uint *)(local_ad0.ray + 0x3dc) =
                           (uint)bVar12 * iVar71 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3dc);
                      *(uint *)(local_ad0.ray + 0x3e0) =
                           (uint)(bVar85 & 1) * iVar72 |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_ad0.ray + 0x3e0);
                      *(uint *)(local_ad0.ray + 0x3e4) =
                           (uint)bVar13 * iVar73 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x3e4);
                      *(uint *)(local_ad0.ray + 1000) =
                           (uint)bVar14 * iVar74 | (uint)!bVar14 * *(int *)(local_ad0.ray + 1000);
                      *(uint *)(local_ad0.ray + 0x3ec) =
                           (uint)bVar15 * iVar75 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3ec);
                      *(uint *)(local_ad0.ray + 0x3f0) =
                           (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3f0);
                      *(uint *)(local_ad0.ray + 0x3f4) =
                           (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3f4);
                      *(uint *)(local_ad0.ray + 0x3f8) =
                           (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3f8);
                      *(uint *)(local_ad0.ray + 0x3fc) =
                           (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x3fc);
                      iVar65 = *(int *)(local_ad0.hit + 0x104);
                      iVar66 = *(int *)(local_ad0.hit + 0x108);
                      iVar67 = *(int *)(local_ad0.hit + 0x10c);
                      iVar68 = *(int *)(local_ad0.hit + 0x110);
                      iVar69 = *(int *)(local_ad0.hit + 0x114);
                      iVar70 = *(int *)(local_ad0.hit + 0x118);
                      iVar71 = *(int *)(local_ad0.hit + 0x11c);
                      iVar72 = *(int *)(local_ad0.hit + 0x120);
                      iVar73 = *(int *)(local_ad0.hit + 0x124);
                      iVar74 = *(int *)(local_ad0.hit + 0x128);
                      iVar75 = *(int *)(local_ad0.hit + 300);
                      iVar76 = *(int *)(local_ad0.hit + 0x130);
                      iVar77 = *(int *)(local_ad0.hit + 0x134);
                      iVar78 = *(int *)(local_ad0.hit + 0x138);
                      iVar79 = *(int *)(local_ad0.hit + 0x13c);
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar93 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar93 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar93 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar93 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar93 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar93 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar93 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      bVar19 = SUB81(uVar93 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x400) =
                           (uint)(bVar86 & 1) * *(int *)(local_ad0.hit + 0x100) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_ad0.ray + 0x400);
                      *(uint *)(local_ad0.ray + 0x404) =
                           (uint)bVar92 * iVar65 | (uint)!bVar92 * *(int *)(local_ad0.ray + 0x404);
                      *(uint *)(local_ad0.ray + 0x408) =
                           (uint)bVar7 * iVar66 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x408);
                      *(uint *)(local_ad0.ray + 0x40c) =
                           (uint)bVar8 * iVar67 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x40c);
                      *(uint *)(local_ad0.ray + 0x410) =
                           (uint)bVar9 * iVar68 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x410);
                      *(uint *)(local_ad0.ray + 0x414) =
                           (uint)bVar10 * iVar69 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x414);
                      *(uint *)(local_ad0.ray + 0x418) =
                           (uint)bVar11 * iVar70 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x418);
                      *(uint *)(local_ad0.ray + 0x41c) =
                           (uint)bVar12 * iVar71 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x41c);
                      *(uint *)(local_ad0.ray + 0x420) =
                           (uint)(bVar85 & 1) * iVar72 |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_ad0.ray + 0x420);
                      *(uint *)(local_ad0.ray + 0x424) =
                           (uint)bVar13 * iVar73 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x424);
                      *(uint *)(local_ad0.ray + 0x428) =
                           (uint)bVar14 * iVar74 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x428);
                      *(uint *)(local_ad0.ray + 0x42c) =
                           (uint)bVar15 * iVar75 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x42c);
                      *(uint *)(local_ad0.ray + 0x430) =
                           (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x430);
                      *(uint *)(local_ad0.ray + 0x434) =
                           (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x434);
                      *(uint *)(local_ad0.ray + 0x438) =
                           (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x438);
                      *(uint *)(local_ad0.ray + 0x43c) =
                           (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x43c);
                      auVar152 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x140));
                      auVar152 = vmovdqu32_avx512f(auVar152);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x440) = auVar152;
                      auVar152 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x180));
                      auVar152 = vmovdqu32_avx512f(auVar152);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x480) = auVar152;
                      auVar180 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x1c0));
                      auVar152 = vmovdqa32_avx512f(auVar180);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x4c0) = auVar152;
                      auVar152 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x200));
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      auVar59._4_56_ = auVar152._8_56_;
                      auVar59._0_4_ = (uint)bVar92 * auVar152._4_4_ | (uint)!bVar92 * auVar180._4_4_
                      ;
                      auVar279._0_8_ = auVar59._0_8_ << 0x20;
                      bVar92 = (bool)((byte)(uVar93 >> 2) & 1);
                      auVar279._8_4_ =
                           (uint)bVar92 * auVar152._8_4_ | (uint)!bVar92 * auVar180._8_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 3) & 1);
                      auVar279._12_4_ =
                           (uint)bVar92 * auVar152._12_4_ | (uint)!bVar92 * auVar180._12_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 4) & 1);
                      auVar279._16_4_ =
                           (uint)bVar92 * auVar152._16_4_ | (uint)!bVar92 * auVar180._16_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 5) & 1);
                      auVar279._20_4_ =
                           (uint)bVar92 * auVar152._20_4_ | (uint)!bVar92 * auVar180._20_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 6) & 1);
                      auVar279._24_4_ =
                           (uint)bVar92 * auVar152._24_4_ | (uint)!bVar92 * auVar180._24_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 7) & 1);
                      auVar279._28_4_ =
                           (uint)bVar92 * auVar152._28_4_ | (uint)!bVar92 * auVar180._28_4_;
                      auVar279._32_4_ =
                           (uint)(bVar85 & 1) * auVar152._32_4_ |
                           (uint)!(bool)(bVar85 & 1) * auVar180._32_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 9) & 1);
                      auVar279._36_4_ =
                           (uint)bVar92 * auVar152._36_4_ | (uint)!bVar92 * auVar180._36_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 10) & 1);
                      auVar279._40_4_ =
                           (uint)bVar92 * auVar152._40_4_ | (uint)!bVar92 * auVar180._40_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      auVar279._44_4_ =
                           (uint)bVar92 * auVar152._44_4_ | (uint)!bVar92 * auVar180._44_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      auVar279._48_4_ =
                           (uint)bVar92 * auVar152._48_4_ | (uint)!bVar92 * auVar180._48_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      auVar279._52_4_ =
                           (uint)bVar92 * auVar152._52_4_ | (uint)!bVar92 * auVar180._52_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      auVar279._56_4_ =
                           (uint)bVar92 * auVar152._56_4_ | (uint)!bVar92 * auVar180._56_4_;
                      bVar92 = SUB81(uVar93 >> 0xf,0);
                      auVar279._60_4_ =
                           (uint)bVar92 * auVar152._60_4_ | (uint)!bVar92 * auVar180._60_4_;
                      auVar152 = vmovdqa32_avx512f(auVar152);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x500) = auVar152;
                      goto LAB_01a4a0b7;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar215;
                }
              }
            }
          }
LAB_01a4a0b7:
          uVar181 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar247._4_4_ = uVar181;
          auVar247._0_4_ = uVar181;
          auVar247._8_4_ = uVar181;
          auVar247._12_4_ = uVar181;
          auVar247._16_4_ = uVar181;
          auVar247._20_4_ = uVar181;
          auVar247._24_4_ = uVar181;
          auVar247._28_4_ = uVar181;
          auVar180 = ZEXT3264(auVar247);
          auVar80._4_4_ = fStack_75c;
          auVar80._0_4_ = local_760;
          auVar80._8_4_ = fStack_758;
          auVar80._12_4_ = fStack_754;
          auVar80._16_4_ = fStack_750;
          auVar80._20_4_ = fStack_74c;
          auVar80._24_4_ = fStack_748;
          auVar80._28_4_ = fStack_744;
          uVar22 = vcmpps_avx512vl(auVar247,auVar80,0xd);
        }
        auVar177._0_4_ = (float)local_820._0_4_ + (float)local_780._0_4_;
        auVar177._4_4_ = (float)local_820._4_4_ + (float)local_780._4_4_;
        auVar177._8_4_ = fStack_818 + fStack_778;
        auVar177._12_4_ = fStack_814 + fStack_774;
        auVar177._16_4_ = fStack_810 + fStack_770;
        auVar177._20_4_ = fStack_80c + fStack_76c;
        auVar177._24_4_ = fStack_808 + fStack_768;
        auVar177._28_4_ = fStack_804 + fStack_764;
        uVar181 = auVar180._0_4_;
        auVar196._4_4_ = uVar181;
        auVar196._0_4_ = uVar181;
        auVar196._8_4_ = uVar181;
        auVar196._12_4_ = uVar181;
        auVar196._16_4_ = uVar181;
        auVar196._20_4_ = uVar181;
        auVar196._24_4_ = uVar181;
        auVar196._28_4_ = uVar181;
        uVar22 = vcmpps_avx512vl(auVar177,auVar196,2);
        auVar178._8_4_ = 2;
        auVar178._0_8_ = 0x200000002;
        auVar178._12_4_ = 2;
        auVar178._16_4_ = 2;
        auVar178._20_4_ = 2;
        auVar178._24_4_ = 2;
        auVar178._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar116 = vpblendmd_avx512vl(auVar178,auVar38);
        local_780._0_4_ = (uint)(bVar84 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar84 & 1) * 2;
        bVar92 = (bool)(bVar84 >> 1 & 1);
        local_780._4_4_ = (uint)bVar92 * auVar116._4_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar84 >> 2 & 1);
        fStack_778 = (float)((uint)bVar92 * auVar116._8_4_ | (uint)!bVar92 * 2);
        bVar92 = (bool)(bVar84 >> 3 & 1);
        fStack_774 = (float)((uint)bVar92 * auVar116._12_4_ | (uint)!bVar92 * 2);
        bVar92 = (bool)(bVar84 >> 4 & 1);
        fStack_770 = (float)((uint)bVar92 * auVar116._16_4_ | (uint)!bVar92 * 2);
        bVar92 = (bool)(bVar84 >> 5 & 1);
        fStack_76c = (float)((uint)bVar92 * auVar116._20_4_ | (uint)!bVar92 * 2);
        bVar92 = (bool)(bVar84 >> 6 & 1);
        fStack_768 = (float)((uint)bVar92 * auVar116._24_4_ | (uint)!bVar92 * 2);
        fStack_764 = (float)((uint)(bVar84 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar84 >> 7) * 2)
        ;
        auVar152._32_32_ = auVar279._32_32_;
        auVar152._0_32_ = _local_780;
        bVar83 = (byte)uVar23 & bVar83 & (byte)uVar22;
        uVar22 = vpcmpd_avx512vl(_local_780,local_720,2);
        bVar89 = (byte)uVar22 & bVar83;
        local_840 = _local_6e0;
        local_760 = (float)local_820._0_4_ + (float)local_6e0._0_4_;
        fStack_75c = (float)local_820._4_4_ + (float)local_6e0._4_4_;
        fStack_758 = fStack_818 + fStack_6d8;
        fStack_754 = fStack_814 + fStack_6d4;
        fStack_750 = fStack_810 + fStack_6d0;
        fStack_74c = fStack_80c + fStack_6cc;
        fStack_748 = fStack_808 + fStack_6c8;
        fStack_744 = fStack_804 + fStack_6c4;
        while( true ) {
          auVar279 = ZEXT3264(auVar278);
          if (bVar89 == 0) break;
          auVar179._8_4_ = 0x7f800000;
          auVar179._0_8_ = 0x7f8000007f800000;
          auVar179._12_4_ = 0x7f800000;
          auVar179._16_4_ = 0x7f800000;
          auVar179._20_4_ = 0x7f800000;
          auVar179._24_4_ = 0x7f800000;
          auVar179._28_4_ = 0x7f800000;
          auVar116 = vblendmps_avx512vl(auVar179,local_840);
          auVar151._0_4_ =
               (uint)(bVar89 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar89 & 1) * 0x7f800000;
          bVar92 = (bool)(bVar89 >> 1 & 1);
          auVar151._4_4_ = (uint)bVar92 * auVar116._4_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar89 >> 2 & 1);
          auVar151._8_4_ = (uint)bVar92 * auVar116._8_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar89 >> 3 & 1);
          auVar151._12_4_ = (uint)bVar92 * auVar116._12_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar89 >> 4 & 1);
          auVar151._16_4_ = (uint)bVar92 * auVar116._16_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar89 >> 5 & 1);
          auVar151._20_4_ = (uint)bVar92 * auVar116._20_4_ | (uint)!bVar92 * 0x7f800000;
          auVar151._24_4_ =
               (uint)(bVar89 >> 6) * auVar116._24_4_ | (uint)!(bool)(bVar89 >> 6) * 0x7f800000;
          auVar151._28_4_ = 0x7f800000;
          auVar152._0_32_ = auVar151;
          auVar116 = vshufps_avx(auVar151,auVar151,0xb1);
          auVar116 = vminps_avx(auVar151,auVar116);
          auVar105 = vshufpd_avx(auVar116,auVar116,5);
          auVar116 = vminps_avx(auVar116,auVar105);
          auVar105 = vpermpd_avx2(auVar116,0x4e);
          auVar116 = vminps_avx(auVar116,auVar105);
          uVar22 = vcmpps_avx512vl(auVar151,auVar116,0);
          bVar86 = (byte)uVar22 & bVar89;
          bVar84 = bVar89;
          if (bVar86 != 0) {
            bVar84 = bVar86;
          }
          iVar25 = 0;
          for (uVar94 = (uint)bVar84; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
            iVar25 = iVar25 + 1;
          }
          uVar94 = *(uint *)(local_500 + (uint)(iVar25 << 2));
          uVar156 = *(uint *)(local_6c0 + (uint)(iVar25 << 2));
          fVar163 = auVar20._0_4_;
          if ((float)local_a00._0_4_ < 0.0) {
            auVar264 = ZEXT1664(auVar264._0_16_);
            auVar270 = ZEXT1664(auVar270._0_16_);
            auVar271 = ZEXT1664(auVar271._0_16_);
            fVar163 = sqrtf((float)local_a00._0_4_);
            auVar152._0_32_ = auVar278;
          }
          auVar259 = ZEXT464(uVar156);
          auVar97 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar95 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar1 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar96 = vminps_avx(auVar97,auVar1);
          auVar97 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar1 = vmaxps_avx(auVar95,auVar97);
          auVar224._8_4_ = 0x7fffffff;
          auVar224._0_8_ = 0x7fffffff7fffffff;
          auVar224._12_4_ = 0x7fffffff;
          auVar95 = vandps_avx(auVar96,auVar224);
          auVar97 = vandps_avx(auVar1,auVar224);
          auVar95 = vmaxps_avx(auVar95,auVar97);
          auVar97 = vmovshdup_avx(auVar95);
          auVar97 = vmaxss_avx(auVar97,auVar95);
          auVar95 = vshufpd_avx(auVar95,auVar95,1);
          auVar95 = vmaxss_avx(auVar95,auVar97);
          fVar215 = auVar95._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar1,auVar1,0xff);
          auVar95 = vinsertps_avx(ZEXT416(uVar156),ZEXT416(uVar94),0x10);
          auVar180 = ZEXT1664(auVar95);
          lVar91 = 5;
          do {
            do {
              bVar92 = lVar91 == 0;
              lVar91 = lVar91 + -1;
              if (bVar92) goto LAB_01a4ae16;
              uVar181 = auVar180._0_4_;
              auVar168._4_4_ = uVar181;
              auVar168._0_4_ = uVar181;
              auVar168._8_4_ = uVar181;
              auVar168._12_4_ = uVar181;
              auVar95 = vfmadd132ps_fma(auVar168,ZEXT816(0) << 0x40,local_9f0);
              auVar97 = vmovshdup_avx(auVar180._0_16_);
              fVar252 = auVar97._0_4_;
              fVar214 = 1.0 - fVar252;
              fVar233 = fVar252 * fVar252;
              auVar99 = SUB6416(ZEXT464(0x40400000),0);
              auVar98 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar96 = vfmadd213ss_fma(auVar99,auVar97,auVar98);
              auVar1 = vfmadd213ss_fma(auVar96,ZEXT416((uint)fVar233),SUB6416(ZEXT464(0x40000000),0)
                                      );
              auVar165 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar214),auVar98);
              auVar165 = vfmadd213ss_fma(auVar165,ZEXT416((uint)(fVar214 * fVar214)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar234 = fVar214 * fVar214 * -fVar252 * 0.5;
              fVar235 = auVar1._0_4_ * 0.5;
              fVar236 = auVar165._0_4_ * 0.5;
              fVar237 = fVar252 * fVar252 * -fVar214 * 0.5;
              auVar225._0_4_ = fVar237 * (float)local_9e0._0_4_;
              auVar225._4_4_ = fVar237 * (float)local_9e0._4_4_;
              auVar225._8_4_ = fVar237 * fStack_9d8;
              auVar225._12_4_ = fVar237 * fStack_9d4;
              auVar240._4_4_ = fVar236;
              auVar240._0_4_ = fVar236;
              auVar240._8_4_ = fVar236;
              auVar240._12_4_ = fVar236;
              auVar1 = vfmadd132ps_fma(auVar240,auVar225,local_9a0._0_16_);
              auVar205._4_4_ = fVar235;
              auVar205._0_4_ = fVar235;
              auVar205._8_4_ = fVar235;
              auVar205._12_4_ = fVar235;
              auVar1 = vfmadd132ps_fma(auVar205,auVar1,local_9c0._0_16_);
              auVar226._4_4_ = fVar234;
              auVar226._0_4_ = fVar234;
              auVar226._8_4_ = fVar234;
              auVar226._12_4_ = fVar234;
              auVar1 = vfmadd132ps_fma(auVar226,auVar1,local_980._0_16_);
              auVar165 = vfmadd231ss_fma(auVar98,auVar97,ZEXT416(0x41100000));
              local_8a0._0_16_ = auVar165;
              auVar165 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar97,ZEXT416(0x40800000))
              ;
              local_8c0._0_16_ = auVar165;
              auVar165 = vfmadd213ss_fma(auVar99,auVar97,ZEXT416(0xbf800000));
              local_8e0._0_16_ = auVar165;
              local_880._0_16_ = auVar1;
              auVar1 = vsubps_avx(auVar95,auVar1);
              auVar95 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar234 = auVar95._0_4_;
              local_800 = auVar180;
              if (fVar234 < 0.0) {
                local_a80._0_4_ = auVar96._0_4_;
                _local_aa0 = ZEXT416((uint)fVar214);
                local_a20._0_4_ = fVar233;
                local_a40._0_4_ = fVar214 * -2.0;
                auVar270._0_4_ = sqrtf(fVar234);
                auVar270._4_60_ = extraout_var_00;
                auVar96 = ZEXT416((uint)local_a80._0_4_);
                auVar165 = auVar270._0_16_;
                auVar98 = _local_aa0;
              }
              else {
                auVar165 = vsqrtss_avx(auVar95,auVar95);
                local_a40._0_4_ = fVar214 * -2.0;
                local_a20._0_4_ = fVar233;
                auVar98 = ZEXT416((uint)fVar214);
              }
              fVar233 = auVar98._0_4_;
              auVar100 = vfnmadd231ss_fma(ZEXT416((uint)(fVar252 * (fVar233 + fVar233))),auVar98,
                                          auVar98);
              auVar96 = vfmadd213ss_fma(auVar96,ZEXT416((uint)(fVar252 + fVar252)),
                                        ZEXT416((uint)(fVar252 * fVar252 * 3.0)));
              auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar97,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar233 * fVar233 * -3.0)),
                                        ZEXT416((uint)(fVar233 + fVar233)),auVar98);
              auVar98 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar97,
                                        ZEXT416((uint)local_a20._0_4_));
              fVar233 = auVar100._0_4_ * 0.5;
              fVar235 = auVar96._0_4_ * 0.5;
              fVar236 = auVar99._0_4_ * 0.5;
              fVar237 = auVar98._0_4_ * 0.5;
              auVar227._0_4_ = fVar237 * (float)local_9e0._0_4_;
              auVar227._4_4_ = fVar237 * (float)local_9e0._4_4_;
              auVar227._8_4_ = fVar237 * fStack_9d8;
              auVar227._12_4_ = fVar237 * fStack_9d4;
              auVar206._4_4_ = fVar236;
              auVar206._0_4_ = fVar236;
              auVar206._8_4_ = fVar236;
              auVar206._12_4_ = fVar236;
              auVar96 = vfmadd132ps_fma(auVar206,auVar227,local_9a0._0_16_);
              auVar188._4_4_ = fVar235;
              auVar188._0_4_ = fVar235;
              auVar188._8_4_ = fVar235;
              auVar188._12_4_ = fVar235;
              auVar96 = vfmadd132ps_fma(auVar188,auVar96,local_9c0._0_16_);
              auVar273._4_4_ = fVar233;
              auVar273._0_4_ = fVar233;
              auVar273._8_4_ = fVar233;
              auVar273._12_4_ = fVar233;
              local_a80._0_16_ = vfmadd132ps_fma(auVar273,auVar96,local_980._0_16_);
              local_a20._0_16_ = vdpps_avx(local_a80._0_16_,local_a80._0_16_,0x7f);
              auVar63._12_4_ = 0;
              auVar63._0_12_ = ZEXT812(0);
              fVar233 = local_a20._0_4_;
              auVar96 = vrsqrt14ss_avx512f(auVar63 << 0x20,ZEXT416((uint)fVar233));
              fVar235 = auVar96._0_4_;
              local_a40._0_16_ = vrcp14ss_avx512f(auVar63 << 0x20,ZEXT416((uint)fVar233));
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar98 = vxorps_avx512vl(local_a20._0_16_,auVar30);
              auVar96 = vfnmadd213ss_fma(local_a40._0_16_,local_a20._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_900._0_4_ = auVar96._0_4_;
              local_aa0._0_4_ = auVar165._0_4_;
              if (fVar233 < auVar98._0_4_) {
                fVar236 = sqrtf(fVar233);
                auVar165 = ZEXT416((uint)local_aa0._0_4_);
                auVar96 = local_a80._0_16_;
              }
              else {
                auVar96 = vsqrtss_avx(local_a20._0_16_,local_a20._0_16_);
                fVar236 = auVar96._0_4_;
                auVar96 = local_a80._0_16_;
              }
              fVar233 = fVar235 * 1.5 + fVar233 * -0.5 * fVar235 * fVar235 * fVar235;
              auVar241._0_4_ = auVar96._0_4_ * fVar233;
              auVar241._4_4_ = auVar96._4_4_ * fVar233;
              auVar241._8_4_ = auVar96._8_4_ * fVar233;
              auVar241._12_4_ = auVar96._12_4_ * fVar233;
              auVar98 = vdpps_avx(auVar1,auVar241,0x7f);
              fVar214 = auVar165._0_4_;
              fVar235 = auVar98._0_4_;
              auVar169._0_4_ = fVar235 * fVar235;
              auVar169._4_4_ = auVar98._4_4_ * auVar98._4_4_;
              auVar169._8_4_ = auVar98._8_4_ * auVar98._8_4_;
              auVar169._12_4_ = auVar98._12_4_ * auVar98._12_4_;
              auVar99 = vsubps_avx512vl(auVar95,auVar169);
              fVar237 = auVar99._0_4_;
              auVar189._4_12_ = ZEXT812(0) << 0x20;
              auVar189._0_4_ = fVar237;
              auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
              auVar101 = vmulss_avx512f(auVar99,ZEXT416(0xbf000000));
              if (fVar237 < 0.0) {
                local_930 = fVar233;
                fStack_92c = fVar233;
                fStack_928 = fVar233;
                fStack_924 = fVar233;
                local_920 = auVar241;
                local_910 = auVar100;
                fVar237 = sqrtf(fVar237);
                auVar101 = ZEXT416(auVar101._0_4_);
                auVar165 = ZEXT416((uint)local_aa0._0_4_);
                auVar241 = local_920;
                auVar99 = local_910;
                auVar96 = local_a80._0_16_;
                fVar233 = local_930;
                fVar252 = fStack_92c;
                fVar253 = fStack_928;
                fVar254 = fStack_924;
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
                fVar237 = auVar99._0_4_;
                auVar99 = auVar100;
                fVar252 = fVar233;
                fVar253 = fVar233;
                fVar254 = fVar233;
              }
              auVar270 = ZEXT1664(auVar1);
              auVar190._0_4_ = (float)local_8e0._0_4_ * (float)local_9e0._0_4_;
              auVar190._4_4_ = (float)local_8e0._0_4_ * (float)local_9e0._4_4_;
              auVar190._8_4_ = (float)local_8e0._0_4_ * fStack_9d8;
              auVar190._12_4_ = (float)local_8e0._0_4_ * fStack_9d4;
              auVar207._4_4_ = local_8c0._0_4_;
              auVar207._0_4_ = local_8c0._0_4_;
              auVar207._8_4_ = local_8c0._0_4_;
              auVar207._12_4_ = local_8c0._0_4_;
              auVar249 = vfmadd132ps_fma(auVar207,auVar190,local_9a0._0_16_);
              auVar191._4_4_ = local_8a0._0_4_;
              auVar191._0_4_ = local_8a0._0_4_;
              auVar191._8_4_ = local_8a0._0_4_;
              auVar191._12_4_ = local_8a0._0_4_;
              auVar249 = vfmadd132ps_fma(auVar191,auVar249,local_9c0._0_16_);
              auVar97 = vfmadd213ss_fma(auVar97,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar181 = auVar97._0_4_;
              auVar208._4_4_ = uVar181;
              auVar208._0_4_ = uVar181;
              auVar208._8_4_ = uVar181;
              auVar208._12_4_ = uVar181;
              auVar97 = vfmadd132ps_fma(auVar208,auVar249,local_980._0_16_);
              auVar192._0_4_ = auVar97._0_4_ * (float)local_a20._0_4_;
              auVar192._4_4_ = auVar97._4_4_ * (float)local_a20._0_4_;
              auVar192._8_4_ = auVar97._8_4_ * (float)local_a20._0_4_;
              auVar192._12_4_ = auVar97._12_4_ * (float)local_a20._0_4_;
              auVar97 = vdpps_avx(auVar96,auVar97,0x7f);
              fVar198 = auVar97._0_4_;
              auVar209._0_4_ = auVar96._0_4_ * fVar198;
              auVar209._4_4_ = auVar96._4_4_ * fVar198;
              auVar209._8_4_ = auVar96._8_4_ * fVar198;
              auVar209._12_4_ = auVar96._12_4_ * fVar198;
              auVar97 = vsubps_avx(auVar192,auVar209);
              fVar198 = (float)local_900._0_4_ * (float)local_a40._0_4_;
              auVar249 = vmaxss_avx(ZEXT416((uint)fVar215),
                                    ZEXT416((uint)(local_800._0_4_ * fVar163 * 1.9073486e-06)));
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar152._16_48_ = local_800._16_48_;
              auVar102 = vxorps_avx512vl(auVar96,auVar31);
              auVar210._0_4_ = fVar233 * auVar97._0_4_ * fVar198;
              auVar210._4_4_ = fVar252 * auVar97._4_4_ * fVar198;
              auVar210._8_4_ = fVar253 * auVar97._8_4_ * fVar198;
              auVar210._12_4_ = fVar254 * auVar97._12_4_ * fVar198;
              auVar97 = vdpps_avx(auVar102,auVar241,0x7f);
              auVar250 = vfmadd213ss_fma(auVar165,ZEXT416((uint)fVar215),auVar249);
              auVar165 = vdpps_avx(auVar1,auVar210,0x7f);
              auVar250 = vfmadd213ss_fma(ZEXT416((uint)(fVar214 + 1.0)),
                                         ZEXT416((uint)(fVar215 / fVar236)),auVar250);
              fVar233 = auVar97._0_4_ + auVar165._0_4_;
              auVar271 = ZEXT464((uint)fVar233);
              auVar97 = vdpps_avx(local_9f0,auVar241,0x7f);
              auVar165 = vdpps_avx(auVar1,auVar102,0x7f);
              auVar101 = vmulss_avx512f(auVar101,auVar99);
              fVar236 = auVar100._0_4_ * 1.5 + auVar101._0_4_ * auVar99._0_4_ * auVar99._0_4_;
              auVar99 = vdpps_avx(auVar1,local_9f0,0x7f);
              auVar101 = vfnmadd231ss_fma(auVar165,auVar98,ZEXT416((uint)fVar233));
              auVar99 = vfnmadd231ss_fma(auVar99,auVar98,auVar97);
              auVar165 = vpermilps_avx(local_880._0_16_,0xff);
              fVar237 = fVar237 - auVar165._0_4_;
              auVar100 = vshufps_avx(auVar96,auVar96,0xff);
              auVar165 = vfmsub213ss_fma(auVar101,ZEXT416((uint)fVar236),auVar100);
              auVar262._8_4_ = 0x80000000;
              auVar262._0_8_ = 0x8000000080000000;
              auVar262._12_4_ = 0x80000000;
              auVar264 = ZEXT1664(auVar262);
              auVar257._0_8_ = auVar165._0_8_ ^ 0x8000000080000000;
              auVar257._8_4_ = auVar165._8_4_ ^ 0x80000000;
              auVar257._12_4_ = auVar165._12_4_ ^ 0x80000000;
              auVar259 = ZEXT1664(auVar257);
              auVar99 = ZEXT416((uint)(auVar99._0_4_ * fVar236));
              auVar101 = vfmsub231ss_fma(ZEXT416((uint)(auVar97._0_4_ * auVar165._0_4_)),
                                         ZEXT416((uint)fVar233),auVar99);
              auVar165 = vinsertps_avx(auVar257,auVar99,0x1c);
              auVar246._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
              auVar246._8_4_ = auVar97._8_4_ ^ 0x80000000;
              auVar246._12_4_ = auVar97._12_4_ ^ 0x80000000;
              auVar99 = vinsertps_avx(ZEXT416((uint)fVar233),auVar246,0x10);
              auVar228._0_4_ = auVar101._0_4_;
              auVar228._4_4_ = auVar228._0_4_;
              auVar228._8_4_ = auVar228._0_4_;
              auVar228._12_4_ = auVar228._0_4_;
              auVar97 = vdivps_avx(auVar165,auVar228);
              auVar165 = vdivps_avx(auVar99,auVar228);
              auVar229._0_4_ = fVar235 * auVar97._0_4_ + fVar237 * auVar165._0_4_;
              auVar229._4_4_ = fVar235 * auVar97._4_4_ + fVar237 * auVar165._4_4_;
              auVar229._8_4_ = fVar235 * auVar97._8_4_ + fVar237 * auVar165._8_4_;
              auVar229._12_4_ = fVar235 * auVar97._12_4_ + fVar237 * auVar165._12_4_;
              auVar97 = vsubps_avx(local_800._0_16_,auVar229);
              auVar180 = ZEXT1664(auVar97);
              auVar32._8_4_ = 0x7fffffff;
              auVar32._0_8_ = 0x7fffffff7fffffff;
              auVar32._12_4_ = 0x7fffffff;
              auVar152._0_16_ = vandps_avx512vl(auVar98,auVar32);
            } while (auVar250._0_4_ <= auVar152._0_4_);
            auVar165 = vfmadd231ss_fma(ZEXT416((uint)(auVar250._0_4_ + auVar249._0_4_)),local_940,
                                       ZEXT416(0x36000000));
            auVar33._8_4_ = 0x7fffffff;
            auVar33._0_8_ = 0x7fffffff7fffffff;
            auVar33._12_4_ = 0x7fffffff;
            auVar152._0_16_ = vandps_avx512vl(ZEXT416((uint)fVar237),auVar33);
          } while (auVar165._0_4_ <= auVar152._0_4_);
          fVar163 = auVar97._0_4_ + (float)local_950._0_4_;
          if ((fVar277 <= fVar163) &&
             (fVar215 = *(float *)(ray + k * 4 + 0x200), fVar163 <= fVar215)) {
            auVar97 = vmovshdup_avx(auVar97);
            fVar235 = auVar97._0_4_;
            if ((0.0 <= fVar235) && (fVar235 <= 1.0)) {
              auVar64._12_4_ = 0;
              auVar64._0_12_ = ZEXT412(0);
              auVar154._16_48_ = auVar152._16_48_;
              auVar154._4_12_ = ZEXT412(0);
              auVar154._0_4_ = fVar234;
              auVar97 = vrsqrt14ss_avx512f(auVar64 << 0x20,auVar154._0_16_);
              fVar234 = auVar97._0_4_;
              auVar152._0_16_ = vmulss_avx512f(auVar95,ZEXT416(0xbf000000));
              pGVar4 = (context->scene->geometries).items[uVar2].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar234 = fVar234 * 1.5 + auVar152._0_4_ * fVar234 * fVar234 * fVar234;
                auVar230._0_4_ = auVar1._0_4_ * fVar234;
                auVar230._4_4_ = auVar1._4_4_ * fVar234;
                auVar230._8_4_ = auVar1._8_4_ * fVar234;
                auVar230._12_4_ = auVar1._12_4_ * fVar234;
                auVar165 = vfmadd213ps_fma(auVar100,auVar230,auVar96);
                auVar95 = vshufps_avx(auVar230,auVar230,0xc9);
                auVar97 = vshufps_avx(auVar96,auVar96,0xc9);
                auVar231._0_4_ = auVar230._0_4_ * auVar97._0_4_;
                auVar231._4_4_ = auVar230._4_4_ * auVar97._4_4_;
                auVar231._8_4_ = auVar230._8_4_ * auVar97._8_4_;
                auVar231._12_4_ = auVar230._12_4_ * auVar97._12_4_;
                auVar96 = vfmsub231ps_fma(auVar231,auVar96,auVar95);
                auVar95 = vshufps_avx(auVar96,auVar96,0xc9);
                auVar97 = vshufps_avx(auVar165,auVar165,0xc9);
                auVar96 = vshufps_avx(auVar96,auVar96,0xd2);
                auVar170._0_4_ = auVar165._0_4_ * auVar96._0_4_;
                auVar170._4_4_ = auVar165._4_4_ * auVar96._4_4_;
                auVar170._8_4_ = auVar165._8_4_ * auVar96._8_4_;
                auVar170._12_4_ = auVar165._12_4_ * auVar96._12_4_;
                auVar95 = vfmsub231ps_fma(auVar170,auVar95,auVar97);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x200) = fVar163;
                  uVar181 = vextractps_avx(auVar95,1);
                  *(undefined4 *)(ray + k * 4 + 0x300) = uVar181;
                  uVar181 = vextractps_avx(auVar95,2);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar181;
                  *(int *)(ray + k * 4 + 0x380) = auVar95._0_4_;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar235;
                  *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                  *(uint *)(ray + k * 4 + 0x440) = uVar3;
                  *(uint *)(ray + k * 4 + 0x480) = uVar2;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
                else {
                  pRVar6 = context->user;
                  auVar152 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar152,auVar180);
                  auVar152 = vpermps_avx512f(auVar152,ZEXT1664(auVar95));
                  auVar180 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar180,ZEXT1664(auVar95));
                  local_380 = vbroadcastss_avx512f(auVar95);
                  local_400[0] = (RTCHitN)auVar152[0];
                  local_400[1] = (RTCHitN)auVar152[1];
                  local_400[2] = (RTCHitN)auVar152[2];
                  local_400[3] = (RTCHitN)auVar152[3];
                  local_400[4] = (RTCHitN)auVar152[4];
                  local_400[5] = (RTCHitN)auVar152[5];
                  local_400[6] = (RTCHitN)auVar152[6];
                  local_400[7] = (RTCHitN)auVar152[7];
                  local_400[8] = (RTCHitN)auVar152[8];
                  local_400[9] = (RTCHitN)auVar152[9];
                  local_400[10] = (RTCHitN)auVar152[10];
                  local_400[0xb] = (RTCHitN)auVar152[0xb];
                  local_400[0xc] = (RTCHitN)auVar152[0xc];
                  local_400[0xd] = (RTCHitN)auVar152[0xd];
                  local_400[0xe] = (RTCHitN)auVar152[0xe];
                  local_400[0xf] = (RTCHitN)auVar152[0xf];
                  local_400[0x10] = (RTCHitN)auVar152[0x10];
                  local_400[0x11] = (RTCHitN)auVar152[0x11];
                  local_400[0x12] = (RTCHitN)auVar152[0x12];
                  local_400[0x13] = (RTCHitN)auVar152[0x13];
                  local_400[0x14] = (RTCHitN)auVar152[0x14];
                  local_400[0x15] = (RTCHitN)auVar152[0x15];
                  local_400[0x16] = (RTCHitN)auVar152[0x16];
                  local_400[0x17] = (RTCHitN)auVar152[0x17];
                  local_400[0x18] = (RTCHitN)auVar152[0x18];
                  local_400[0x19] = (RTCHitN)auVar152[0x19];
                  local_400[0x1a] = (RTCHitN)auVar152[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar152[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar152[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar152[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar152[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar152[0x1f];
                  local_400[0x20] = (RTCHitN)auVar152[0x20];
                  local_400[0x21] = (RTCHitN)auVar152[0x21];
                  local_400[0x22] = (RTCHitN)auVar152[0x22];
                  local_400[0x23] = (RTCHitN)auVar152[0x23];
                  local_400[0x24] = (RTCHitN)auVar152[0x24];
                  local_400[0x25] = (RTCHitN)auVar152[0x25];
                  local_400[0x26] = (RTCHitN)auVar152[0x26];
                  local_400[0x27] = (RTCHitN)auVar152[0x27];
                  local_400[0x28] = (RTCHitN)auVar152[0x28];
                  local_400[0x29] = (RTCHitN)auVar152[0x29];
                  local_400[0x2a] = (RTCHitN)auVar152[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar152[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar152[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar152[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar152[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar152[0x2f];
                  local_400[0x30] = (RTCHitN)auVar152[0x30];
                  local_400[0x31] = (RTCHitN)auVar152[0x31];
                  local_400[0x32] = (RTCHitN)auVar152[0x32];
                  local_400[0x33] = (RTCHitN)auVar152[0x33];
                  local_400[0x34] = (RTCHitN)auVar152[0x34];
                  local_400[0x35] = (RTCHitN)auVar152[0x35];
                  local_400[0x36] = (RTCHitN)auVar152[0x36];
                  local_400[0x37] = (RTCHitN)auVar152[0x37];
                  local_400[0x38] = (RTCHitN)auVar152[0x38];
                  local_400[0x39] = (RTCHitN)auVar152[0x39];
                  local_400[0x3a] = (RTCHitN)auVar152[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar152[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar152[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar152[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar152[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar152[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar152 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar152);
                  auVar116 = vpcmpeqd_avx2(auVar152._0_32_,auVar152._0_32_);
                  local_a58[3] = auVar116;
                  local_a58[2] = auVar116;
                  local_a58[1] = auVar116;
                  *local_a58 = auVar116;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar6->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar6->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar163;
                  auVar152 = vmovdqa64_avx512f(local_4c0);
                  local_7c0 = vmovdqa64_avx512f(auVar152);
                  local_ad0.valid = (int *)local_7c0;
                  local_ad0.geometryUserPtr = pGVar4->userPtr;
                  local_ad0.context = context->user;
                  local_ad0.hit = local_400;
                  local_ad0.N = 0x10;
                  local_ad0.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar259 = ZEXT1664(auVar257);
                    auVar264 = ZEXT1664(auVar262);
                    auVar270 = ZEXT1664(auVar1);
                    auVar271 = ZEXT1664(ZEXT416((uint)fVar233));
                    (*pGVar4->intersectionFilterN)(&local_ad0);
                    auVar152 = vmovdqa64_avx512f(local_7c0);
                  }
                  uVar22 = vptestmd_avx512f(auVar152,auVar152);
                  if ((short)uVar22 != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar259 = ZEXT1664(auVar259._0_16_);
                      auVar264 = ZEXT1664(auVar264._0_16_);
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      auVar271 = ZEXT1664(auVar271._0_16_);
                      (*p_Var5)(&local_ad0);
                      auVar152 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar93 = vptestmd_avx512f(auVar152,auVar152);
                    if ((short)uVar93 != 0) {
                      iVar65 = *(int *)(local_ad0.hit + 4);
                      iVar66 = *(int *)(local_ad0.hit + 8);
                      iVar67 = *(int *)(local_ad0.hit + 0xc);
                      iVar68 = *(int *)(local_ad0.hit + 0x10);
                      iVar69 = *(int *)(local_ad0.hit + 0x14);
                      iVar70 = *(int *)(local_ad0.hit + 0x18);
                      iVar71 = *(int *)(local_ad0.hit + 0x1c);
                      iVar72 = *(int *)(local_ad0.hit + 0x20);
                      iVar73 = *(int *)(local_ad0.hit + 0x24);
                      iVar74 = *(int *)(local_ad0.hit + 0x28);
                      iVar75 = *(int *)(local_ad0.hit + 0x2c);
                      iVar76 = *(int *)(local_ad0.hit + 0x30);
                      iVar77 = *(int *)(local_ad0.hit + 0x34);
                      iVar78 = *(int *)(local_ad0.hit + 0x38);
                      iVar79 = *(int *)(local_ad0.hit + 0x3c);
                      bVar84 = (byte)uVar93;
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar93 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar93 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar93 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar93 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar93 >> 7) & 1);
                      bVar86 = (byte)(uVar93 >> 8);
                      bVar13 = (bool)((byte)(uVar93 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar93 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      bVar19 = SUB81(uVar93 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x300) =
                           (uint)(bVar84 & 1) * *(int *)local_ad0.hit |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_ad0.ray + 0x300);
                      *(uint *)(local_ad0.ray + 0x304) =
                           (uint)bVar92 * iVar65 | (uint)!bVar92 * *(int *)(local_ad0.ray + 0x304);
                      *(uint *)(local_ad0.ray + 0x308) =
                           (uint)bVar7 * iVar66 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x308);
                      *(uint *)(local_ad0.ray + 0x30c) =
                           (uint)bVar8 * iVar67 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x30c);
                      *(uint *)(local_ad0.ray + 0x310) =
                           (uint)bVar9 * iVar68 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x310);
                      *(uint *)(local_ad0.ray + 0x314) =
                           (uint)bVar10 * iVar69 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x314);
                      *(uint *)(local_ad0.ray + 0x318) =
                           (uint)bVar11 * iVar70 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x318);
                      *(uint *)(local_ad0.ray + 0x31c) =
                           (uint)bVar12 * iVar71 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x31c);
                      *(uint *)(local_ad0.ray + 800) =
                           (uint)(bVar86 & 1) * iVar72 |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_ad0.ray + 800);
                      *(uint *)(local_ad0.ray + 0x324) =
                           (uint)bVar13 * iVar73 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x324);
                      *(uint *)(local_ad0.ray + 0x328) =
                           (uint)bVar14 * iVar74 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x328);
                      *(uint *)(local_ad0.ray + 0x32c) =
                           (uint)bVar15 * iVar75 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x32c);
                      *(uint *)(local_ad0.ray + 0x330) =
                           (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x330);
                      *(uint *)(local_ad0.ray + 0x334) =
                           (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x334);
                      *(uint *)(local_ad0.ray + 0x338) =
                           (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x338);
                      *(uint *)(local_ad0.ray + 0x33c) =
                           (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x33c);
                      iVar65 = *(int *)(local_ad0.hit + 0x44);
                      iVar66 = *(int *)(local_ad0.hit + 0x48);
                      iVar67 = *(int *)(local_ad0.hit + 0x4c);
                      iVar68 = *(int *)(local_ad0.hit + 0x50);
                      iVar69 = *(int *)(local_ad0.hit + 0x54);
                      iVar70 = *(int *)(local_ad0.hit + 0x58);
                      iVar71 = *(int *)(local_ad0.hit + 0x5c);
                      iVar72 = *(int *)(local_ad0.hit + 0x60);
                      iVar73 = *(int *)(local_ad0.hit + 100);
                      iVar74 = *(int *)(local_ad0.hit + 0x68);
                      iVar75 = *(int *)(local_ad0.hit + 0x6c);
                      iVar76 = *(int *)(local_ad0.hit + 0x70);
                      iVar77 = *(int *)(local_ad0.hit + 0x74);
                      iVar78 = *(int *)(local_ad0.hit + 0x78);
                      iVar79 = *(int *)(local_ad0.hit + 0x7c);
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar93 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar93 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar93 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar93 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar93 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar93 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar93 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      bVar19 = SUB81(uVar93 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x340) =
                           (uint)(bVar84 & 1) * *(int *)(local_ad0.hit + 0x40) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_ad0.ray + 0x340);
                      *(uint *)(local_ad0.ray + 0x344) =
                           (uint)bVar92 * iVar65 | (uint)!bVar92 * *(int *)(local_ad0.ray + 0x344);
                      *(uint *)(local_ad0.ray + 0x348) =
                           (uint)bVar7 * iVar66 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x348);
                      *(uint *)(local_ad0.ray + 0x34c) =
                           (uint)bVar8 * iVar67 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x34c);
                      *(uint *)(local_ad0.ray + 0x350) =
                           (uint)bVar9 * iVar68 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x350);
                      *(uint *)(local_ad0.ray + 0x354) =
                           (uint)bVar10 * iVar69 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x354);
                      *(uint *)(local_ad0.ray + 0x358) =
                           (uint)bVar11 * iVar70 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x358);
                      *(uint *)(local_ad0.ray + 0x35c) =
                           (uint)bVar12 * iVar71 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x35c);
                      *(uint *)(local_ad0.ray + 0x360) =
                           (uint)(bVar86 & 1) * iVar72 |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_ad0.ray + 0x360);
                      *(uint *)(local_ad0.ray + 0x364) =
                           (uint)bVar13 * iVar73 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x364);
                      *(uint *)(local_ad0.ray + 0x368) =
                           (uint)bVar14 * iVar74 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x368);
                      *(uint *)(local_ad0.ray + 0x36c) =
                           (uint)bVar15 * iVar75 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x36c);
                      *(uint *)(local_ad0.ray + 0x370) =
                           (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x370);
                      *(uint *)(local_ad0.ray + 0x374) =
                           (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x374);
                      *(uint *)(local_ad0.ray + 0x378) =
                           (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x378);
                      *(uint *)(local_ad0.ray + 0x37c) =
                           (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x37c);
                      iVar65 = *(int *)(local_ad0.hit + 0x84);
                      iVar66 = *(int *)(local_ad0.hit + 0x88);
                      iVar67 = *(int *)(local_ad0.hit + 0x8c);
                      iVar68 = *(int *)(local_ad0.hit + 0x90);
                      iVar69 = *(int *)(local_ad0.hit + 0x94);
                      iVar70 = *(int *)(local_ad0.hit + 0x98);
                      iVar71 = *(int *)(local_ad0.hit + 0x9c);
                      iVar72 = *(int *)(local_ad0.hit + 0xa0);
                      iVar73 = *(int *)(local_ad0.hit + 0xa4);
                      iVar74 = *(int *)(local_ad0.hit + 0xa8);
                      iVar75 = *(int *)(local_ad0.hit + 0xac);
                      iVar76 = *(int *)(local_ad0.hit + 0xb0);
                      iVar77 = *(int *)(local_ad0.hit + 0xb4);
                      iVar78 = *(int *)(local_ad0.hit + 0xb8);
                      iVar79 = *(int *)(local_ad0.hit + 0xbc);
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar93 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar93 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar93 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar93 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar93 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar93 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar93 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      bVar19 = SUB81(uVar93 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x380) =
                           (uint)(bVar84 & 1) * *(int *)(local_ad0.hit + 0x80) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_ad0.ray + 0x380);
                      *(uint *)(local_ad0.ray + 900) =
                           (uint)bVar92 * iVar65 | (uint)!bVar92 * *(int *)(local_ad0.ray + 900);
                      *(uint *)(local_ad0.ray + 0x388) =
                           (uint)bVar7 * iVar66 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x388);
                      *(uint *)(local_ad0.ray + 0x38c) =
                           (uint)bVar8 * iVar67 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x38c);
                      *(uint *)(local_ad0.ray + 0x390) =
                           (uint)bVar9 * iVar68 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x390);
                      *(uint *)(local_ad0.ray + 0x394) =
                           (uint)bVar10 * iVar69 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x394);
                      *(uint *)(local_ad0.ray + 0x398) =
                           (uint)bVar11 * iVar70 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x398);
                      *(uint *)(local_ad0.ray + 0x39c) =
                           (uint)bVar12 * iVar71 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x39c);
                      *(uint *)(local_ad0.ray + 0x3a0) =
                           (uint)(bVar86 & 1) * iVar72 |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_ad0.ray + 0x3a0);
                      *(uint *)(local_ad0.ray + 0x3a4) =
                           (uint)bVar13 * iVar73 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x3a4);
                      *(uint *)(local_ad0.ray + 0x3a8) =
                           (uint)bVar14 * iVar74 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3a8);
                      *(uint *)(local_ad0.ray + 0x3ac) =
                           (uint)bVar15 * iVar75 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3ac);
                      *(uint *)(local_ad0.ray + 0x3b0) =
                           (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3b0);
                      *(uint *)(local_ad0.ray + 0x3b4) =
                           (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3b4);
                      *(uint *)(local_ad0.ray + 0x3b8) =
                           (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3b8);
                      *(uint *)(local_ad0.ray + 0x3bc) =
                           (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x3bc);
                      iVar65 = *(int *)(local_ad0.hit + 0xc4);
                      iVar66 = *(int *)(local_ad0.hit + 200);
                      iVar67 = *(int *)(local_ad0.hit + 0xcc);
                      iVar68 = *(int *)(local_ad0.hit + 0xd0);
                      iVar69 = *(int *)(local_ad0.hit + 0xd4);
                      iVar70 = *(int *)(local_ad0.hit + 0xd8);
                      iVar71 = *(int *)(local_ad0.hit + 0xdc);
                      iVar72 = *(int *)(local_ad0.hit + 0xe0);
                      iVar73 = *(int *)(local_ad0.hit + 0xe4);
                      iVar74 = *(int *)(local_ad0.hit + 0xe8);
                      iVar75 = *(int *)(local_ad0.hit + 0xec);
                      iVar76 = *(int *)(local_ad0.hit + 0xf0);
                      iVar77 = *(int *)(local_ad0.hit + 0xf4);
                      iVar78 = *(int *)(local_ad0.hit + 0xf8);
                      iVar79 = *(int *)(local_ad0.hit + 0xfc);
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar93 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar93 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar93 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar93 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar93 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar93 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar93 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      bVar19 = SUB81(uVar93 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x3c0) =
                           (uint)(bVar84 & 1) * *(int *)(local_ad0.hit + 0xc0) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_ad0.ray + 0x3c0);
                      *(uint *)(local_ad0.ray + 0x3c4) =
                           (uint)bVar92 * iVar65 | (uint)!bVar92 * *(int *)(local_ad0.ray + 0x3c4);
                      *(uint *)(local_ad0.ray + 0x3c8) =
                           (uint)bVar7 * iVar66 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x3c8);
                      *(uint *)(local_ad0.ray + 0x3cc) =
                           (uint)bVar8 * iVar67 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x3cc);
                      *(uint *)(local_ad0.ray + 0x3d0) =
                           (uint)bVar9 * iVar68 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x3d0);
                      *(uint *)(local_ad0.ray + 0x3d4) =
                           (uint)bVar10 * iVar69 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x3d4);
                      *(uint *)(local_ad0.ray + 0x3d8) =
                           (uint)bVar11 * iVar70 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x3d8);
                      *(uint *)(local_ad0.ray + 0x3dc) =
                           (uint)bVar12 * iVar71 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3dc);
                      *(uint *)(local_ad0.ray + 0x3e0) =
                           (uint)(bVar86 & 1) * iVar72 |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_ad0.ray + 0x3e0);
                      *(uint *)(local_ad0.ray + 0x3e4) =
                           (uint)bVar13 * iVar73 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x3e4);
                      *(uint *)(local_ad0.ray + 1000) =
                           (uint)bVar14 * iVar74 | (uint)!bVar14 * *(int *)(local_ad0.ray + 1000);
                      *(uint *)(local_ad0.ray + 0x3ec) =
                           (uint)bVar15 * iVar75 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3ec);
                      *(uint *)(local_ad0.ray + 0x3f0) =
                           (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3f0);
                      *(uint *)(local_ad0.ray + 0x3f4) =
                           (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3f4);
                      *(uint *)(local_ad0.ray + 0x3f8) =
                           (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3f8);
                      *(uint *)(local_ad0.ray + 0x3fc) =
                           (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x3fc);
                      iVar65 = *(int *)(local_ad0.hit + 0x104);
                      iVar66 = *(int *)(local_ad0.hit + 0x108);
                      iVar67 = *(int *)(local_ad0.hit + 0x10c);
                      iVar68 = *(int *)(local_ad0.hit + 0x110);
                      iVar69 = *(int *)(local_ad0.hit + 0x114);
                      iVar70 = *(int *)(local_ad0.hit + 0x118);
                      iVar71 = *(int *)(local_ad0.hit + 0x11c);
                      iVar72 = *(int *)(local_ad0.hit + 0x120);
                      iVar73 = *(int *)(local_ad0.hit + 0x124);
                      iVar74 = *(int *)(local_ad0.hit + 0x128);
                      iVar75 = *(int *)(local_ad0.hit + 300);
                      iVar76 = *(int *)(local_ad0.hit + 0x130);
                      iVar77 = *(int *)(local_ad0.hit + 0x134);
                      iVar78 = *(int *)(local_ad0.hit + 0x138);
                      iVar79 = *(int *)(local_ad0.hit + 0x13c);
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar93 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar93 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar93 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar93 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar93 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar93 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar93 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      bVar19 = SUB81(uVar93 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x400) =
                           (uint)(bVar84 & 1) * *(int *)(local_ad0.hit + 0x100) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_ad0.ray + 0x400);
                      *(uint *)(local_ad0.ray + 0x404) =
                           (uint)bVar92 * iVar65 | (uint)!bVar92 * *(int *)(local_ad0.ray + 0x404);
                      *(uint *)(local_ad0.ray + 0x408) =
                           (uint)bVar7 * iVar66 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x408);
                      *(uint *)(local_ad0.ray + 0x40c) =
                           (uint)bVar8 * iVar67 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x40c);
                      *(uint *)(local_ad0.ray + 0x410) =
                           (uint)bVar9 * iVar68 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x410);
                      *(uint *)(local_ad0.ray + 0x414) =
                           (uint)bVar10 * iVar69 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x414);
                      *(uint *)(local_ad0.ray + 0x418) =
                           (uint)bVar11 * iVar70 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x418);
                      *(uint *)(local_ad0.ray + 0x41c) =
                           (uint)bVar12 * iVar71 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x41c);
                      *(uint *)(local_ad0.ray + 0x420) =
                           (uint)(bVar86 & 1) * iVar72 |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_ad0.ray + 0x420);
                      *(uint *)(local_ad0.ray + 0x424) =
                           (uint)bVar13 * iVar73 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x424);
                      *(uint *)(local_ad0.ray + 0x428) =
                           (uint)bVar14 * iVar74 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x428);
                      *(uint *)(local_ad0.ray + 0x42c) =
                           (uint)bVar15 * iVar75 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x42c);
                      *(uint *)(local_ad0.ray + 0x430) =
                           (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x430);
                      *(uint *)(local_ad0.ray + 0x434) =
                           (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x434);
                      *(uint *)(local_ad0.ray + 0x438) =
                           (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x438);
                      *(uint *)(local_ad0.ray + 0x43c) =
                           (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x43c);
                      auVar152 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x140));
                      auVar152 = vmovdqu32_avx512f(auVar152);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x440) = auVar152;
                      auVar152 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x180));
                      auVar152 = vmovdqu32_avx512f(auVar152);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x480) = auVar152;
                      auVar180 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x1c0));
                      auVar152 = vmovdqa32_avx512f(auVar180);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x4c0) = auVar152;
                      auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x200));
                      bVar92 = (bool)((byte)(uVar93 >> 1) & 1);
                      auVar60._4_56_ = auVar155._8_56_;
                      auVar60._0_4_ = (uint)bVar92 * auVar155._4_4_ | (uint)!bVar92 * auVar180._4_4_
                      ;
                      auVar152._0_8_ = auVar60._0_8_ << 0x20;
                      bVar92 = (bool)((byte)(uVar93 >> 2) & 1);
                      auVar152._8_4_ =
                           (uint)bVar92 * auVar155._8_4_ | (uint)!bVar92 * auVar180._8_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 3) & 1);
                      auVar152._12_4_ =
                           (uint)bVar92 * auVar155._12_4_ | (uint)!bVar92 * auVar180._12_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 4) & 1);
                      auVar152._16_4_ =
                           (uint)bVar92 * auVar155._16_4_ | (uint)!bVar92 * auVar180._16_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 5) & 1);
                      auVar152._20_4_ =
                           (uint)bVar92 * auVar155._20_4_ | (uint)!bVar92 * auVar180._20_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 6) & 1);
                      auVar152._24_4_ =
                           (uint)bVar92 * auVar155._24_4_ | (uint)!bVar92 * auVar180._24_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 7) & 1);
                      auVar152._28_4_ =
                           (uint)bVar92 * auVar155._28_4_ | (uint)!bVar92 * auVar180._28_4_;
                      auVar152._32_4_ =
                           (uint)(bVar86 & 1) * auVar155._32_4_ |
                           (uint)!(bool)(bVar86 & 1) * auVar180._32_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 9) & 1);
                      auVar152._36_4_ =
                           (uint)bVar92 * auVar155._36_4_ | (uint)!bVar92 * auVar180._36_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 10) & 1);
                      auVar152._40_4_ =
                           (uint)bVar92 * auVar155._40_4_ | (uint)!bVar92 * auVar180._40_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 0xb) & 1);
                      auVar152._44_4_ =
                           (uint)bVar92 * auVar155._44_4_ | (uint)!bVar92 * auVar180._44_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 0xc) & 1);
                      auVar152._48_4_ =
                           (uint)bVar92 * auVar155._48_4_ | (uint)!bVar92 * auVar180._48_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 0xd) & 1);
                      auVar152._52_4_ =
                           (uint)bVar92 * auVar155._52_4_ | (uint)!bVar92 * auVar180._52_4_;
                      bVar92 = (bool)((byte)(uVar93 >> 0xe) & 1);
                      auVar152._56_4_ =
                           (uint)bVar92 * auVar155._56_4_ | (uint)!bVar92 * auVar180._56_4_;
                      bVar92 = SUB81(uVar93 >> 0xf,0);
                      auVar152._60_4_ =
                           (uint)bVar92 * auVar155._60_4_ | (uint)!bVar92 * auVar180._60_4_;
                      auVar180 = vmovdqa32_avx512f(auVar155);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x500) = auVar180;
                      goto LAB_01a4ae16;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar215;
                }
              }
            }
          }
LAB_01a4ae16:
          uVar181 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar248._4_4_ = uVar181;
          auVar248._0_4_ = uVar181;
          auVar248._8_4_ = uVar181;
          auVar248._12_4_ = uVar181;
          auVar248._16_4_ = uVar181;
          auVar248._20_4_ = uVar181;
          auVar248._24_4_ = uVar181;
          auVar248._28_4_ = uVar181;
          auVar180 = ZEXT3264(auVar248);
          auVar81._4_4_ = fStack_75c;
          auVar81._0_4_ = local_760;
          auVar81._8_4_ = fStack_758;
          auVar81._12_4_ = fStack_754;
          auVar81._16_4_ = fStack_750;
          auVar81._20_4_ = fStack_74c;
          auVar81._24_4_ = fStack_748;
          auVar81._28_4_ = fStack_744;
          uVar22 = vcmpps_avx512vl(auVar248,auVar81,0xd);
          bVar89 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar89 & (byte)uVar22;
        }
        uVar24 = vpcmpd_avx512vl(local_720,local_6a0,1);
        uVar23 = vpcmpd_avx512vl(local_720,_local_780,1);
        auVar197._0_4_ = (float)local_820._0_4_ + (float)local_540._0_4_;
        auVar197._4_4_ = (float)local_820._4_4_ + (float)local_540._4_4_;
        auVar197._8_4_ = fStack_818 + fStack_538;
        auVar197._12_4_ = fStack_814 + fStack_534;
        auVar197._16_4_ = fStack_810 + fStack_530;
        auVar197._20_4_ = fStack_80c + fStack_52c;
        auVar197._24_4_ = fStack_808 + fStack_528;
        auVar197._28_4_ = fStack_804 + fStack_524;
        uVar181 = auVar180._0_4_;
        auVar213._4_4_ = uVar181;
        auVar213._0_4_ = uVar181;
        auVar213._8_4_ = uVar181;
        auVar213._12_4_ = uVar181;
        auVar213._16_4_ = uVar181;
        auVar213._20_4_ = uVar181;
        auVar213._24_4_ = uVar181;
        auVar213._28_4_ = uVar181;
        uVar22 = vcmpps_avx512vl(auVar197,auVar213,2);
        bVar87 = bVar87 & (byte)uVar24 & (byte)uVar22;
        auVar232._0_4_ = (float)local_820._0_4_ + (float)local_6e0._0_4_;
        auVar232._4_4_ = (float)local_820._4_4_ + (float)local_6e0._4_4_;
        auVar232._8_4_ = fStack_818 + fStack_6d8;
        auVar232._12_4_ = fStack_814 + fStack_6d4;
        auVar232._16_4_ = fStack_810 + fStack_6d0;
        auVar232._20_4_ = fStack_80c + fStack_6cc;
        auVar232._24_4_ = fStack_808 + fStack_6c8;
        auVar232._28_4_ = fStack_804 + fStack_6c4;
        uVar22 = vcmpps_avx512vl(auVar232,auVar213,2);
        bVar83 = bVar83 & (byte)uVar23 & (byte)uVar22 | bVar87;
        if (bVar83 != 0) {
          abStack_1a0[uVar88 * 0x60] = bVar83;
          bVar92 = (bool)(bVar87 >> 1 & 1);
          bVar7 = (bool)(bVar87 >> 2 & 1);
          bVar8 = (bool)(bVar87 >> 3 & 1);
          bVar9 = (bool)(bVar87 >> 4 & 1);
          bVar10 = (bool)(bVar87 >> 5 & 1);
          auStack_180[uVar88 * 0x18] =
               (uint)(bVar87 & 1) * local_540._0_4_ | (uint)!(bool)(bVar87 & 1) * local_6e0._0_4_;
          auStack_180[uVar88 * 0x18 + 1] =
               (uint)bVar92 * local_540._4_4_ | (uint)!bVar92 * local_6e0._4_4_;
          auStack_180[uVar88 * 0x18 + 2] =
               (uint)bVar7 * (int)fStack_538 | (uint)!bVar7 * (int)fStack_6d8;
          auStack_180[uVar88 * 0x18 + 3] =
               (uint)bVar8 * (int)fStack_534 | (uint)!bVar8 * (int)fStack_6d4;
          auStack_180[uVar88 * 0x18 + 4] =
               (uint)bVar9 * (int)fStack_530 | (uint)!bVar9 * (int)fStack_6d0;
          auStack_180[uVar88 * 0x18 + 5] =
               (uint)bVar10 * (int)fStack_52c | (uint)!bVar10 * (int)fStack_6cc;
          auStack_180[uVar88 * 0x18 + 6] =
               (uint)(bVar87 >> 6) * (int)fStack_528 | (uint)!(bool)(bVar87 >> 6) * (int)fStack_6c8;
          (&fStack_164)[uVar88 * 0x18] = fStack_6c4;
          uVar93 = vmovlps_avx(local_730);
          (&uStack_160)[uVar88 * 0xc] = uVar93;
          aiStack_158[uVar88 * 0x18] = local_d24 + 1;
          uVar88 = (ulong)((int)uVar88 + 1);
        }
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar280 = ZEXT3264(auVar116);
        auVar180 = ZEXT3264(_DAT_01f7b040);
        prim = local_a50;
      }
    }
    do {
      uVar94 = (uint)uVar88;
      uVar88 = (ulong)(uVar94 - 1);
      if (uVar94 == 0) {
        uVar181 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar40._4_4_ = uVar181;
        auVar40._0_4_ = uVar181;
        auVar40._8_4_ = uVar181;
        auVar40._12_4_ = uVar181;
        auVar40._16_4_ = uVar181;
        auVar40._20_4_ = uVar181;
        auVar40._24_4_ = uVar181;
        auVar40._28_4_ = uVar181;
        uVar22 = vcmpps_avx512vl(local_680,auVar40,2);
        local_a48 = (ulong)((uint)local_a48 & (uint)uVar22);
        goto LAB_01a4868a;
      }
      auVar116 = *(undefined1 (*) [32])(auStack_180 + uVar88 * 0x18);
      auVar194._0_4_ = auVar116._0_4_ + (float)local_820._0_4_;
      auVar194._4_4_ = auVar116._4_4_ + (float)local_820._4_4_;
      auVar194._8_4_ = auVar116._8_4_ + fStack_818;
      auVar194._12_4_ = auVar116._12_4_ + fStack_814;
      auVar194._16_4_ = auVar116._16_4_ + fStack_810;
      auVar194._20_4_ = auVar116._20_4_ + fStack_80c;
      auVar194._24_4_ = auVar116._24_4_ + fStack_808;
      auVar194._28_4_ = auVar116._28_4_ + fStack_804;
      uVar181 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar39._4_4_ = uVar181;
      auVar39._0_4_ = uVar181;
      auVar39._8_4_ = uVar181;
      auVar39._12_4_ = uVar181;
      auVar39._16_4_ = uVar181;
      auVar39._20_4_ = uVar181;
      auVar39._24_4_ = uVar181;
      auVar39._28_4_ = uVar181;
      uVar22 = vcmpps_avx512vl(auVar194,auVar39,2);
      uVar156 = (uint)uVar22 & (uint)abStack_1a0[uVar88 * 0x60];
    } while (uVar156 == 0);
    uVar93 = (&uStack_160)[uVar88 * 0xc];
    auVar182._8_8_ = 0;
    auVar182._0_8_ = uVar93;
    auVar212._8_4_ = 0x7f800000;
    auVar212._0_8_ = 0x7f8000007f800000;
    auVar212._12_4_ = 0x7f800000;
    auVar212._16_4_ = 0x7f800000;
    auVar212._20_4_ = 0x7f800000;
    auVar212._24_4_ = 0x7f800000;
    auVar212._28_4_ = 0x7f800000;
    auVar105 = vblendmps_avx512vl(auVar212,auVar116);
    bVar83 = (byte)uVar156;
    auVar149._0_4_ =
         (uint)(bVar83 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar83 & 1) * (int)auVar116._0_4_;
    bVar92 = (bool)((byte)(uVar156 >> 1) & 1);
    auVar149._4_4_ = (uint)bVar92 * auVar105._4_4_ | (uint)!bVar92 * (int)auVar116._4_4_;
    bVar92 = (bool)((byte)(uVar156 >> 2) & 1);
    auVar149._8_4_ = (uint)bVar92 * auVar105._8_4_ | (uint)!bVar92 * (int)auVar116._8_4_;
    bVar92 = (bool)((byte)(uVar156 >> 3) & 1);
    auVar149._12_4_ = (uint)bVar92 * auVar105._12_4_ | (uint)!bVar92 * (int)auVar116._12_4_;
    bVar92 = (bool)((byte)(uVar156 >> 4) & 1);
    auVar149._16_4_ = (uint)bVar92 * auVar105._16_4_ | (uint)!bVar92 * (int)auVar116._16_4_;
    bVar92 = (bool)((byte)(uVar156 >> 5) & 1);
    auVar149._20_4_ = (uint)bVar92 * auVar105._20_4_ | (uint)!bVar92 * (int)auVar116._20_4_;
    bVar92 = (bool)((byte)(uVar156 >> 6) & 1);
    auVar149._24_4_ = (uint)bVar92 * auVar105._24_4_ | (uint)!bVar92 * (int)auVar116._24_4_;
    auVar149._28_4_ =
         (uVar156 >> 7) * auVar105._28_4_ | (uint)!SUB41(uVar156 >> 7,0) * (int)auVar116._28_4_;
    auVar116 = vshufps_avx(auVar149,auVar149,0xb1);
    auVar116 = vminps_avx(auVar149,auVar116);
    auVar105 = vshufpd_avx(auVar116,auVar116,5);
    auVar116 = vminps_avx(auVar116,auVar105);
    auVar105 = vpermpd_avx2(auVar116,0x4e);
    auVar116 = vminps_avx(auVar116,auVar105);
    uVar22 = vcmpps_avx512vl(auVar149,auVar116,0);
    bVar89 = (byte)uVar22 & bVar83;
    if (bVar89 != 0) {
      uVar156 = (uint)bVar89;
    }
    uVar157 = 0;
    for (; (uVar156 & 1) == 0; uVar156 = uVar156 >> 1 | 0x80000000) {
      uVar157 = uVar157 + 1;
    }
    local_d24 = aiStack_158[uVar88 * 0x18];
    bVar83 = ~('\x01' << ((byte)uVar157 & 0x1f)) & bVar83;
    abStack_1a0[uVar88 * 0x60] = bVar83;
    if (bVar83 == 0) {
      uVar94 = uVar94 - 1;
    }
    uVar181 = (undefined4)uVar93;
    auVar174._4_4_ = uVar181;
    auVar174._0_4_ = uVar181;
    auVar174._8_4_ = uVar181;
    auVar174._12_4_ = uVar181;
    auVar174._16_4_ = uVar181;
    auVar174._20_4_ = uVar181;
    auVar174._24_4_ = uVar181;
    auVar174._28_4_ = uVar181;
    auVar95 = vmovshdup_avx(auVar182);
    auVar95 = vsubps_avx(auVar95,auVar182);
    auVar195._0_4_ = auVar95._0_4_;
    auVar195._4_4_ = auVar195._0_4_;
    auVar195._8_4_ = auVar195._0_4_;
    auVar195._12_4_ = auVar195._0_4_;
    auVar195._16_4_ = auVar195._0_4_;
    auVar195._20_4_ = auVar195._0_4_;
    auVar195._24_4_ = auVar195._0_4_;
    auVar195._28_4_ = auVar195._0_4_;
    auVar95 = vfmadd132ps_fma(auVar195,auVar174,auVar180._0_32_);
    auVar116 = ZEXT1632(auVar95);
    local_400[0] = (RTCHitN)auVar116[0];
    local_400[1] = (RTCHitN)auVar116[1];
    local_400[2] = (RTCHitN)auVar116[2];
    local_400[3] = (RTCHitN)auVar116[3];
    local_400[4] = (RTCHitN)auVar116[4];
    local_400[5] = (RTCHitN)auVar116[5];
    local_400[6] = (RTCHitN)auVar116[6];
    local_400[7] = (RTCHitN)auVar116[7];
    local_400[8] = (RTCHitN)auVar116[8];
    local_400[9] = (RTCHitN)auVar116[9];
    local_400[10] = (RTCHitN)auVar116[10];
    local_400[0xb] = (RTCHitN)auVar116[0xb];
    local_400[0xc] = (RTCHitN)auVar116[0xc];
    local_400[0xd] = (RTCHitN)auVar116[0xd];
    local_400[0xe] = (RTCHitN)auVar116[0xe];
    local_400[0xf] = (RTCHitN)auVar116[0xf];
    local_400[0x10] = (RTCHitN)auVar116[0x10];
    local_400[0x11] = (RTCHitN)auVar116[0x11];
    local_400[0x12] = (RTCHitN)auVar116[0x12];
    local_400[0x13] = (RTCHitN)auVar116[0x13];
    local_400[0x14] = (RTCHitN)auVar116[0x14];
    local_400[0x15] = (RTCHitN)auVar116[0x15];
    local_400[0x16] = (RTCHitN)auVar116[0x16];
    local_400[0x17] = (RTCHitN)auVar116[0x17];
    local_400[0x18] = (RTCHitN)auVar116[0x18];
    local_400[0x19] = (RTCHitN)auVar116[0x19];
    local_400[0x1a] = (RTCHitN)auVar116[0x1a];
    local_400[0x1b] = (RTCHitN)auVar116[0x1b];
    local_400[0x1c] = (RTCHitN)auVar116[0x1c];
    local_400[0x1d] = (RTCHitN)auVar116[0x1d];
    local_400[0x1e] = (RTCHitN)auVar116[0x1e];
    local_400[0x1f] = (RTCHitN)auVar116[0x1f];
    local_730._8_8_ = 0;
    local_730._0_8_ = *(ulong *)(local_400 + (ulong)uVar157 * 4);
    uVar88 = (ulong)uVar94;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }